

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block_simd.h
# Opt level: O2

void cdef_filter_16_0_sse4_1
               (void *dest,int dstride,uint16_t *in,int pri_strength,int sec_strength,int dir,
               int pri_damping,int sec_damping,int coeff_shift,int block_width,int block_height)

{
  ushort *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar6;
  undefined1 auVar7 [16];
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  bool bVar17;
  short sVar18;
  ushort uVar20;
  short sVar21;
  undefined4 uVar22;
  short sVar35;
  ushort uVar37;
  short sVar38;
  ushort uVar40;
  ushort uVar42;
  ushort uVar44;
  ushort uVar47;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  ushort uVar34;
  ushort uVar45;
  ushort uVar48;
  ushort uVar49;
  ushort uVar51;
  ushort uVar52;
  ushort uVar53;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  short sVar62;
  short sVar63;
  short sVar64;
  short sVar65;
  short sVar66;
  short sVar67;
  short sVar68;
  short sVar69;
  short sVar70;
  short sVar71;
  short sVar72;
  short sVar73;
  undefined1 in_XMM1 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  short sVar74;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  short sVar75;
  short sVar76;
  short sVar96;
  short sVar97;
  short sVar98;
  short sVar102;
  short sVar107;
  short sVar112;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  short sVar120;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  short sVar103;
  short sVar108;
  short sVar113;
  short sVar121;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  ushort uVar114;
  ushort uVar115;
  ushort uVar122;
  ushort uVar123;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  short sVar125;
  ushort uVar133;
  short sVar158;
  ushort uVar168;
  ushort uVar177;
  ushort uVar186;
  ushort uVar195;
  ushort uVar205;
  undefined1 in_XMM3 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  ushort uVar126;
  ushort uVar159;
  ushort uVar196;
  ushort uVar206;
  ushort uVar215;
  ushort uVar216;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  ushort uVar166;
  ushort uVar175;
  ushort uVar184;
  ushort uVar193;
  ushort uVar203;
  ushort uVar213;
  ushort uVar223;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  ushort uVar225;
  ushort uVar226;
  ushort uVar238;
  ushort uVar240;
  ushort uVar241;
  ushort uVar244;
  ushort uVar245;
  ushort uVar248;
  ushort uVar249;
  ushort uVar252;
  ushort uVar253;
  ushort uVar256;
  ushort uVar257;
  ushort uVar260;
  undefined1 in_XMM4 [16];
  undefined1 auVar227 [16];
  ushort uVar261;
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  ushort uVar264;
  ushort uVar265;
  ushort uVar267;
  ushort uVar282;
  ushort uVar285;
  ushort uVar289;
  ushort uVar293;
  ushort uVar297;
  ushort uVar302;
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  ushort uVar307;
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  ushort uVar284;
  ushort uVar287;
  ushort uVar288;
  ushort uVar291;
  ushort uVar292;
  ushort uVar296;
  ushort uVar300;
  ushort uVar301;
  ushort uVar305;
  ushort uVar306;
  ushort uVar310;
  undefined1 auVar281 [16];
  ushort uVar313;
  ushort uVar314;
  ushort uVar332;
  ushort uVar335;
  ushort uVar338;
  ushort uVar339;
  ushort uVar342;
  ushort uVar345;
  ushort uVar346;
  ushort uVar349;
  ushort uVar350;
  undefined1 in_XMM6 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  ushort uVar353;
  ushort uVar354;
  undefined1 in_XMM7 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  ushort uVar385;
  ushort uVar388;
  ushort uVar401;
  ushort uVar404;
  ushort uVar406;
  ushort uVar410;
  ushort uVar414;
  ushort uVar417;
  ushort uVar419;
  ushort uVar422;
  ushort uVar424;
  ushort uVar427;
  undefined1 in_XMM8 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  ushort uVar429;
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  ushort uVar432;
  ushort uVar433;
  ushort uVar441;
  ushort uVar443;
  ushort uVar445;
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  short sVar453;
  short sVar454;
  ushort uVar455;
  short sVar473;
  ushort uVar475;
  short sVar476;
  ushort uVar478;
  short sVar479;
  short sVar481;
  ushort uVar483;
  short sVar484;
  short sVar486;
  ushort uVar488;
  undefined1 auVar456 [16];
  undefined1 auVar457 [16];
  undefined1 auVar458 [16];
  undefined1 auVar459 [16];
  undefined1 auVar460 [16];
  undefined1 auVar461 [16];
  undefined1 auVar462 [16];
  undefined1 auVar463 [16];
  undefined1 auVar464 [16];
  short sVar489;
  undefined1 auVar465 [16];
  undefined1 auVar466 [16];
  undefined1 auVar467 [16];
  short sVar474;
  short sVar477;
  short sVar480;
  short sVar482;
  short sVar485;
  short sVar487;
  short sVar490;
  undefined1 auVar468 [16];
  undefined1 auVar469 [16];
  undefined1 auVar470 [16];
  undefined1 auVar471 [16];
  undefined1 auVar472 [16];
  ushort uVar502;
  ushort uVar504;
  ushort uVar506;
  undefined1 auVar492 [16];
  undefined1 auVar493 [16];
  undefined1 auVar494 [16];
  undefined1 auVar495 [16];
  undefined1 auVar496 [16];
  ushort uVar508;
  undefined1 auVar497 [16];
  undefined1 auVar510 [16];
  undefined1 auVar511 [16];
  undefined1 auVar512 [16];
  undefined1 auVar513 [16];
  undefined1 auVar514 [16];
  undefined1 auVar515 [16];
  undefined1 auVar516 [16];
  ushort uVar524;
  ulong uVar525;
  ushort uVar527;
  ushort uVar528;
  ushort uVar529;
  ushort uVar530;
  ushort uVar531;
  ushort uVar532;
  undefined1 in_XMM13 [16];
  undefined1 auVar526 [16];
  ushort uVar533;
  ushort uVar545;
  ushort uVar547;
  ushort uVar549;
  undefined1 auVar535 [16];
  undefined1 auVar536 [16];
  undefined1 auVar537 [16];
  undefined1 auVar538 [16];
  undefined1 auVar539 [16];
  ushort uVar551;
  undefined1 auVar540 [16];
  ushort uVar552;
  ushort uVar558;
  ushort uVar559;
  ushort uVar560;
  ushort uVar561;
  ushort uVar562;
  ushort uVar563;
  undefined1 auVar553 [16];
  undefined1 auVar554 [16];
  undefined1 auVar555 [16];
  undefined1 auVar556 [16];
  ushort uVar564;
  undefined1 auVar557 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  ulong local_198;
  short local_188;
  short sStack_186;
  short local_178;
  short sStack_176;
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  short sVar19;
  short sVar33;
  short sVar36;
  short sVar39;
  short sVar41;
  short sVar43;
  short sVar46;
  short sVar50;
  short sVar99;
  short sVar100;
  short sVar101;
  short sVar104;
  short sVar105;
  short sVar106;
  short sVar109;
  short sVar110;
  short sVar111;
  ushort uVar116;
  short sVar117;
  short sVar118;
  short sVar119;
  ushort uVar124;
  short sVar127;
  short sVar128;
  short sVar129;
  short sVar130;
  short sVar131;
  short sVar132;
  short sVar160;
  short sVar161;
  short sVar162;
  short sVar163;
  short sVar164;
  short sVar165;
  ushort uVar167;
  short sVar169;
  short sVar170;
  short sVar171;
  short sVar172;
  short sVar173;
  short sVar174;
  ushort uVar176;
  short sVar178;
  short sVar179;
  short sVar180;
  short sVar181;
  short sVar182;
  short sVar183;
  ushort uVar185;
  short sVar187;
  short sVar188;
  short sVar189;
  short sVar190;
  short sVar191;
  short sVar192;
  ushort uVar194;
  short sVar197;
  short sVar198;
  short sVar199;
  short sVar200;
  short sVar201;
  short sVar202;
  ushort uVar204;
  short sVar207;
  short sVar208;
  short sVar209;
  short sVar210;
  short sVar211;
  short sVar212;
  ushort uVar214;
  short sVar217;
  short sVar218;
  short sVar219;
  short sVar220;
  short sVar221;
  short sVar222;
  ushort uVar224;
  ushort uVar239;
  ushort uVar242;
  ushort uVar243;
  ushort uVar246;
  ushort uVar247;
  ushort uVar250;
  ushort uVar251;
  ushort uVar254;
  ushort uVar255;
  ushort uVar258;
  ushort uVar259;
  ushort uVar262;
  ushort uVar263;
  ushort uVar266;
  ushort uVar283;
  ushort uVar286;
  ushort uVar290;
  ushort uVar294;
  ushort uVar295;
  ushort uVar298;
  ushort uVar299;
  ushort uVar303;
  ushort uVar304;
  ushort uVar308;
  ushort uVar309;
  short sVar311;
  short sVar312;
  short sVar330;
  short sVar331;
  short sVar333;
  short sVar334;
  short sVar336;
  short sVar337;
  short sVar340;
  short sVar341;
  short sVar343;
  short sVar344;
  short sVar347;
  short sVar348;
  short sVar351;
  short sVar352;
  short sVar355;
  short sVar356;
  short sVar370;
  short sVar371;
  short sVar372;
  short sVar373;
  short sVar374;
  short sVar375;
  short sVar376;
  short sVar377;
  short sVar378;
  short sVar379;
  short sVar380;
  short sVar381;
  short sVar382;
  short sVar383;
  short sVar384;
  ushort uVar386;
  ushort uVar387;
  short sVar400;
  ushort uVar402;
  ushort uVar403;
  short sVar405;
  ushort uVar407;
  ushort uVar408;
  short sVar409;
  ushort uVar411;
  ushort uVar412;
  short sVar413;
  ushort uVar415;
  ushort uVar416;
  short sVar418;
  ushort uVar420;
  ushort uVar421;
  short sVar423;
  ushort uVar425;
  ushort uVar426;
  short sVar428;
  ushort uVar430;
  ushort uVar431;
  ushort uVar434;
  ushort uVar442;
  ushort uVar444;
  ushort uVar446;
  ushort uVar447;
  ushort uVar448;
  ushort uVar449;
  ushort uVar450;
  ushort uVar451;
  ushort uVar452;
  short sVar491;
  short sVar498;
  short sVar499;
  short sVar500;
  short sVar501;
  short sVar503;
  short sVar505;
  short sVar507;
  short sVar509;
  short sVar517;
  short sVar518;
  short sVar519;
  short sVar520;
  short sVar521;
  short sVar522;
  short sVar523;
  short sVar534;
  short sVar541;
  short sVar542;
  short sVar543;
  short sVar544;
  short sVar546;
  short sVar548;
  short sVar550;
  
  bVar17 = ((uint)pri_strength >> (coeff_shift & 0x1fU) & 1) != 0;
  lVar12 = (long)dir;
  lVar8 = (long)cdef_directions_padded[lVar12 + 2][0];
  lVar9 = (long)cdef_directions_padded[lVar12 + 2][1];
  lVar10 = (long)cdef_directions_padded[lVar12 + 4][0];
  lVar11 = (long)cdef_directions_padded[lVar12 + 4][1];
  lVar14 = (long)cdef_directions_padded[lVar12][0];
  lVar12 = (long)cdef_directions_padded[lVar12][1];
  if (block_width == 8) {
    local_148._0_4_ = pri_damping;
    if (pri_strength != 0) {
      iVar6 = 0x1f;
      if (pri_strength != 0) {
        for (; (uint)pri_strength >> iVar6 == 0; iVar6 = iVar6 + -1) {
        }
      }
      local_148._0_4_ = pri_damping - iVar6;
      if (pri_damping < iVar6) {
        local_148._0_4_ = 0;
      }
    }
    uVar16 = sec_damping;
    if (sec_strength != 0) {
      iVar6 = 0x1f;
      if (sec_strength != 0) {
        for (; (uint)sec_strength >> iVar6 == 0; iVar6 = iVar6 + -1) {
        }
      }
      uVar16 = sec_damping - iVar6;
      if (sec_damping < iVar6) {
        uVar16 = 0;
      }
    }
    auVar23 = pshuflw(ZEXT416((uint)pri_strength),ZEXT416((uint)pri_strength),0);
    uVar22 = auVar23._0_4_;
    auVar23 = pshuflw(ZEXT416((uint)sec_strength),ZEXT416((uint)sec_strength),0);
    local_158._4_4_ = auVar23._0_4_;
    local_158._0_4_ = local_158._4_4_;
    local_158._8_4_ = local_158._4_4_;
    local_158._12_4_ = local_158._4_4_;
    auVar23 = pshuflw(ZEXT416((uint)2),ZEXT416((uint)2),0);
    auVar24 = pshuflw(ZEXT416((uint)1),ZEXT416((uint)1),0);
    for (lVar13 = 0; lVar13 < block_height; lVar13 = lVar13 + 2) {
      auVar229 = *(undefined1 (*) [16])in;
      auVar29 = *(undefined1 (*) [16])((long)in + 0x120);
      auVar134 = lddqu(in_XMM3,*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar8 * 2));
      auVar54 = lddqu(in_XMM1,*(undefined1 (*) [16])
                               (*(undefined1 (*) [16])((long)in + 0x120) + lVar8 * 2));
      auVar227 = lddqu(in_XMM4,*(undefined1 (*) [16])((long)in + lVar8 * -2));
      auVar389 = lddqu(in_XMM8,*(undefined1 (*) [16])((long)in + lVar8 * -2 + 0x120));
      sVar76 = auVar229._0_2_;
      sVar99 = auVar134._0_2_;
      auVar135._0_2_ = sVar99 - sVar76;
      sVar96 = auVar229._2_2_;
      sVar101 = auVar134._2_2_;
      auVar135._2_2_ = sVar101 - sVar96;
      sVar97 = auVar229._4_2_;
      sVar104 = auVar134._4_2_;
      auVar135._4_2_ = sVar104 - sVar97;
      sVar98 = auVar229._6_2_;
      sVar106 = auVar134._6_2_;
      auVar135._6_2_ = sVar106 - sVar98;
      sVar103 = auVar229._8_2_;
      sVar109 = auVar134._8_2_;
      auVar135._8_2_ = sVar109 - sVar103;
      sVar108 = auVar229._10_2_;
      sVar111 = auVar134._10_2_;
      auVar135._10_2_ = sVar111 - sVar108;
      sVar113 = auVar229._12_2_;
      sVar117 = auVar134._12_2_;
      sVar119 = auVar134._14_2_;
      auVar135._12_2_ = sVar117 - sVar113;
      sVar121 = auVar229._14_2_;
      auVar135._14_2_ = sVar119 - sVar121;
      sVar454 = auVar29._0_2_;
      sVar127 = auVar54._0_2_;
      auVar268._0_2_ = sVar127 - sVar454;
      sVar474 = auVar29._2_2_;
      sVar128 = auVar54._2_2_;
      auVar268._2_2_ = sVar128 - sVar474;
      sVar477 = auVar29._4_2_;
      sVar129 = auVar54._4_2_;
      auVar268._4_2_ = sVar129 - sVar477;
      sVar480 = auVar29._6_2_;
      sVar130 = auVar54._6_2_;
      auVar268._6_2_ = sVar130 - sVar480;
      sVar482 = auVar29._8_2_;
      sVar131 = auVar54._8_2_;
      auVar268._8_2_ = sVar131 - sVar482;
      sVar485 = auVar29._10_2_;
      sVar132 = auVar54._10_2_;
      auVar268._10_2_ = sVar132 - sVar485;
      sVar487 = auVar29._12_2_;
      sVar160 = auVar54._12_2_;
      sVar161 = auVar54._14_2_;
      auVar268._12_2_ = sVar160 - sVar487;
      sVar490 = auVar29._14_2_;
      auVar268._14_2_ = sVar161 - sVar490;
      auVar315 = pabsw(in_XMM6,auVar135);
      auVar136 = psraw(auVar135,0xf);
      auVar357 = pabsw(in_XMM7,auVar268);
      auVar269 = psraw(auVar268,0xf);
      local_148._4_4_ = 0;
      uVar20 = auVar315._0_2_;
      auVar25._0_2_ = uVar20 >> local_148._0_8_;
      uVar34 = auVar315._2_2_;
      auVar25._2_2_ = uVar34 >> local_148._0_8_;
      uVar37 = auVar315._4_2_;
      auVar25._4_2_ = uVar37 >> local_148._0_8_;
      uVar126 = auVar315._6_2_;
      auVar25._6_2_ = uVar126 >> local_148._0_8_;
      uVar40 = auVar315._8_2_;
      auVar25._8_2_ = uVar40 >> local_148._0_8_;
      uVar42 = auVar315._10_2_;
      auVar25._10_2_ = uVar42 >> local_148._0_8_;
      uVar159 = auVar315._12_2_;
      uVar44 = auVar315._14_2_;
      auVar25._12_2_ = uVar159 >> local_148._0_8_;
      auVar25._14_2_ = uVar44 >> local_148._0_8_;
      uVar47 = auVar357._0_2_;
      auVar456._0_2_ = uVar47 >> local_148._0_8_;
      uVar168 = auVar357._2_2_;
      auVar456._2_2_ = uVar168 >> local_148._0_8_;
      uVar51 = auVar357._4_2_;
      auVar456._4_2_ = uVar51 >> local_148._0_8_;
      uVar177 = auVar357._6_2_;
      auVar456._6_2_ = uVar177 >> local_148._0_8_;
      uVar186 = auVar357._8_2_;
      auVar456._8_2_ = uVar186 >> local_148._0_8_;
      uVar195 = auVar357._10_2_;
      auVar456._10_2_ = uVar195 >> local_148._0_8_;
      uVar205 = auVar357._12_2_;
      uVar45 = auVar357._14_2_;
      auVar456._12_2_ = uVar205 >> local_148._0_8_;
      auVar456._14_2_ = uVar45 >> local_148._0_8_;
      auVar7._4_4_ = uVar22;
      auVar7._0_4_ = uVar22;
      auVar7._8_4_ = uVar22;
      auVar7._12_4_ = uVar22;
      auVar357 = psubusw(auVar7,auVar25);
      auVar315 = psubusw(auVar7,auVar456);
      sVar41 = auVar357._0_2_;
      sVar43 = auVar357._2_2_;
      sVar46 = auVar357._4_2_;
      sVar50 = auVar357._6_2_;
      sVar63 = auVar357._8_2_;
      sVar62 = auVar357._10_2_;
      sVar65 = auVar357._12_2_;
      sVar64 = auVar357._14_2_;
      sVar18 = auVar315._0_2_;
      sVar21 = auVar315._2_2_;
      sVar19 = auVar315._4_2_;
      sVar35 = auVar315._6_2_;
      sVar38 = auVar315._8_2_;
      sVar33 = auVar315._10_2_;
      sVar36 = auVar315._12_2_;
      sVar39 = auVar315._14_2_;
      auVar55._0_2_ =
           (((short)uVar20 < sVar41) * uVar20 | (ushort)((short)uVar20 >= sVar41) * sVar41) +
           auVar136._0_2_;
      auVar55._2_2_ =
           (((short)uVar34 < sVar43) * uVar34 | (ushort)((short)uVar34 >= sVar43) * sVar43) +
           auVar136._2_2_;
      auVar55._4_2_ =
           (((short)uVar37 < sVar46) * uVar37 | (ushort)((short)uVar37 >= sVar46) * sVar46) +
           auVar136._4_2_;
      auVar55._6_2_ =
           (((short)uVar126 < sVar50) * uVar126 | (ushort)((short)uVar126 >= sVar50) * sVar50) +
           auVar136._6_2_;
      auVar55._8_2_ =
           (((short)uVar40 < sVar63) * uVar40 | (ushort)((short)uVar40 >= sVar63) * sVar63) +
           auVar136._8_2_;
      auVar55._10_2_ =
           (((short)uVar42 < sVar62) * uVar42 | (ushort)((short)uVar42 >= sVar62) * sVar62) +
           auVar136._10_2_;
      auVar55._12_2_ =
           (((short)uVar159 < sVar65) * uVar159 | (ushort)((short)uVar159 >= sVar65) * sVar65) +
           auVar136._12_2_;
      auVar55._14_2_ =
           (((short)uVar44 < sVar64) * uVar44 | (ushort)((short)uVar44 >= sVar64) * sVar64) +
           auVar136._14_2_;
      auVar26._0_2_ =
           (((short)uVar47 < sVar18) * uVar47 | (ushort)((short)uVar47 >= sVar18) * sVar18) +
           auVar269._0_2_;
      auVar26._2_2_ =
           (((short)uVar168 < sVar21) * uVar168 | (ushort)((short)uVar168 >= sVar21) * sVar21) +
           auVar269._2_2_;
      auVar26._4_2_ =
           (((short)uVar51 < sVar19) * uVar51 | (ushort)((short)uVar51 >= sVar19) * sVar19) +
           auVar269._4_2_;
      auVar26._6_2_ =
           (((short)uVar177 < sVar35) * uVar177 | (ushort)((short)uVar177 >= sVar35) * sVar35) +
           auVar269._6_2_;
      auVar26._8_2_ =
           (((short)uVar186 < sVar38) * uVar186 | (ushort)((short)uVar186 >= sVar38) * sVar38) +
           auVar269._8_2_;
      auVar26._10_2_ =
           (((short)uVar195 < sVar33) * uVar195 | (ushort)((short)uVar195 >= sVar33) * sVar33) +
           auVar269._10_2_;
      auVar26._12_2_ =
           (((short)uVar205 < sVar36) * uVar205 | (ushort)((short)uVar205 >= sVar36) * sVar36) +
           auVar269._12_2_;
      auVar26._14_2_ =
           (((short)uVar45 < sVar39) * uVar45 | (ushort)((short)uVar45 >= sVar39) * sVar39) +
           auVar269._14_2_;
      auVar55 = auVar55 ^ auVar136;
      auVar26 = auVar26 ^ auVar269;
      sVar100 = auVar227._0_2_;
      auVar137._0_2_ = sVar100 - sVar76;
      sVar102 = auVar227._2_2_;
      auVar137._2_2_ = sVar102 - sVar96;
      sVar105 = auVar227._4_2_;
      auVar137._4_2_ = sVar105 - sVar97;
      sVar107 = auVar227._6_2_;
      auVar137._6_2_ = sVar107 - sVar98;
      sVar110 = auVar227._8_2_;
      auVar137._8_2_ = sVar110 - sVar103;
      sVar112 = auVar227._10_2_;
      auVar137._10_2_ = sVar112 - sVar108;
      sVar118 = auVar227._12_2_;
      sVar120 = auVar227._14_2_;
      auVar137._12_2_ = sVar118 - sVar113;
      auVar137._14_2_ = sVar120 - sVar121;
      sVar162 = auVar389._0_2_;
      auVar358._0_2_ = sVar162 - sVar454;
      sVar163 = auVar389._2_2_;
      auVar358._2_2_ = sVar163 - sVar474;
      sVar164 = auVar389._4_2_;
      auVar358._4_2_ = sVar164 - sVar477;
      sVar165 = auVar389._6_2_;
      auVar358._6_2_ = sVar165 - sVar480;
      sVar169 = auVar389._8_2_;
      auVar358._8_2_ = sVar169 - sVar482;
      sVar170 = auVar389._10_2_;
      auVar358._10_2_ = sVar170 - sVar485;
      sVar171 = auVar389._12_2_;
      sVar172 = auVar389._14_2_;
      auVar358._12_2_ = sVar171 - sVar487;
      auVar358._14_2_ = sVar172 - sVar490;
      auVar315 = pabsw(auVar456,auVar137);
      auVar269 = psraw(auVar137,0xf);
      auVar492 = pabsw(auVar29,auVar358);
      auVar136 = psraw(auVar358,0xf);
      uVar20 = auVar315._0_2_;
      auVar270._0_2_ = uVar20 >> local_148._0_8_;
      uVar34 = auVar315._2_2_;
      auVar270._2_2_ = uVar34 >> local_148._0_8_;
      uVar37 = auVar315._4_2_;
      auVar270._4_2_ = uVar37 >> local_148._0_8_;
      uVar126 = auVar315._6_2_;
      auVar270._6_2_ = uVar126 >> local_148._0_8_;
      uVar40 = auVar315._8_2_;
      auVar270._8_2_ = uVar40 >> local_148._0_8_;
      uVar42 = auVar315._10_2_;
      auVar270._10_2_ = uVar42 >> local_148._0_8_;
      uVar159 = auVar315._12_2_;
      uVar44 = auVar315._14_2_;
      auVar270._12_2_ = uVar159 >> local_148._0_8_;
      auVar270._14_2_ = uVar44 >> local_148._0_8_;
      uVar47 = auVar492._0_2_;
      auVar510._0_2_ = uVar47 >> local_148._0_8_;
      uVar168 = auVar492._2_2_;
      auVar510._2_2_ = uVar168 >> local_148._0_8_;
      uVar51 = auVar492._4_2_;
      auVar510._4_2_ = uVar51 >> local_148._0_8_;
      uVar177 = auVar492._6_2_;
      auVar510._6_2_ = uVar177 >> local_148._0_8_;
      uVar186 = auVar492._8_2_;
      auVar510._8_2_ = uVar186 >> local_148._0_8_;
      uVar195 = auVar492._10_2_;
      auVar510._10_2_ = uVar195 >> local_148._0_8_;
      uVar205 = auVar492._12_2_;
      uVar45 = auVar492._14_2_;
      auVar510._12_2_ = uVar205 >> local_148._0_8_;
      auVar510._14_2_ = uVar45 >> local_148._0_8_;
      auVar357 = psubusw(auVar7,auVar270);
      auVar315 = psubusw(auVar7,auVar510);
      sVar41 = auVar357._0_2_;
      sVar43 = auVar357._2_2_;
      sVar46 = auVar357._4_2_;
      sVar50 = auVar357._6_2_;
      sVar63 = auVar357._8_2_;
      sVar62 = auVar357._10_2_;
      sVar65 = auVar357._12_2_;
      sVar64 = auVar357._14_2_;
      sVar18 = auVar315._0_2_;
      sVar21 = auVar315._2_2_;
      sVar19 = auVar315._4_2_;
      sVar35 = auVar315._6_2_;
      sVar38 = auVar315._8_2_;
      sVar33 = auVar315._10_2_;
      sVar36 = auVar315._12_2_;
      sVar39 = auVar315._14_2_;
      auVar316._0_2_ =
           (((short)uVar20 < sVar41) * uVar20 | (ushort)((short)uVar20 >= sVar41) * sVar41) +
           auVar269._0_2_;
      auVar316._2_2_ =
           (((short)uVar34 < sVar43) * uVar34 | (ushort)((short)uVar34 >= sVar43) * sVar43) +
           auVar269._2_2_;
      auVar316._4_2_ =
           (((short)uVar37 < sVar46) * uVar37 | (ushort)((short)uVar37 >= sVar46) * sVar46) +
           auVar269._4_2_;
      auVar316._6_2_ =
           (((short)uVar126 < sVar50) * uVar126 | (ushort)((short)uVar126 >= sVar50) * sVar50) +
           auVar269._6_2_;
      auVar316._8_2_ =
           (((short)uVar40 < sVar63) * uVar40 | (ushort)((short)uVar40 >= sVar63) * sVar63) +
           auVar269._8_2_;
      auVar316._10_2_ =
           (((short)uVar42 < sVar62) * uVar42 | (ushort)((short)uVar42 >= sVar62) * sVar62) +
           auVar269._10_2_;
      auVar316._12_2_ =
           (((short)uVar159 < sVar65) * uVar159 | (ushort)((short)uVar159 >= sVar65) * sVar65) +
           auVar269._12_2_;
      auVar316._14_2_ =
           (((short)uVar44 < sVar64) * uVar44 | (ushort)((short)uVar44 >= sVar64) * sVar64) +
           auVar269._14_2_;
      auVar271._0_2_ =
           (((short)uVar47 < sVar18) * uVar47 | (ushort)((short)uVar47 >= sVar18) * sVar18) +
           auVar136._0_2_;
      auVar271._2_2_ =
           (((short)uVar168 < sVar21) * uVar168 | (ushort)((short)uVar168 >= sVar21) * sVar21) +
           auVar136._2_2_;
      auVar271._4_2_ =
           (((short)uVar51 < sVar19) * uVar51 | (ushort)((short)uVar51 >= sVar19) * sVar19) +
           auVar136._4_2_;
      auVar271._6_2_ =
           (((short)uVar177 < sVar35) * uVar177 | (ushort)((short)uVar177 >= sVar35) * sVar35) +
           auVar136._6_2_;
      auVar271._8_2_ =
           (((short)uVar186 < sVar38) * uVar186 | (ushort)((short)uVar186 >= sVar38) * sVar38) +
           auVar136._8_2_;
      auVar271._10_2_ =
           (((short)uVar195 < sVar33) * uVar195 | (ushort)((short)uVar195 >= sVar33) * sVar33) +
           auVar136._10_2_;
      auVar271._12_2_ =
           (((short)uVar205 < sVar36) * uVar205 | (ushort)((short)uVar205 >= sVar36) * sVar36) +
           auVar136._12_2_;
      auVar271._14_2_ =
           (((short)uVar45 < sVar39) * uVar45 | (ushort)((short)uVar45 >= sVar39) * sVar39) +
           auVar136._14_2_;
      auVar316 = auVar316 ^ auVar269;
      auVar271 = auVar271 ^ auVar136;
      auVar315 = pshuflw(ZEXT416((uint)cdef_pri_taps[bVar17][0]),
                         ZEXT416((uint)cdef_pri_taps[bVar17][0]),0);
      auVar27._0_4_ = auVar315._0_4_;
      auVar27._4_4_ = auVar27._0_4_;
      auVar27._8_4_ = auVar27._0_4_;
      auVar27._12_4_ = auVar27._0_4_;
      sVar21 = auVar315._0_2_;
      sVar38 = auVar315._2_2_;
      auVar357 = lddqu(auVar55,*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar9 * 2));
      auVar136 = lddqu(auVar27,*(undefined1 (*) [16])
                                (*(undefined1 (*) [16])((long)in + 0x120) + lVar9 * 2));
      sVar18 = auVar357._0_2_;
      auVar56._0_2_ = sVar18 - sVar76;
      sVar63 = auVar357._2_2_;
      auVar56._2_2_ = sVar63 - sVar96;
      sVar65 = auVar357._4_2_;
      auVar56._4_2_ = sVar65 - sVar97;
      sVar67 = auVar357._6_2_;
      auVar56._6_2_ = sVar67 - sVar98;
      sVar69 = auVar357._8_2_;
      auVar56._8_2_ = sVar69 - sVar103;
      sVar71 = auVar357._10_2_;
      auVar56._10_2_ = sVar71 - sVar108;
      sVar73 = auVar357._12_2_;
      sVar75 = auVar357._14_2_;
      auVar56._12_2_ = sVar73 - sVar113;
      auVar56._14_2_ = sVar75 - sVar121;
      sVar19 = auVar136._0_2_;
      auVar28._0_2_ = sVar19 - sVar454;
      sVar33 = auVar136._2_2_;
      auVar28._2_2_ = sVar33 - sVar474;
      sVar36 = auVar136._4_2_;
      auVar28._4_2_ = sVar36 - sVar477;
      sVar39 = auVar136._6_2_;
      auVar28._6_2_ = sVar39 - sVar480;
      sVar41 = auVar136._8_2_;
      auVar28._8_2_ = sVar41 - sVar482;
      sVar43 = auVar136._10_2_;
      auVar28._10_2_ = sVar43 - sVar485;
      sVar46 = auVar136._12_2_;
      sVar50 = auVar136._14_2_;
      auVar28._12_2_ = sVar46 - sVar487;
      auVar28._14_2_ = sVar50 - sVar490;
      auVar315 = pabsw(auVar269,auVar56);
      auVar492 = pabsw(auVar492,auVar28);
      uVar20 = auVar315._0_2_;
      auVar359._0_2_ = uVar20 >> local_148._0_8_;
      uVar34 = auVar315._2_2_;
      auVar359._2_2_ = uVar34 >> local_148._0_8_;
      uVar37 = auVar315._4_2_;
      auVar359._4_2_ = uVar37 >> local_148._0_8_;
      uVar126 = auVar315._6_2_;
      auVar359._6_2_ = uVar126 >> local_148._0_8_;
      uVar40 = auVar315._8_2_;
      auVar359._8_2_ = uVar40 >> local_148._0_8_;
      uVar42 = auVar315._10_2_;
      auVar359._10_2_ = uVar42 >> local_148._0_8_;
      uVar159 = auVar315._12_2_;
      uVar44 = auVar315._14_2_;
      auVar359._12_2_ = uVar159 >> local_148._0_8_;
      auVar359._14_2_ = uVar44 >> local_148._0_8_;
      auVar269 = psubusw(auVar7,auVar359);
      uVar47 = auVar492._0_2_;
      auVar511._0_2_ = uVar47 >> local_148._0_8_;
      uVar168 = auVar492._2_2_;
      auVar511._2_2_ = uVar168 >> local_148._0_8_;
      uVar51 = auVar492._4_2_;
      auVar511._4_2_ = uVar51 >> local_148._0_8_;
      uVar177 = auVar492._6_2_;
      auVar511._6_2_ = uVar177 >> local_148._0_8_;
      uVar186 = auVar492._8_2_;
      auVar511._8_2_ = uVar186 >> local_148._0_8_;
      uVar195 = auVar492._10_2_;
      auVar511._10_2_ = uVar195 >> local_148._0_8_;
      uVar205 = auVar492._12_2_;
      uVar45 = auVar492._14_2_;
      auVar511._12_2_ = uVar205 >> local_148._0_8_;
      auVar511._14_2_ = uVar45 >> local_148._0_8_;
      auVar492 = psubusw(auVar7,auVar511);
      sVar125 = auVar269._0_2_;
      sVar158 = auVar269._2_2_;
      sVar173 = auVar269._4_2_;
      sVar174 = auVar269._6_2_;
      sVar178 = auVar269._8_2_;
      sVar179 = auVar269._10_2_;
      sVar180 = auVar269._12_2_;
      sVar181 = auVar269._14_2_;
      auVar138 = lddqu(auVar315,*(undefined1 (*) [16])((long)in + lVar9 * -2));
      auVar269 = psraw(auVar56,0xf);
      auVar315 = psraw(auVar28,0xf);
      sVar35 = auVar492._0_2_;
      sVar62 = auVar492._2_2_;
      sVar64 = auVar492._4_2_;
      sVar66 = auVar492._6_2_;
      sVar68 = auVar492._8_2_;
      sVar70 = auVar492._10_2_;
      sVar72 = auVar492._12_2_;
      sVar74 = auVar492._14_2_;
      auVar457._0_2_ =
           (((short)uVar20 < sVar125) * uVar20 | (ushort)((short)uVar20 >= sVar125) * sVar125) +
           auVar269._0_2_;
      auVar457._2_2_ =
           (((short)uVar34 < sVar158) * uVar34 | (ushort)((short)uVar34 >= sVar158) * sVar158) +
           auVar269._2_2_;
      auVar457._4_2_ =
           (((short)uVar37 < sVar173) * uVar37 | (ushort)((short)uVar37 >= sVar173) * sVar173) +
           auVar269._4_2_;
      auVar457._6_2_ =
           (((short)uVar126 < sVar174) * uVar126 | (ushort)((short)uVar126 >= sVar174) * sVar174) +
           auVar269._6_2_;
      auVar457._8_2_ =
           (((short)uVar40 < sVar178) * uVar40 | (ushort)((short)uVar40 >= sVar178) * sVar178) +
           auVar269._8_2_;
      auVar457._10_2_ =
           (((short)uVar42 < sVar179) * uVar42 | (ushort)((short)uVar42 >= sVar179) * sVar179) +
           auVar269._10_2_;
      auVar457._12_2_ =
           (((short)uVar159 < sVar180) * uVar159 | (ushort)((short)uVar159 >= sVar180) * sVar180) +
           auVar269._12_2_;
      auVar457._14_2_ =
           (((short)uVar44 < sVar181) * uVar44 | (ushort)((short)uVar44 >= sVar181) * sVar181) +
           auVar269._14_2_;
      auVar360._0_2_ =
           (((short)uVar47 < sVar35) * uVar47 | (ushort)((short)uVar47 >= sVar35) * sVar35) +
           auVar315._0_2_;
      auVar360._2_2_ =
           (((short)uVar168 < sVar62) * uVar168 | (ushort)((short)uVar168 >= sVar62) * sVar62) +
           auVar315._2_2_;
      auVar360._4_2_ =
           (((short)uVar51 < sVar64) * uVar51 | (ushort)((short)uVar51 >= sVar64) * sVar64) +
           auVar315._4_2_;
      auVar360._6_2_ =
           (((short)uVar177 < sVar66) * uVar177 | (ushort)((short)uVar177 >= sVar66) * sVar66) +
           auVar315._6_2_;
      auVar360._8_2_ =
           (((short)uVar186 < sVar68) * uVar186 | (ushort)((short)uVar186 >= sVar68) * sVar68) +
           auVar315._8_2_;
      auVar360._10_2_ =
           (((short)uVar195 < sVar70) * uVar195 | (ushort)((short)uVar195 >= sVar70) * sVar70) +
           auVar315._10_2_;
      auVar360._12_2_ =
           (((short)uVar205 < sVar72) * uVar205 | (ushort)((short)uVar205 >= sVar72) * sVar72) +
           auVar315._12_2_;
      auVar360._14_2_ =
           (((short)uVar45 < sVar74) * uVar45 | (ushort)((short)uVar45 >= sVar74) * sVar74) +
           auVar315._14_2_;
      auVar457 = auVar457 ^ auVar269;
      sVar491 = auVar138._0_2_;
      auVar493._0_2_ = sVar491 - sVar76;
      sVar498 = auVar138._2_2_;
      auVar493._2_2_ = sVar498 - sVar96;
      sVar499 = auVar138._4_2_;
      auVar493._4_2_ = sVar499 - sVar97;
      sVar500 = auVar138._6_2_;
      auVar493._6_2_ = sVar500 - sVar98;
      sVar501 = auVar138._8_2_;
      auVar493._8_2_ = sVar501 - sVar103;
      sVar503 = auVar138._10_2_;
      auVar493._10_2_ = sVar503 - sVar108;
      sVar505 = auVar138._12_2_;
      sVar507 = auVar138._14_2_;
      auVar493._12_2_ = sVar505 - sVar113;
      auVar493._14_2_ = sVar507 - sVar121;
      auVar269 = pabsw(auVar138,auVar493);
      uVar20 = auVar269._0_2_;
      auVar57._0_2_ = uVar20 >> local_148._0_8_;
      uVar34 = auVar269._2_2_;
      auVar57._2_2_ = uVar34 >> local_148._0_8_;
      uVar37 = auVar269._4_2_;
      auVar57._4_2_ = uVar37 >> local_148._0_8_;
      uVar126 = auVar269._6_2_;
      auVar57._6_2_ = uVar126 >> local_148._0_8_;
      uVar40 = auVar269._8_2_;
      auVar57._8_2_ = uVar40 >> local_148._0_8_;
      uVar42 = auVar269._10_2_;
      auVar57._10_2_ = uVar42 >> local_148._0_8_;
      uVar159 = auVar269._12_2_;
      uVar44 = auVar269._14_2_;
      auVar57._12_2_ = uVar159 >> local_148._0_8_;
      auVar57._14_2_ = uVar44 >> local_148._0_8_;
      auVar360 = auVar360 ^ auVar315;
      auVar269 = psubusw(auVar7,auVar57);
      auVar492 = lddqu(auVar511,*(undefined1 (*) [16])((long)in + lVar9 * -2 + 0x120));
      sVar509 = auVar492._0_2_;
      auVar512._0_2_ = sVar509 - sVar454;
      sVar517 = auVar492._2_2_;
      auVar512._2_2_ = sVar517 - sVar474;
      sVar518 = auVar492._4_2_;
      auVar512._4_2_ = sVar518 - sVar477;
      sVar519 = auVar492._6_2_;
      auVar512._6_2_ = sVar519 - sVar480;
      sVar520 = auVar492._8_2_;
      auVar512._8_2_ = sVar520 - sVar482;
      sVar521 = auVar492._10_2_;
      auVar512._10_2_ = sVar521 - sVar485;
      sVar522 = auVar492._12_2_;
      sVar523 = auVar492._14_2_;
      auVar512._12_2_ = sVar522 - sVar487;
      auVar512._14_2_ = sVar523 - sVar490;
      auVar315 = pabsw(in_XMM13,auVar512);
      uVar47 = auVar315._0_2_;
      auVar535._0_2_ = uVar47 >> local_148._0_8_;
      uVar168 = auVar315._2_2_;
      auVar535._2_2_ = uVar168 >> local_148._0_8_;
      uVar51 = auVar315._4_2_;
      auVar535._4_2_ = uVar51 >> local_148._0_8_;
      uVar177 = auVar315._6_2_;
      auVar535._6_2_ = uVar177 >> local_148._0_8_;
      uVar186 = auVar315._8_2_;
      auVar535._8_2_ = uVar186 >> local_148._0_8_;
      uVar195 = auVar315._10_2_;
      auVar535._10_2_ = uVar195 >> local_148._0_8_;
      uVar205 = auVar315._12_2_;
      uVar45 = auVar315._14_2_;
      auVar535._12_2_ = uVar205 >> local_148._0_8_;
      auVar535._14_2_ = uVar45 >> local_148._0_8_;
      auVar315 = psubusw(auVar7,auVar535);
      sVar125 = auVar269._0_2_;
      sVar158 = auVar269._2_2_;
      sVar173 = auVar269._4_2_;
      sVar174 = auVar269._6_2_;
      sVar178 = auVar269._8_2_;
      sVar179 = auVar269._10_2_;
      sVar180 = auVar269._12_2_;
      sVar181 = auVar269._14_2_;
      sVar35 = auVar315._0_2_;
      sVar62 = auVar315._2_2_;
      sVar64 = auVar315._4_2_;
      sVar66 = auVar315._6_2_;
      sVar68 = auVar315._8_2_;
      sVar70 = auVar315._10_2_;
      sVar72 = auVar315._12_2_;
      sVar74 = auVar315._14_2_;
      auVar315 = psraw(auVar493,0xf);
      auVar390._0_2_ =
           (((short)uVar20 < sVar125) * uVar20 | (ushort)((short)uVar20 >= sVar125) * sVar125) +
           auVar315._0_2_;
      auVar390._2_2_ =
           (((short)uVar34 < sVar158) * uVar34 | (ushort)((short)uVar34 >= sVar158) * sVar158) +
           auVar315._2_2_;
      auVar390._4_2_ =
           (((short)uVar37 < sVar173) * uVar37 | (ushort)((short)uVar37 >= sVar173) * sVar173) +
           auVar315._4_2_;
      auVar390._6_2_ =
           (((short)uVar126 < sVar174) * uVar126 | (ushort)((short)uVar126 >= sVar174) * sVar174) +
           auVar315._6_2_;
      auVar390._8_2_ =
           (((short)uVar40 < sVar178) * uVar40 | (ushort)((short)uVar40 >= sVar178) * sVar178) +
           auVar315._8_2_;
      auVar390._10_2_ =
           (((short)uVar42 < sVar179) * uVar42 | (ushort)((short)uVar42 >= sVar179) * sVar179) +
           auVar315._10_2_;
      auVar390._12_2_ =
           (((short)uVar159 < sVar180) * uVar159 | (ushort)((short)uVar159 >= sVar180) * sVar180) +
           auVar315._12_2_;
      auVar390._14_2_ =
           (((short)uVar44 < sVar181) * uVar44 | (ushort)((short)uVar44 >= sVar181) * sVar181) +
           auVar315._14_2_;
      auVar390 = auVar390 ^ auVar315;
      auVar315 = psraw(auVar512,0xf);
      auVar58._0_2_ =
           (((short)uVar47 < sVar35) * uVar47 | (ushort)((short)uVar47 >= sVar35) * sVar35) +
           auVar315._0_2_;
      auVar58._2_2_ =
           (((short)uVar168 < sVar62) * uVar168 | (ushort)((short)uVar168 >= sVar62) * sVar62) +
           auVar315._2_2_;
      auVar58._4_2_ =
           (((short)uVar51 < sVar64) * uVar51 | (ushort)((short)uVar51 >= sVar64) * sVar64) +
           auVar315._4_2_;
      auVar58._6_2_ =
           (((short)uVar177 < sVar66) * uVar177 | (ushort)((short)uVar177 >= sVar66) * sVar66) +
           auVar315._6_2_;
      auVar58._8_2_ =
           (((short)uVar186 < sVar68) * uVar186 | (ushort)((short)uVar186 >= sVar68) * sVar68) +
           auVar315._8_2_;
      auVar58._10_2_ =
           (((short)uVar195 < sVar70) * uVar195 | (ushort)((short)uVar195 >= sVar70) * sVar70) +
           auVar315._10_2_;
      auVar58._12_2_ =
           (((short)uVar205 < sVar72) * uVar205 | (ushort)((short)uVar205 >= sVar72) * sVar72) +
           auVar315._12_2_;
      auVar58._14_2_ =
           (((short)uVar45 < sVar74) * uVar45 | (ushort)((short)uVar45 >= sVar74) * sVar74) +
           auVar315._14_2_;
      auVar58 = auVar58 ^ auVar315;
      auVar315 = pshuflw(ZEXT416((uint)cdef_pri_taps[bVar17][1]),
                         ZEXT416((uint)cdef_pri_taps[bVar17][1]),0);
      sVar125 = auVar315._0_2_;
      sVar158 = auVar315._2_2_;
      auVar391._0_2_ =
           (auVar390._0_2_ + auVar457._0_2_) * sVar125 + (auVar316._0_2_ + auVar55._0_2_) * sVar21;
      auVar391._2_2_ =
           (auVar390._2_2_ + auVar457._2_2_) * sVar158 + (auVar316._2_2_ + auVar55._2_2_) * sVar38;
      auVar391._4_2_ =
           (auVar390._4_2_ + auVar457._4_2_) * sVar125 + (auVar316._4_2_ + auVar55._4_2_) * sVar21;
      auVar391._6_2_ =
           (auVar390._6_2_ + auVar457._6_2_) * sVar158 + (auVar316._6_2_ + auVar55._6_2_) * sVar38;
      auVar391._8_2_ =
           (auVar390._8_2_ + auVar457._8_2_) * sVar125 + (auVar316._8_2_ + auVar55._8_2_) * sVar21;
      auVar391._10_2_ =
           (auVar390._10_2_ + auVar457._10_2_) * sVar158 +
           (auVar316._10_2_ + auVar55._10_2_) * sVar38;
      auVar391._12_2_ =
           (auVar390._12_2_ + auVar457._12_2_) * sVar125 +
           (auVar316._12_2_ + auVar55._12_2_) * sVar21;
      auVar391._14_2_ =
           (auVar390._14_2_ + auVar457._14_2_) * sVar158 +
           (auVar316._14_2_ + auVar55._14_2_) * sVar38;
      auVar134 = auVar134 & _DAT_004c0740;
      sVar35 = auVar134._0_2_;
      uVar126 = (ushort)(sVar35 < sVar76) * sVar76 | (ushort)(sVar35 >= sVar76) * sVar35;
      sVar35 = auVar134._2_2_;
      uVar159 = (ushort)(sVar35 < sVar96) * sVar96 | (ushort)(sVar35 >= sVar96) * sVar35;
      sVar35 = auVar134._4_2_;
      uVar168 = (ushort)(sVar35 < sVar97) * sVar97 | (ushort)(sVar35 >= sVar97) * sVar35;
      sVar35 = auVar134._6_2_;
      uVar177 = (ushort)(sVar35 < sVar98) * sVar98 | (ushort)(sVar35 >= sVar98) * sVar35;
      sVar35 = auVar134._8_2_;
      uVar186 = (ushort)(sVar35 < sVar103) * sVar103 | (ushort)(sVar35 >= sVar103) * sVar35;
      sVar35 = auVar134._10_2_;
      uVar195 = (ushort)(sVar35 < sVar108) * sVar108 | (ushort)(sVar35 >= sVar108) * sVar35;
      sVar35 = auVar134._12_2_;
      sVar62 = auVar134._14_2_;
      uVar205 = (ushort)(sVar35 < sVar113) * sVar113 | (ushort)(sVar35 >= sVar113) * sVar35;
      uVar215 = (ushort)(sVar62 < sVar121) * sVar121 | (ushort)(sVar62 >= sVar121) * sVar62;
      auVar54 = auVar54 & _DAT_004c0740;
      sVar35 = auVar54._0_2_;
      uVar265 = (ushort)(sVar35 < sVar454) * sVar454 | (ushort)(sVar35 >= sVar454) * sVar35;
      sVar35 = auVar54._2_2_;
      uVar282 = (ushort)(sVar35 < sVar474) * sVar474 | (ushort)(sVar35 >= sVar474) * sVar35;
      sVar35 = auVar54._4_2_;
      uVar285 = (ushort)(sVar35 < sVar477) * sVar477 | (ushort)(sVar35 >= sVar477) * sVar35;
      sVar35 = auVar54._6_2_;
      uVar289 = (ushort)(sVar35 < sVar480) * sVar480 | (ushort)(sVar35 >= sVar480) * sVar35;
      sVar35 = auVar54._8_2_;
      uVar293 = (ushort)(sVar35 < sVar482) * sVar482 | (ushort)(sVar35 >= sVar482) * sVar35;
      sVar35 = auVar54._10_2_;
      uVar297 = (ushort)(sVar35 < sVar485) * sVar485 | (ushort)(sVar35 >= sVar485) * sVar35;
      sVar35 = auVar54._12_2_;
      sVar62 = auVar54._14_2_;
      uVar302 = (ushort)(sVar35 < sVar487) * sVar487 | (ushort)(sVar35 >= sVar487) * sVar35;
      uVar307 = (ushort)(sVar62 < sVar490) * sVar490 | (ushort)(sVar62 >= sVar490) * sVar62;
      auVar227 = auVar227 & _DAT_004c0740;
      auVar389 = auVar389 & _DAT_004c0740;
      uVar225 = (ushort)(sVar18 < sVar100) * sVar18 | (ushort)(sVar18 >= sVar100) * sVar100;
      uVar238 = (ushort)(sVar63 < sVar102) * sVar63 | (ushort)(sVar63 >= sVar102) * sVar102;
      uVar241 = (ushort)(sVar65 < sVar105) * sVar65 | (ushort)(sVar65 >= sVar105) * sVar105;
      uVar245 = (ushort)(sVar67 < sVar107) * sVar67 | (ushort)(sVar67 >= sVar107) * sVar107;
      uVar249 = (ushort)(sVar69 < sVar110) * sVar69 | (ushort)(sVar69 >= sVar110) * sVar110;
      uVar253 = (ushort)(sVar71 < sVar112) * sVar71 | (ushort)(sVar71 >= sVar112) * sVar112;
      uVar257 = (ushort)(sVar73 < sVar118) * sVar73 | (ushort)(sVar73 >= sVar118) * sVar118;
      uVar261 = (ushort)(sVar75 < sVar120) * sVar75 | (ushort)(sVar75 >= sVar120) * sVar120;
      auVar357 = auVar357 & _DAT_004c0740;
      sVar18 = auVar227._0_2_;
      sVar35 = auVar357._0_2_;
      uVar20 = (ushort)(sVar35 < sVar18) * sVar18 | (ushort)(sVar35 >= sVar18) * sVar35;
      sVar18 = auVar227._2_2_;
      sVar35 = auVar357._2_2_;
      uVar34 = (ushort)(sVar35 < sVar18) * sVar18 | (ushort)(sVar35 >= sVar18) * sVar35;
      sVar18 = auVar227._4_2_;
      sVar35 = auVar357._4_2_;
      uVar37 = (ushort)(sVar35 < sVar18) * sVar18 | (ushort)(sVar35 >= sVar18) * sVar35;
      sVar18 = auVar227._6_2_;
      sVar35 = auVar357._6_2_;
      uVar40 = (ushort)(sVar35 < sVar18) * sVar18 | (ushort)(sVar35 >= sVar18) * sVar35;
      sVar18 = auVar227._8_2_;
      sVar35 = auVar357._8_2_;
      uVar42 = (ushort)(sVar35 < sVar18) * sVar18 | (ushort)(sVar35 >= sVar18) * sVar35;
      sVar18 = auVar227._10_2_;
      sVar35 = auVar357._10_2_;
      uVar44 = (ushort)(sVar35 < sVar18) * sVar18 | (ushort)(sVar35 >= sVar18) * sVar35;
      sVar18 = auVar227._12_2_;
      sVar35 = auVar357._12_2_;
      sVar63 = auVar357._14_2_;
      uVar47 = (ushort)(sVar35 < sVar18) * sVar18 | (ushort)(sVar35 >= sVar18) * sVar35;
      sVar18 = auVar227._14_2_;
      uVar51 = (ushort)(sVar63 < sVar18) * sVar18 | (ushort)(sVar63 >= sVar18) * sVar63;
      uVar20 = ((short)uVar20 < (short)uVar126) * uVar126 |
               ((short)uVar20 >= (short)uVar126) * uVar20;
      uVar126 = ((short)uVar34 < (short)uVar159) * uVar159 |
                ((short)uVar34 >= (short)uVar159) * uVar34;
      uVar159 = ((short)uVar37 < (short)uVar168) * uVar168 |
                ((short)uVar37 >= (short)uVar168) * uVar37;
      uVar168 = ((short)uVar40 < (short)uVar177) * uVar177 |
                ((short)uVar40 >= (short)uVar177) * uVar40;
      uVar186 = ((short)uVar42 < (short)uVar186) * uVar186 |
                ((short)uVar42 >= (short)uVar186) * uVar42;
      uVar45 = ((short)uVar44 < (short)uVar195) * uVar195 |
               ((short)uVar44 >= (short)uVar195) * uVar44;
      uVar48 = ((short)uVar47 < (short)uVar205) * uVar205 |
               ((short)uVar47 >= (short)uVar205) * uVar47;
      uVar52 = ((short)uVar51 < (short)uVar215) * uVar215 |
               ((short)uVar51 >= (short)uVar215) * uVar51;
      auVar494._0_2_ = (ushort)(sVar19 < sVar162) * sVar19 | (ushort)(sVar19 >= sVar162) * sVar162;
      auVar494._2_2_ = (ushort)(sVar33 < sVar163) * sVar33 | (ushort)(sVar33 >= sVar163) * sVar163;
      auVar494._4_2_ = (ushort)(sVar36 < sVar164) * sVar36 | (ushort)(sVar36 >= sVar164) * sVar164;
      auVar494._6_2_ = (ushort)(sVar39 < sVar165) * sVar39 | (ushort)(sVar39 >= sVar165) * sVar165;
      auVar494._8_2_ = (ushort)(sVar41 < sVar169) * sVar41 | (ushort)(sVar41 >= sVar169) * sVar169;
      auVar494._10_2_ = (ushort)(sVar43 < sVar170) * sVar43 | (ushort)(sVar43 >= sVar170) * sVar170;
      auVar494._12_2_ = (ushort)(sVar46 < sVar171) * sVar46 | (ushort)(sVar46 >= sVar171) * sVar171;
      auVar494._14_2_ = (ushort)(sVar50 < sVar172) * sVar50 | (ushort)(sVar50 >= sVar172) * sVar172;
      auVar136 = auVar136 & _DAT_004c0740;
      sVar18 = auVar389._0_2_;
      sVar19 = auVar136._0_2_;
      uVar34 = (ushort)(sVar19 < sVar18) * sVar18 | (ushort)(sVar19 >= sVar18) * sVar19;
      sVar18 = auVar389._2_2_;
      sVar19 = auVar136._2_2_;
      uVar37 = (ushort)(sVar19 < sVar18) * sVar18 | (ushort)(sVar19 >= sVar18) * sVar19;
      sVar18 = auVar389._4_2_;
      sVar19 = auVar136._4_2_;
      uVar42 = (ushort)(sVar19 < sVar18) * sVar18 | (ushort)(sVar19 >= sVar18) * sVar19;
      sVar18 = auVar389._6_2_;
      sVar19 = auVar136._6_2_;
      uVar47 = (ushort)(sVar19 < sVar18) * sVar18 | (ushort)(sVar19 >= sVar18) * sVar19;
      sVar18 = auVar389._8_2_;
      sVar19 = auVar136._8_2_;
      uVar177 = (ushort)(sVar19 < sVar18) * sVar18 | (ushort)(sVar19 >= sVar18) * sVar19;
      sVar18 = auVar389._10_2_;
      sVar19 = auVar136._10_2_;
      uVar205 = (ushort)(sVar19 < sVar18) * sVar18 | (ushort)(sVar19 >= sVar18) * sVar19;
      sVar18 = auVar389._12_2_;
      sVar19 = auVar136._12_2_;
      sVar35 = auVar136._14_2_;
      uVar49 = (ushort)(sVar19 < sVar18) * sVar18 | (ushort)(sVar19 >= sVar18) * sVar19;
      sVar18 = auVar389._14_2_;
      uVar53 = (ushort)(sVar35 < sVar18) * sVar18 | (ushort)(sVar35 >= sVar18) * sVar35;
      uVar34 = ((short)uVar34 < (short)uVar265) * uVar265 |
               ((short)uVar34 >= (short)uVar265) * uVar34;
      uVar40 = ((short)uVar37 < (short)uVar282) * uVar282 |
               ((short)uVar37 >= (short)uVar282) * uVar37;
      uVar44 = ((short)uVar42 < (short)uVar285) * uVar285 |
               ((short)uVar42 >= (short)uVar285) * uVar42;
      uVar51 = ((short)uVar47 < (short)uVar289) * uVar289 |
               ((short)uVar47 >= (short)uVar289) * uVar47;
      uVar195 = ((short)uVar177 < (short)uVar293) * uVar293 |
                ((short)uVar177 >= (short)uVar293) * uVar177;
      uVar215 = ((short)uVar205 < (short)uVar297) * uVar297 |
                ((short)uVar205 >= (short)uVar297) * uVar205;
      uVar265 = ((short)uVar49 < (short)uVar302) * uVar302 |
                ((short)uVar49 >= (short)uVar302) * uVar49;
      uVar282 = ((short)uVar53 < (short)uVar307) * uVar307 |
                ((short)uVar53 >= (short)uVar307) * uVar53;
      uVar37 = (ushort)(sVar76 < sVar99) * sVar76 | (ushort)(sVar76 >= sVar99) * sVar99;
      uVar42 = (ushort)(sVar96 < sVar101) * sVar96 | (ushort)(sVar96 >= sVar101) * sVar101;
      uVar47 = (ushort)(sVar97 < sVar104) * sVar97 | (ushort)(sVar97 >= sVar104) * sVar104;
      uVar177 = (ushort)(sVar98 < sVar106) * sVar98 | (ushort)(sVar98 >= sVar106) * sVar106;
      uVar205 = (ushort)(sVar103 < sVar109) * sVar103 | (ushort)(sVar103 >= sVar109) * sVar109;
      uVar49 = (ushort)(sVar108 < sVar111) * sVar108 | (ushort)(sVar108 >= sVar111) * sVar111;
      uVar53 = (ushort)(sVar113 < sVar117) * sVar113 | (ushort)(sVar113 >= sVar117) * sVar117;
      uVar285 = (ushort)(sVar121 < sVar119) * sVar121 | (ushort)(sVar121 >= sVar119) * sVar119;
      uVar289 = (ushort)(sVar454 < sVar127) * sVar454 | (ushort)(sVar454 >= sVar127) * sVar127;
      uVar293 = (ushort)(sVar474 < sVar128) * sVar474 | (ushort)(sVar474 >= sVar128) * sVar128;
      uVar297 = (ushort)(sVar477 < sVar129) * sVar477 | (ushort)(sVar477 >= sVar129) * sVar129;
      uVar302 = (ushort)(sVar480 < sVar130) * sVar480 | (ushort)(sVar480 >= sVar130) * sVar130;
      uVar307 = (ushort)(sVar482 < sVar131) * sVar482 | (ushort)(sVar482 >= sVar131) * sVar131;
      uVar196 = (ushort)(sVar485 < sVar132) * sVar485 | (ushort)(sVar485 >= sVar132) * sVar132;
      uVar206 = (ushort)(sVar487 < sVar160) * sVar487 | (ushort)(sVar487 >= sVar160) * sVar160;
      uVar216 = (ushort)(sVar490 < sVar161) * sVar490 | (ushort)(sVar490 >= sVar161) * sVar161;
      auVar77._0_2_ =
           ((short)uVar225 < (short)uVar37) * uVar225 | ((short)uVar225 >= (short)uVar37) * uVar37;
      auVar77._2_2_ =
           ((short)uVar238 < (short)uVar42) * uVar238 | ((short)uVar238 >= (short)uVar42) * uVar42;
      auVar77._4_2_ =
           ((short)uVar241 < (short)uVar47) * uVar241 | ((short)uVar241 >= (short)uVar47) * uVar47;
      auVar77._6_2_ =
           ((short)uVar245 < (short)uVar177) * uVar245 |
           ((short)uVar245 >= (short)uVar177) * uVar177;
      auVar77._8_2_ =
           ((short)uVar249 < (short)uVar205) * uVar249 |
           ((short)uVar249 >= (short)uVar205) * uVar205;
      auVar77._10_2_ =
           ((short)uVar253 < (short)uVar49) * uVar253 | ((short)uVar253 >= (short)uVar49) * uVar49;
      auVar77._12_2_ =
           ((short)uVar257 < (short)uVar53) * uVar257 | ((short)uVar257 >= (short)uVar53) * uVar53;
      auVar77._14_2_ =
           ((short)uVar261 < (short)uVar285) * uVar261 |
           ((short)uVar261 >= (short)uVar285) * uVar285;
      auVar139._0_2_ =
           ((short)auVar494._0_2_ < (short)uVar289) * auVar494._0_2_ |
           ((short)auVar494._0_2_ >= (short)uVar289) * uVar289;
      auVar139._2_2_ =
           ((short)auVar494._2_2_ < (short)uVar293) * auVar494._2_2_ |
           ((short)auVar494._2_2_ >= (short)uVar293) * uVar293;
      auVar139._4_2_ =
           ((short)auVar494._4_2_ < (short)uVar297) * auVar494._4_2_ |
           ((short)auVar494._4_2_ >= (short)uVar297) * uVar297;
      auVar139._6_2_ =
           ((short)auVar494._6_2_ < (short)uVar302) * auVar494._6_2_ |
           ((short)auVar494._6_2_ >= (short)uVar302) * uVar302;
      auVar139._8_2_ =
           ((short)auVar494._8_2_ < (short)uVar307) * auVar494._8_2_ |
           ((short)auVar494._8_2_ >= (short)uVar307) * uVar307;
      auVar139._10_2_ =
           ((short)auVar494._10_2_ < (short)uVar196) * auVar494._10_2_ |
           ((short)auVar494._10_2_ >= (short)uVar196) * uVar196;
      auVar139._12_2_ =
           ((short)auVar494._12_2_ < (short)uVar206) * auVar494._12_2_ |
           ((short)auVar494._12_2_ >= (short)uVar206) * uVar206;
      auVar139._14_2_ =
           ((short)auVar494._14_2_ < (short)uVar216) * auVar494._14_2_ |
           ((short)auVar494._14_2_ >= (short)uVar216) * uVar216;
      auVar315 = lddqu(auVar77,*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar10 * 2));
      auVar317 = lddqu(auVar227,*(undefined1 (*) [16])
                                 (*(undefined1 (*) [16])((long)in + 0x120) + lVar10 * 2));
      sVar69 = auVar315._0_2_;
      auVar78._0_2_ = sVar69 - sVar76;
      sVar71 = auVar315._2_2_;
      auVar78._2_2_ = sVar71 - sVar96;
      sVar73 = auVar315._4_2_;
      auVar78._4_2_ = sVar73 - sVar97;
      sVar75 = auVar315._6_2_;
      auVar78._6_2_ = sVar75 - sVar98;
      sVar99 = auVar315._8_2_;
      auVar78._8_2_ = sVar99 - sVar103;
      sVar104 = auVar315._10_2_;
      auVar78._10_2_ = sVar104 - sVar108;
      sVar109 = auVar315._12_2_;
      sVar117 = auVar315._14_2_;
      auVar78._12_2_ = sVar109 - sVar113;
      auVar78._14_2_ = sVar117 - sVar121;
      auVar136 = pabsw(auVar139,auVar78);
      uVar525 = (ulong)uVar16;
      uVar37 = auVar136._0_2_;
      auVar272._0_2_ = uVar37 >> uVar525;
      uVar42 = auVar136._2_2_;
      auVar272._2_2_ = uVar42 >> uVar525;
      uVar47 = auVar136._4_2_;
      auVar272._4_2_ = uVar47 >> uVar525;
      uVar177 = auVar136._6_2_;
      auVar272._6_2_ = uVar177 >> uVar525;
      uVar205 = auVar136._8_2_;
      auVar272._8_2_ = uVar205 >> uVar525;
      uVar49 = auVar136._10_2_;
      auVar272._10_2_ = uVar49 >> uVar525;
      uVar53 = auVar136._12_2_;
      uVar285 = auVar136._14_2_;
      auVar272._12_2_ = uVar53 >> uVar525;
      auVar272._14_2_ = uVar285 >> uVar525;
      auVar357 = psubusw(local_158,auVar272);
      sVar311 = auVar317._0_2_;
      auVar318._0_2_ = sVar311 - sVar454;
      sVar330 = auVar317._2_2_;
      auVar318._2_2_ = sVar330 - sVar474;
      sVar333 = auVar317._4_2_;
      auVar318._4_2_ = sVar333 - sVar477;
      sVar336 = auVar317._6_2_;
      auVar318._6_2_ = sVar336 - sVar480;
      sVar340 = auVar317._8_2_;
      auVar318._8_2_ = sVar340 - sVar482;
      sVar343 = auVar317._10_2_;
      auVar318._10_2_ = sVar343 - sVar485;
      sVar347 = auVar317._12_2_;
      sVar351 = auVar317._14_2_;
      auVar318._12_2_ = sVar347 - sVar487;
      auVar318._14_2_ = sVar351 - sVar490;
      auVar269 = pabsw(auVar389,auVar318);
      uVar289 = auVar269._0_2_;
      auVar458._0_2_ = uVar289 >> uVar525;
      uVar293 = auVar269._2_2_;
      auVar458._2_2_ = uVar293 >> uVar525;
      uVar297 = auVar269._4_2_;
      auVar458._4_2_ = uVar297 >> uVar525;
      uVar302 = auVar269._6_2_;
      auVar458._6_2_ = uVar302 >> uVar525;
      uVar307 = auVar269._8_2_;
      auVar458._8_2_ = uVar307 >> uVar525;
      uVar196 = auVar269._10_2_;
      auVar458._10_2_ = uVar196 >> uVar525;
      uVar206 = auVar269._12_2_;
      uVar216 = auVar269._14_2_;
      auVar458._12_2_ = uVar206 >> uVar525;
      auVar458._14_2_ = uVar216 >> uVar525;
      auVar54 = psubusw(local_158,auVar458);
      sVar18 = auVar357._0_2_;
      sVar19 = auVar357._2_2_;
      sVar35 = auVar357._4_2_;
      sVar33 = auVar357._6_2_;
      sVar36 = auVar357._8_2_;
      sVar39 = auVar357._10_2_;
      sVar41 = auVar357._12_2_;
      sVar43 = auVar357._14_2_;
      sVar46 = auVar54._0_2_;
      sVar50 = auVar54._2_2_;
      sVar63 = auVar54._4_2_;
      sVar62 = auVar54._6_2_;
      sVar65 = auVar54._8_2_;
      sVar64 = auVar54._10_2_;
      sVar67 = auVar54._12_2_;
      sVar66 = auVar54._14_2_;
      auVar357 = psraw(auVar78,0xf);
      auVar228._0_2_ =
           (((short)uVar37 < sVar18) * uVar37 | (ushort)((short)uVar37 >= sVar18) * sVar18) +
           auVar357._0_2_;
      auVar228._2_2_ =
           (((short)uVar42 < sVar19) * uVar42 | (ushort)((short)uVar42 >= sVar19) * sVar19) +
           auVar357._2_2_;
      auVar228._4_2_ =
           (((short)uVar47 < sVar35) * uVar47 | (ushort)((short)uVar47 >= sVar35) * sVar35) +
           auVar357._4_2_;
      auVar228._6_2_ =
           (((short)uVar177 < sVar33) * uVar177 | (ushort)((short)uVar177 >= sVar33) * sVar33) +
           auVar357._6_2_;
      auVar228._8_2_ =
           (((short)uVar205 < sVar36) * uVar205 | (ushort)((short)uVar205 >= sVar36) * sVar36) +
           auVar357._8_2_;
      auVar228._10_2_ =
           (((short)uVar49 < sVar39) * uVar49 | (ushort)((short)uVar49 >= sVar39) * sVar39) +
           auVar357._10_2_;
      auVar228._12_2_ =
           (((short)uVar53 < sVar41) * uVar53 | (ushort)((short)uVar53 >= sVar41) * sVar41) +
           auVar357._12_2_;
      auVar228._14_2_ =
           (((short)uVar285 < sVar43) * uVar285 | (ushort)((short)uVar285 >= sVar43) * sVar43) +
           auVar357._14_2_;
      auVar228 = auVar228 ^ auVar357;
      auVar361 = lddqu(auVar269,*(undefined1 (*) [16])((long)in + lVar10 * -2));
      auVar357 = psraw(auVar318,0xf);
      auVar273._0_2_ =
           (((short)uVar289 < sVar46) * uVar289 | (ushort)((short)uVar289 >= sVar46) * sVar46) +
           auVar357._0_2_;
      auVar273._2_2_ =
           (((short)uVar293 < sVar50) * uVar293 | (ushort)((short)uVar293 >= sVar50) * sVar50) +
           auVar357._2_2_;
      auVar273._4_2_ =
           (((short)uVar297 < sVar63) * uVar297 | (ushort)((short)uVar297 >= sVar63) * sVar63) +
           auVar357._4_2_;
      auVar273._6_2_ =
           (((short)uVar302 < sVar62) * uVar302 | (ushort)((short)uVar302 >= sVar62) * sVar62) +
           auVar357._6_2_;
      auVar273._8_2_ =
           (((short)uVar307 < sVar65) * uVar307 | (ushort)((short)uVar307 >= sVar65) * sVar65) +
           auVar357._8_2_;
      auVar273._10_2_ =
           (((short)uVar196 < sVar64) * uVar196 | (ushort)((short)uVar196 >= sVar64) * sVar64) +
           auVar357._10_2_;
      auVar273._12_2_ =
           (((short)uVar206 < sVar67) * uVar206 | (ushort)((short)uVar206 >= sVar67) * sVar67) +
           auVar357._12_2_;
      auVar273._14_2_ =
           (((short)uVar216 < sVar66) * uVar216 | (ushort)((short)uVar216 >= sVar66) * sVar66) +
           auVar357._14_2_;
      auVar273 = auVar273 ^ auVar357;
      sVar355 = auVar361._0_2_;
      auVar362._0_2_ = sVar355 - sVar76;
      sVar370 = auVar361._2_2_;
      auVar362._2_2_ = sVar370 - sVar96;
      sVar372 = auVar361._4_2_;
      auVar362._4_2_ = sVar372 - sVar97;
      sVar374 = auVar361._6_2_;
      auVar362._6_2_ = sVar374 - sVar98;
      sVar376 = auVar361._8_2_;
      auVar362._8_2_ = sVar376 - sVar103;
      sVar378 = auVar361._10_2_;
      auVar362._10_2_ = sVar378 - sVar108;
      sVar380 = auVar361._12_2_;
      sVar382 = auVar361._14_2_;
      auVar362._12_2_ = sVar380 - sVar113;
      auVar362._14_2_ = sVar382 - sVar121;
      auVar140 = lddqu(auVar136,*(undefined1 (*) [16])((long)in + lVar10 * -2 + 0x120));
      sVar127 = auVar140._0_2_;
      auVar141._0_2_ = sVar127 - sVar454;
      sVar160 = auVar140._2_2_;
      auVar141._2_2_ = sVar160 - sVar474;
      sVar169 = auVar140._4_2_;
      auVar141._4_2_ = sVar169 - sVar477;
      sVar178 = auVar140._6_2_;
      auVar141._6_2_ = sVar178 - sVar480;
      sVar187 = auVar140._8_2_;
      auVar141._8_2_ = sVar187 - sVar482;
      sVar197 = auVar140._10_2_;
      auVar141._10_2_ = sVar197 - sVar485;
      sVar207 = auVar140._12_2_;
      sVar217 = auVar140._14_2_;
      auVar141._12_2_ = sVar207 - sVar487;
      auVar141._14_2_ = sVar217 - sVar490;
      auVar357 = pabsw(auVar458,auVar362);
      uVar37 = auVar357._0_2_;
      auVar79._0_2_ = uVar37 >> uVar525;
      uVar42 = auVar357._2_2_;
      auVar79._2_2_ = uVar42 >> uVar525;
      uVar47 = auVar357._4_2_;
      auVar79._4_2_ = uVar47 >> uVar525;
      uVar177 = auVar357._6_2_;
      auVar79._6_2_ = uVar177 >> uVar525;
      uVar205 = auVar357._8_2_;
      auVar79._8_2_ = uVar205 >> uVar525;
      uVar49 = auVar357._10_2_;
      auVar79._10_2_ = uVar49 >> uVar525;
      uVar53 = auVar357._12_2_;
      uVar285 = auVar357._14_2_;
      auVar79._12_2_ = uVar53 >> uVar525;
      auVar79._14_2_ = uVar285 >> uVar525;
      auVar54 = pabsw(auVar494,auVar141);
      uVar289 = auVar54._0_2_;
      auVar513._0_2_ = uVar289 >> uVar525;
      uVar293 = auVar54._2_2_;
      auVar513._2_2_ = uVar293 >> uVar525;
      uVar297 = auVar54._4_2_;
      auVar513._4_2_ = uVar297 >> uVar525;
      uVar302 = auVar54._6_2_;
      auVar513._6_2_ = uVar302 >> uVar525;
      uVar307 = auVar54._8_2_;
      auVar513._8_2_ = uVar307 >> uVar525;
      uVar196 = auVar54._10_2_;
      auVar513._10_2_ = uVar196 >> uVar525;
      uVar206 = auVar54._12_2_;
      uVar216 = auVar54._14_2_;
      auVar513._12_2_ = uVar206 >> uVar525;
      auVar513._14_2_ = uVar216 >> uVar525;
      auVar136 = psubusw(local_158,auVar79);
      auVar357 = psubusw(local_158,auVar513);
      sVar46 = auVar136._0_2_;
      sVar50 = auVar136._2_2_;
      sVar63 = auVar136._4_2_;
      sVar62 = auVar136._6_2_;
      sVar65 = auVar136._8_2_;
      sVar64 = auVar136._10_2_;
      sVar67 = auVar136._12_2_;
      sVar66 = auVar136._14_2_;
      sVar18 = auVar357._0_2_;
      sVar19 = auVar357._2_2_;
      sVar35 = auVar357._4_2_;
      sVar33 = auVar357._6_2_;
      sVar36 = auVar357._8_2_;
      sVar39 = auVar357._10_2_;
      sVar41 = auVar357._12_2_;
      sVar43 = auVar357._14_2_;
      auVar136 = psraw(auVar362,0xf);
      auVar319._0_2_ =
           (((short)uVar37 < sVar46) * uVar37 | (ushort)((short)uVar37 >= sVar46) * sVar46) +
           auVar136._0_2_;
      auVar319._2_2_ =
           (((short)uVar42 < sVar50) * uVar42 | (ushort)((short)uVar42 >= sVar50) * sVar50) +
           auVar136._2_2_;
      auVar319._4_2_ =
           (((short)uVar47 < sVar63) * uVar47 | (ushort)((short)uVar47 >= sVar63) * sVar63) +
           auVar136._4_2_;
      auVar319._6_2_ =
           (((short)uVar177 < sVar62) * uVar177 | (ushort)((short)uVar177 >= sVar62) * sVar62) +
           auVar136._6_2_;
      auVar319._8_2_ =
           (((short)uVar205 < sVar65) * uVar205 | (ushort)((short)uVar205 >= sVar65) * sVar65) +
           auVar136._8_2_;
      auVar319._10_2_ =
           (((short)uVar49 < sVar64) * uVar49 | (ushort)((short)uVar49 >= sVar64) * sVar64) +
           auVar136._10_2_;
      auVar319._12_2_ =
           (((short)uVar53 < sVar67) * uVar53 | (ushort)((short)uVar53 >= sVar67) * sVar67) +
           auVar136._12_2_;
      auVar319._14_2_ =
           (((short)uVar285 < sVar66) * uVar285 | (ushort)((short)uVar285 >= sVar66) * sVar66) +
           auVar136._14_2_;
      auVar319 = auVar319 ^ auVar136;
      auVar320._0_2_ = auVar319._0_2_ + auVar228._0_2_;
      auVar320._2_2_ = auVar319._2_2_ + auVar228._2_2_;
      auVar320._4_2_ = auVar319._4_2_ + auVar228._4_2_;
      auVar320._6_2_ = auVar319._6_2_ + auVar228._6_2_;
      auVar320._8_2_ = auVar319._8_2_ + auVar228._8_2_;
      auVar320._10_2_ = auVar319._10_2_ + auVar228._10_2_;
      auVar320._12_2_ = auVar319._12_2_ + auVar228._12_2_;
      auVar320._14_2_ = auVar319._14_2_ + auVar228._14_2_;
      auVar357 = psraw(auVar141,0xf);
      auVar80._0_2_ =
           (((short)uVar289 < sVar18) * uVar289 | (ushort)((short)uVar289 >= sVar18) * sVar18) +
           auVar357._0_2_;
      auVar80._2_2_ =
           (((short)uVar293 < sVar19) * uVar293 | (ushort)((short)uVar293 >= sVar19) * sVar19) +
           auVar357._2_2_;
      auVar80._4_2_ =
           (((short)uVar297 < sVar35) * uVar297 | (ushort)((short)uVar297 >= sVar35) * sVar35) +
           auVar357._4_2_;
      auVar80._6_2_ =
           (((short)uVar302 < sVar33) * uVar302 | (ushort)((short)uVar302 >= sVar33) * sVar33) +
           auVar357._6_2_;
      auVar80._8_2_ =
           (((short)uVar307 < sVar36) * uVar307 | (ushort)((short)uVar307 >= sVar36) * sVar36) +
           auVar357._8_2_;
      auVar80._10_2_ =
           (((short)uVar196 < sVar39) * uVar196 | (ushort)((short)uVar196 >= sVar39) * sVar39) +
           auVar357._10_2_;
      auVar80._12_2_ =
           (((short)uVar206 < sVar41) * uVar206 | (ushort)((short)uVar206 >= sVar41) * sVar41) +
           auVar357._12_2_;
      auVar80._14_2_ =
           (((short)uVar216 < sVar43) * uVar216 | (ushort)((short)uVar216 >= sVar43) * sVar43) +
           auVar357._14_2_;
      auVar80 = auVar80 ^ auVar357;
      auVar81._0_2_ = auVar80._0_2_ + auVar273._0_2_;
      auVar81._2_2_ = auVar80._2_2_ + auVar273._2_2_;
      auVar81._4_2_ = auVar80._4_2_ + auVar273._4_2_;
      auVar81._6_2_ = auVar80._6_2_ + auVar273._6_2_;
      auVar81._8_2_ = auVar80._8_2_ + auVar273._8_2_;
      auVar81._10_2_ = auVar80._10_2_ + auVar273._10_2_;
      auVar81._12_2_ = auVar80._12_2_ + auVar273._12_2_;
      auVar81._14_2_ = auVar80._14_2_ + auVar273._14_2_;
      auVar357 = lddqu(auVar357,*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar14 * 2));
      sVar128 = auVar357._0_2_;
      auVar142._0_2_ = sVar128 - sVar76;
      sVar161 = auVar357._2_2_;
      auVar142._2_2_ = sVar161 - sVar96;
      sVar170 = auVar357._4_2_;
      auVar142._4_2_ = sVar170 - sVar97;
      sVar179 = auVar357._6_2_;
      auVar142._6_2_ = sVar179 - sVar98;
      sVar188 = auVar357._8_2_;
      auVar142._8_2_ = sVar188 - sVar103;
      sVar198 = auVar357._10_2_;
      auVar142._10_2_ = sVar198 - sVar108;
      sVar208 = auVar357._12_2_;
      sVar218 = auVar357._14_2_;
      auVar142._12_2_ = sVar208 - sVar113;
      auVar142._14_2_ = sVar218 - sVar121;
      auVar136 = lddqu(auVar136,*(undefined1 (*) [16])
                                 (*(undefined1 (*) [16])((long)in + 0x120) + lVar14 * 2));
      sVar356 = auVar136._0_2_;
      auVar363._0_2_ = sVar356 - sVar454;
      sVar371 = auVar136._2_2_;
      auVar363._2_2_ = sVar371 - sVar474;
      sVar373 = auVar136._4_2_;
      auVar363._4_2_ = sVar373 - sVar477;
      sVar375 = auVar136._6_2_;
      auVar363._6_2_ = sVar375 - sVar480;
      sVar377 = auVar136._8_2_;
      auVar363._8_2_ = sVar377 - sVar482;
      sVar379 = auVar136._10_2_;
      auVar363._10_2_ = sVar379 - sVar485;
      sVar381 = auVar136._12_2_;
      sVar383 = auVar136._14_2_;
      auVar363._12_2_ = sVar381 - sVar487;
      auVar363._14_2_ = sVar383 - sVar490;
      auVar54 = pabsw(auVar54,auVar142);
      uVar37 = auVar54._0_2_;
      auVar459._0_2_ = uVar37 >> uVar525;
      uVar42 = auVar54._2_2_;
      auVar459._2_2_ = uVar42 >> uVar525;
      uVar47 = auVar54._4_2_;
      auVar459._4_2_ = uVar47 >> uVar525;
      uVar177 = auVar54._6_2_;
      auVar459._6_2_ = uVar177 >> uVar525;
      uVar205 = auVar54._8_2_;
      auVar459._8_2_ = uVar205 >> uVar525;
      uVar49 = auVar54._10_2_;
      auVar459._10_2_ = uVar49 >> uVar525;
      uVar53 = auVar54._12_2_;
      uVar285 = auVar54._14_2_;
      auVar459._12_2_ = uVar53 >> uVar525;
      auVar459._14_2_ = uVar285 >> uVar525;
      auVar134 = pabsw(ZEXT416(uVar16),auVar363);
      uVar289 = auVar134._0_2_;
      auVar536._0_2_ = uVar289 >> uVar525;
      uVar293 = auVar134._2_2_;
      auVar536._2_2_ = uVar293 >> uVar525;
      uVar297 = auVar134._4_2_;
      auVar536._4_2_ = uVar297 >> uVar525;
      uVar302 = auVar134._6_2_;
      auVar536._6_2_ = uVar302 >> uVar525;
      uVar307 = auVar134._8_2_;
      auVar536._8_2_ = uVar307 >> uVar525;
      uVar196 = auVar134._10_2_;
      auVar536._10_2_ = uVar196 >> uVar525;
      uVar206 = auVar134._12_2_;
      uVar216 = auVar134._14_2_;
      auVar536._12_2_ = uVar206 >> uVar525;
      auVar536._14_2_ = uVar216 >> uVar525;
      auVar269 = psubusw(local_158,auVar459);
      auVar54 = psubusw(local_158,auVar536);
      sVar46 = auVar269._0_2_;
      sVar50 = auVar269._2_2_;
      sVar63 = auVar269._4_2_;
      sVar62 = auVar269._6_2_;
      sVar65 = auVar269._8_2_;
      sVar64 = auVar269._10_2_;
      sVar67 = auVar269._12_2_;
      sVar66 = auVar269._14_2_;
      sVar18 = auVar54._0_2_;
      sVar19 = auVar54._2_2_;
      sVar35 = auVar54._4_2_;
      sVar33 = auVar54._6_2_;
      sVar36 = auVar54._8_2_;
      sVar39 = auVar54._10_2_;
      sVar41 = auVar54._12_2_;
      sVar43 = auVar54._14_2_;
      auVar54 = psraw(auVar142,0xf);
      auVar514._0_2_ =
           (((short)uVar37 < sVar46) * uVar37 | (ushort)((short)uVar37 >= sVar46) * sVar46) +
           auVar54._0_2_;
      auVar514._2_2_ =
           (((short)uVar42 < sVar50) * uVar42 | (ushort)((short)uVar42 >= sVar50) * sVar50) +
           auVar54._2_2_;
      auVar514._4_2_ =
           (((short)uVar47 < sVar63) * uVar47 | (ushort)((short)uVar47 >= sVar63) * sVar63) +
           auVar54._4_2_;
      auVar514._6_2_ =
           (((short)uVar177 < sVar62) * uVar177 | (ushort)((short)uVar177 >= sVar62) * sVar62) +
           auVar54._6_2_;
      auVar514._8_2_ =
           (((short)uVar205 < sVar65) * uVar205 | (ushort)((short)uVar205 >= sVar65) * sVar65) +
           auVar54._8_2_;
      auVar514._10_2_ =
           (((short)uVar49 < sVar64) * uVar49 | (ushort)((short)uVar49 >= sVar64) * sVar64) +
           auVar54._10_2_;
      auVar514._12_2_ =
           (((short)uVar53 < sVar67) * uVar53 | (ushort)((short)uVar53 >= sVar67) * sVar67) +
           auVar54._12_2_;
      auVar514._14_2_ =
           (((short)uVar285 < sVar66) * uVar285 | (ushort)((short)uVar285 >= sVar66) * sVar66) +
           auVar54._14_2_;
      auVar514 = auVar514 ^ auVar54;
      auVar269 = psraw(auVar363,0xf);
      auVar460._0_2_ =
           (((short)uVar289 < sVar18) * uVar289 | (ushort)((short)uVar289 >= sVar18) * sVar18) +
           auVar269._0_2_;
      auVar460._2_2_ =
           (((short)uVar293 < sVar19) * uVar293 | (ushort)((short)uVar293 >= sVar19) * sVar19) +
           auVar269._2_2_;
      auVar460._4_2_ =
           (((short)uVar297 < sVar35) * uVar297 | (ushort)((short)uVar297 >= sVar35) * sVar35) +
           auVar269._4_2_;
      auVar460._6_2_ =
           (((short)uVar302 < sVar33) * uVar302 | (ushort)((short)uVar302 >= sVar33) * sVar33) +
           auVar269._6_2_;
      auVar460._8_2_ =
           (((short)uVar307 < sVar36) * uVar307 | (ushort)((short)uVar307 >= sVar36) * sVar36) +
           auVar269._8_2_;
      auVar460._10_2_ =
           (((short)uVar196 < sVar39) * uVar196 | (ushort)((short)uVar196 >= sVar39) * sVar39) +
           auVar269._10_2_;
      auVar460._12_2_ =
           (((short)uVar206 < sVar41) * uVar206 | (ushort)((short)uVar206 >= sVar41) * sVar41) +
           auVar269._12_2_;
      auVar460._14_2_ =
           (((short)uVar216 < sVar43) * uVar216 | (ushort)((short)uVar216 >= sVar43) * sVar43) +
           auVar269._14_2_;
      auVar460 = auVar460 ^ auVar269;
      auVar227 = lddqu(auVar54,*(undefined1 (*) [16])((long)in + lVar14 * -2));
      sVar129 = auVar227._0_2_;
      auVar143._0_2_ = sVar129 - sVar76;
      sVar162 = auVar227._2_2_;
      auVar143._2_2_ = sVar162 - sVar96;
      sVar171 = auVar227._4_2_;
      auVar143._4_2_ = sVar171 - sVar97;
      sVar180 = auVar227._6_2_;
      auVar143._6_2_ = sVar180 - sVar98;
      sVar189 = auVar227._8_2_;
      auVar143._8_2_ = sVar189 - sVar103;
      sVar199 = auVar227._10_2_;
      auVar143._10_2_ = sVar199 - sVar108;
      sVar209 = auVar227._12_2_;
      sVar219 = auVar227._14_2_;
      auVar143._12_2_ = sVar209 - sVar113;
      auVar143._14_2_ = sVar219 - sVar121;
      auVar54 = pabsw(auVar134,auVar143);
      uVar37 = auVar54._0_2_;
      auVar495._0_2_ = uVar37 >> uVar525;
      uVar42 = auVar54._2_2_;
      auVar495._2_2_ = uVar42 >> uVar525;
      uVar47 = auVar54._4_2_;
      auVar495._4_2_ = uVar47 >> uVar525;
      uVar177 = auVar54._6_2_;
      auVar495._6_2_ = uVar177 >> uVar525;
      uVar205 = auVar54._8_2_;
      auVar495._8_2_ = uVar205 >> uVar525;
      uVar49 = auVar54._10_2_;
      auVar495._10_2_ = uVar49 >> uVar525;
      uVar53 = auVar54._12_2_;
      uVar285 = auVar54._14_2_;
      auVar495._12_2_ = uVar53 >> uVar525;
      auVar495._14_2_ = uVar285 >> uVar525;
      auVar54 = psubusw(local_158,auVar495);
      auVar537 = lddqu(auVar536,*(undefined1 (*) [16])((long)in + lVar14 * -2 + 0x120));
      sVar534 = auVar537._0_2_;
      auVar538._0_2_ = sVar534 - sVar454;
      sVar541 = auVar537._2_2_;
      auVar538._2_2_ = sVar541 - sVar474;
      sVar542 = auVar537._4_2_;
      auVar538._4_2_ = sVar542 - sVar477;
      sVar543 = auVar537._6_2_;
      auVar538._6_2_ = sVar543 - sVar480;
      sVar544 = auVar537._8_2_;
      auVar538._8_2_ = sVar544 - sVar482;
      sVar546 = auVar537._10_2_;
      auVar538._10_2_ = sVar546 - sVar485;
      sVar548 = auVar537._12_2_;
      sVar550 = auVar537._14_2_;
      auVar538._12_2_ = sVar548 - sVar487;
      auVar538._14_2_ = sVar550 - sVar490;
      auVar29 = pabsw(auVar29,auVar538);
      uVar289 = auVar29._0_2_;
      auVar553._0_2_ = uVar289 >> uVar525;
      uVar293 = auVar29._2_2_;
      auVar553._2_2_ = uVar293 >> uVar525;
      uVar297 = auVar29._4_2_;
      auVar553._4_2_ = uVar297 >> uVar525;
      uVar302 = auVar29._6_2_;
      auVar553._6_2_ = uVar302 >> uVar525;
      uVar307 = auVar29._8_2_;
      auVar553._8_2_ = uVar307 >> uVar525;
      uVar196 = auVar29._10_2_;
      auVar553._10_2_ = uVar196 >> uVar525;
      uVar206 = auVar29._12_2_;
      uVar216 = auVar29._14_2_;
      auVar553._12_2_ = uVar206 >> uVar525;
      auVar553._14_2_ = uVar216 >> uVar525;
      auVar29 = psubusw(local_158,auVar553);
      sVar18 = auVar54._0_2_;
      sVar19 = auVar54._2_2_;
      sVar35 = auVar54._4_2_;
      sVar33 = auVar54._6_2_;
      sVar36 = auVar54._8_2_;
      sVar39 = auVar54._10_2_;
      sVar41 = auVar54._12_2_;
      sVar43 = auVar54._14_2_;
      sVar46 = auVar29._0_2_;
      sVar50 = auVar29._2_2_;
      sVar63 = auVar29._4_2_;
      sVar62 = auVar29._6_2_;
      sVar65 = auVar29._8_2_;
      sVar64 = auVar29._10_2_;
      sVar67 = auVar29._12_2_;
      sVar66 = auVar29._14_2_;
      auVar29 = psraw(auVar143,0xf);
      auVar364._0_2_ =
           (((short)uVar37 < sVar18) * uVar37 | (ushort)((short)uVar37 >= sVar18) * sVar18) +
           auVar29._0_2_;
      auVar364._2_2_ =
           (((short)uVar42 < sVar19) * uVar42 | (ushort)((short)uVar42 >= sVar19) * sVar19) +
           auVar29._2_2_;
      auVar364._4_2_ =
           (((short)uVar47 < sVar35) * uVar47 | (ushort)((short)uVar47 >= sVar35) * sVar35) +
           auVar29._4_2_;
      auVar364._6_2_ =
           (((short)uVar177 < sVar33) * uVar177 | (ushort)((short)uVar177 >= sVar33) * sVar33) +
           auVar29._6_2_;
      auVar364._8_2_ =
           (((short)uVar205 < sVar36) * uVar205 | (ushort)((short)uVar205 >= sVar36) * sVar36) +
           auVar29._8_2_;
      auVar364._10_2_ =
           (((short)uVar49 < sVar39) * uVar49 | (ushort)((short)uVar49 >= sVar39) * sVar39) +
           auVar29._10_2_;
      auVar364._12_2_ =
           (((short)uVar53 < sVar41) * uVar53 | (ushort)((short)uVar53 >= sVar41) * sVar41) +
           auVar29._12_2_;
      auVar364._14_2_ =
           (((short)uVar285 < sVar43) * uVar285 | (ushort)((short)uVar285 >= sVar43) * sVar43) +
           auVar29._14_2_;
      auVar364 = auVar364 ^ auVar29;
      auVar54 = psraw(auVar538,0xf);
      auVar496._0_2_ =
           (((short)uVar289 < sVar46) * uVar289 | (ushort)((short)uVar289 >= sVar46) * sVar46) +
           auVar54._0_2_;
      auVar496._2_2_ =
           (((short)uVar293 < sVar50) * uVar293 | (ushort)((short)uVar293 >= sVar50) * sVar50) +
           auVar54._2_2_;
      auVar496._4_2_ =
           (((short)uVar297 < sVar63) * uVar297 | (ushort)((short)uVar297 >= sVar63) * sVar63) +
           auVar54._4_2_;
      auVar496._6_2_ =
           (((short)uVar302 < sVar62) * uVar302 | (ushort)((short)uVar302 >= sVar62) * sVar62) +
           auVar54._6_2_;
      auVar496._8_2_ =
           (((short)uVar307 < sVar65) * uVar307 | (ushort)((short)uVar307 >= sVar65) * sVar65) +
           auVar54._8_2_;
      auVar496._10_2_ =
           (((short)uVar196 < sVar64) * uVar196 | (ushort)((short)uVar196 >= sVar64) * sVar64) +
           auVar54._10_2_;
      auVar496._12_2_ =
           (((short)uVar206 < sVar67) * uVar206 | (ushort)((short)uVar206 >= sVar67) * sVar67) +
           auVar54._12_2_;
      auVar496._14_2_ =
           (((short)uVar216 < sVar66) * uVar216 | (ushort)((short)uVar216 >= sVar66) * sVar66) +
           auVar54._14_2_;
      auVar496 = auVar496 ^ auVar54;
      local_178 = auVar23._0_2_;
      sStack_176 = auVar23._2_2_;
      auVar54 = lddqu(auVar81,*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar11 * 2));
      sVar68 = auVar54._0_2_;
      auVar82._0_2_ = sVar68 - sVar76;
      sVar70 = auVar54._2_2_;
      auVar82._2_2_ = sVar70 - sVar96;
      sVar72 = auVar54._4_2_;
      auVar82._4_2_ = sVar72 - sVar97;
      sVar74 = auVar54._6_2_;
      auVar82._6_2_ = sVar74 - sVar98;
      sVar100 = auVar54._8_2_;
      auVar82._8_2_ = sVar100 - sVar103;
      sVar105 = auVar54._10_2_;
      auVar82._10_2_ = sVar105 - sVar108;
      sVar110 = auVar54._12_2_;
      sVar118 = auVar54._14_2_;
      auVar82._12_2_ = sVar110 - sVar113;
      auVar82._14_2_ = sVar118 - sVar121;
      auVar389 = lddqu(auVar29,*(undefined1 (*) [16])
                                (*(undefined1 (*) [16])((long)in + 0x120) + lVar11 * 2));
      sVar130 = auVar389._0_2_;
      auVar144._0_2_ = sVar130 - sVar454;
      sVar163 = auVar389._2_2_;
      auVar144._2_2_ = sVar163 - sVar474;
      sVar172 = auVar389._4_2_;
      auVar144._4_2_ = sVar172 - sVar477;
      sVar181 = auVar389._6_2_;
      auVar144._6_2_ = sVar181 - sVar480;
      sVar190 = auVar389._8_2_;
      auVar144._8_2_ = sVar190 - sVar482;
      sVar200 = auVar389._10_2_;
      auVar144._10_2_ = sVar200 - sVar485;
      sVar210 = auVar389._12_2_;
      sVar220 = auVar389._14_2_;
      auVar144._12_2_ = sVar210 - sVar487;
      auVar144._14_2_ = sVar220 - sVar490;
      auVar29 = pabsw(auVar320,auVar82);
      uVar37 = auVar29._0_2_;
      auVar30._0_2_ = uVar37 >> uVar525;
      uVar42 = auVar29._2_2_;
      auVar30._2_2_ = uVar42 >> uVar525;
      uVar47 = auVar29._4_2_;
      auVar30._4_2_ = uVar47 >> uVar525;
      uVar177 = auVar29._6_2_;
      auVar30._6_2_ = uVar177 >> uVar525;
      uVar205 = auVar29._8_2_;
      auVar30._8_2_ = uVar205 >> uVar525;
      uVar49 = auVar29._10_2_;
      auVar30._10_2_ = uVar49 >> uVar525;
      uVar53 = auVar29._12_2_;
      uVar285 = auVar29._14_2_;
      auVar30._12_2_ = uVar53 >> uVar525;
      auVar30._14_2_ = uVar285 >> uVar525;
      auVar134 = pabsw(auVar391,auVar144);
      uVar289 = auVar134._0_2_;
      auVar461._0_2_ = uVar289 >> uVar525;
      uVar293 = auVar134._2_2_;
      auVar461._2_2_ = uVar293 >> uVar525;
      uVar297 = auVar134._4_2_;
      auVar461._4_2_ = uVar297 >> uVar525;
      uVar302 = auVar134._6_2_;
      auVar461._6_2_ = uVar302 >> uVar525;
      uVar307 = auVar134._8_2_;
      auVar461._8_2_ = uVar307 >> uVar525;
      uVar196 = auVar134._10_2_;
      auVar461._10_2_ = uVar196 >> uVar525;
      uVar206 = auVar134._12_2_;
      uVar216 = auVar134._14_2_;
      auVar461._12_2_ = uVar206 >> uVar525;
      auVar461._14_2_ = uVar216 >> uVar525;
      auVar269 = psubusw(local_158,auVar30);
      auVar29 = psubusw(local_158,auVar461);
      sVar46 = auVar269._0_2_;
      sVar50 = auVar269._2_2_;
      sVar63 = auVar269._4_2_;
      sVar62 = auVar269._6_2_;
      sVar65 = auVar269._8_2_;
      sVar64 = auVar269._10_2_;
      sVar67 = auVar269._12_2_;
      sVar66 = auVar269._14_2_;
      sVar18 = auVar29._0_2_;
      sVar19 = auVar29._2_2_;
      sVar35 = auVar29._4_2_;
      sVar33 = auVar29._6_2_;
      sVar36 = auVar29._8_2_;
      sVar39 = auVar29._10_2_;
      sVar41 = auVar29._12_2_;
      sVar43 = auVar29._14_2_;
      auVar29 = psraw(auVar82,0xf);
      auVar59._0_2_ =
           (((short)uVar37 < sVar46) * uVar37 | (ushort)((short)uVar37 >= sVar46) * sVar46) +
           auVar29._0_2_;
      auVar59._2_2_ =
           (((short)uVar42 < sVar50) * uVar42 | (ushort)((short)uVar42 >= sVar50) * sVar50) +
           auVar29._2_2_;
      auVar59._4_2_ =
           (((short)uVar47 < sVar63) * uVar47 | (ushort)((short)uVar47 >= sVar63) * sVar63) +
           auVar29._4_2_;
      auVar59._6_2_ =
           (((short)uVar177 < sVar62) * uVar177 | (ushort)((short)uVar177 >= sVar62) * sVar62) +
           auVar29._6_2_;
      auVar59._8_2_ =
           (((short)uVar205 < sVar65) * uVar205 | (ushort)((short)uVar205 >= sVar65) * sVar65) +
           auVar29._8_2_;
      auVar59._10_2_ =
           (((short)uVar49 < sVar64) * uVar49 | (ushort)((short)uVar49 >= sVar64) * sVar64) +
           auVar29._10_2_;
      auVar59._12_2_ =
           (((short)uVar53 < sVar67) * uVar53 | (ushort)((short)uVar53 >= sVar67) * sVar67) +
           auVar29._12_2_;
      auVar59._14_2_ =
           (((short)uVar285 < sVar66) * uVar285 | (ushort)((short)uVar285 >= sVar66) * sVar66) +
           auVar29._14_2_;
      auVar59 = auVar59 ^ auVar29;
      auVar269 = psraw(auVar144,0xf);
      auVar31._0_2_ =
           (((short)uVar289 < sVar18) * uVar289 | (ushort)((short)uVar289 >= sVar18) * sVar18) +
           auVar269._0_2_;
      auVar31._2_2_ =
           (((short)uVar293 < sVar19) * uVar293 | (ushort)((short)uVar293 >= sVar19) * sVar19) +
           auVar269._2_2_;
      auVar31._4_2_ =
           (((short)uVar297 < sVar35) * uVar297 | (ushort)((short)uVar297 >= sVar35) * sVar35) +
           auVar269._4_2_;
      auVar31._6_2_ =
           (((short)uVar302 < sVar33) * uVar302 | (ushort)((short)uVar302 >= sVar33) * sVar33) +
           auVar269._6_2_;
      auVar31._8_2_ =
           (((short)uVar307 < sVar36) * uVar307 | (ushort)((short)uVar307 >= sVar36) * sVar36) +
           auVar269._8_2_;
      auVar31._10_2_ =
           (((short)uVar196 < sVar39) * uVar196 | (ushort)((short)uVar196 >= sVar39) * sVar39) +
           auVar269._10_2_;
      auVar31._12_2_ =
           (((short)uVar206 < sVar41) * uVar206 | (ushort)((short)uVar206 >= sVar41) * sVar41) +
           auVar269._12_2_;
      auVar31._14_2_ =
           (((short)uVar216 < sVar43) * uVar216 | (ushort)((short)uVar216 >= sVar43) * sVar43) +
           auVar269._14_2_;
      auVar31 = auVar31 ^ auVar269;
      auVar83 = lddqu(auVar29,*(undefined1 (*) [16])((long)in + lVar11 * -2));
      sVar63 = auVar83._0_2_;
      auVar84._0_2_ = sVar63 - sVar76;
      sVar62 = auVar83._2_2_;
      auVar84._2_2_ = sVar62 - sVar96;
      sVar65 = auVar83._4_2_;
      auVar84._4_2_ = sVar65 - sVar97;
      sVar67 = auVar83._6_2_;
      auVar84._6_2_ = sVar67 - sVar98;
      sVar101 = auVar83._8_2_;
      auVar84._8_2_ = sVar101 - sVar103;
      sVar106 = auVar83._10_2_;
      auVar84._10_2_ = sVar106 - sVar108;
      sVar111 = auVar83._12_2_;
      sVar119 = auVar83._14_2_;
      auVar84._12_2_ = sVar111 - sVar113;
      auVar84._14_2_ = sVar119 - sVar121;
      auVar29 = pabsw(auVar269,auVar84);
      uVar37 = auVar29._0_2_;
      auVar321._0_2_ = uVar37 >> uVar525;
      uVar42 = auVar29._2_2_;
      auVar321._2_2_ = uVar42 >> uVar525;
      uVar47 = auVar29._4_2_;
      auVar321._4_2_ = uVar47 >> uVar525;
      uVar177 = auVar29._6_2_;
      auVar321._6_2_ = uVar177 >> uVar525;
      uVar205 = auVar29._8_2_;
      auVar321._8_2_ = uVar205 >> uVar525;
      uVar49 = auVar29._10_2_;
      auVar321._10_2_ = uVar49 >> uVar525;
      uVar53 = auVar29._12_2_;
      uVar285 = auVar29._14_2_;
      auVar321._12_2_ = uVar53 >> uVar525;
      auVar321._14_2_ = uVar285 >> uVar525;
      auVar269 = psubusw(local_158,auVar321);
      auVar29 = lddqu(auVar321,*(undefined1 (*) [16])((long)in + lVar11 * -2 + 0x120));
      sVar312 = auVar29._0_2_;
      auVar322._0_2_ = sVar312 - sVar454;
      sVar331 = auVar29._2_2_;
      auVar322._2_2_ = sVar331 - sVar474;
      sVar334 = auVar29._4_2_;
      auVar322._4_2_ = sVar334 - sVar477;
      sVar337 = auVar29._6_2_;
      auVar322._6_2_ = sVar337 - sVar480;
      sVar341 = auVar29._8_2_;
      auVar322._8_2_ = sVar341 - sVar482;
      sVar344 = auVar29._10_2_;
      auVar322._10_2_ = sVar344 - sVar485;
      sVar348 = auVar29._12_2_;
      sVar352 = auVar29._14_2_;
      auVar322._12_2_ = sVar348 - sVar487;
      auVar322._14_2_ = sVar352 - sVar490;
      auVar392 = pabsw(auVar134,auVar322);
      uVar289 = auVar392._0_2_;
      auVar462._0_2_ = uVar289 >> uVar525;
      uVar293 = auVar392._2_2_;
      auVar462._2_2_ = uVar293 >> uVar525;
      uVar297 = auVar392._4_2_;
      auVar462._4_2_ = uVar297 >> uVar525;
      uVar302 = auVar392._6_2_;
      auVar462._6_2_ = uVar302 >> uVar525;
      uVar307 = auVar392._8_2_;
      auVar462._8_2_ = uVar307 >> uVar525;
      uVar196 = auVar392._10_2_;
      auVar462._10_2_ = uVar196 >> uVar525;
      uVar206 = auVar392._12_2_;
      uVar216 = auVar392._14_2_;
      auVar462._12_2_ = uVar206 >> uVar525;
      auVar462._14_2_ = uVar216 >> uVar525;
      auVar134 = psubusw(local_158,auVar462);
      sVar18 = auVar269._0_2_;
      sVar19 = auVar269._2_2_;
      sVar35 = auVar269._4_2_;
      sVar33 = auVar269._6_2_;
      sVar36 = auVar269._8_2_;
      sVar39 = auVar269._10_2_;
      sVar41 = auVar269._12_2_;
      sVar43 = auVar269._14_2_;
      sVar46 = auVar134._0_2_;
      sVar50 = auVar134._2_2_;
      sVar64 = auVar134._4_2_;
      sVar66 = auVar134._6_2_;
      sVar102 = auVar134._8_2_;
      sVar107 = auVar134._10_2_;
      sVar112 = auVar134._12_2_;
      sVar120 = auVar134._14_2_;
      auVar134 = psraw(auVar84,0xf);
      auVar515._0_2_ =
           (((short)uVar37 < sVar18) * uVar37 | (ushort)((short)uVar37 >= sVar18) * sVar18) +
           auVar134._0_2_;
      auVar515._2_2_ =
           (((short)uVar42 < sVar19) * uVar42 | (ushort)((short)uVar42 >= sVar19) * sVar19) +
           auVar134._2_2_;
      auVar515._4_2_ =
           (((short)uVar47 < sVar35) * uVar47 | (ushort)((short)uVar47 >= sVar35) * sVar35) +
           auVar134._4_2_;
      auVar515._6_2_ =
           (((short)uVar177 < sVar33) * uVar177 | (ushort)((short)uVar177 >= sVar33) * sVar33) +
           auVar134._6_2_;
      auVar515._8_2_ =
           (((short)uVar205 < sVar36) * uVar205 | (ushort)((short)uVar205 >= sVar36) * sVar36) +
           auVar134._8_2_;
      auVar515._10_2_ =
           (((short)uVar49 < sVar39) * uVar49 | (ushort)((short)uVar49 >= sVar39) * sVar39) +
           auVar134._10_2_;
      auVar515._12_2_ =
           (((short)uVar53 < sVar41) * uVar53 | (ushort)((short)uVar53 >= sVar41) * sVar41) +
           auVar134._12_2_;
      auVar515._14_2_ =
           (((short)uVar285 < sVar43) * uVar285 | (ushort)((short)uVar285 >= sVar43) * sVar43) +
           auVar134._14_2_;
      auVar515 = auVar515 ^ auVar134;
      auVar323 = psraw(auVar322,0xf);
      auVar539._0_2_ =
           (((short)uVar289 < sVar46) * uVar289 | (ushort)((short)uVar289 >= sVar46) * sVar46) +
           auVar323._0_2_;
      auVar539._2_2_ =
           (((short)uVar293 < sVar50) * uVar293 | (ushort)((short)uVar293 >= sVar50) * sVar50) +
           auVar323._2_2_;
      auVar539._4_2_ =
           (((short)uVar297 < sVar64) * uVar297 | (ushort)((short)uVar297 >= sVar64) * sVar64) +
           auVar323._4_2_;
      auVar539._6_2_ =
           (((short)uVar302 < sVar66) * uVar302 | (ushort)((short)uVar302 >= sVar66) * sVar66) +
           auVar323._6_2_;
      auVar539._8_2_ =
           (((short)uVar307 < sVar102) * uVar307 | (ushort)((short)uVar307 >= sVar102) * sVar102) +
           auVar323._8_2_;
      auVar539._10_2_ =
           (((short)uVar196 < sVar107) * uVar196 | (ushort)((short)uVar196 >= sVar107) * sVar107) +
           auVar323._10_2_;
      auVar539._12_2_ =
           (((short)uVar206 < sVar112) * uVar206 | (ushort)((short)uVar206 >= sVar112) * sVar112) +
           auVar323._12_2_;
      auVar539._14_2_ =
           (((short)uVar216 < sVar120) * uVar216 | (ushort)((short)uVar216 >= sVar120) * sVar120) +
           auVar323._14_2_;
      auVar539 = auVar539 ^ auVar323;
      auVar269 = lddqu(auVar59,*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar12 * 2));
      sVar35 = auVar269._0_2_;
      auVar60._0_2_ = sVar35 - sVar76;
      sVar33 = auVar269._2_2_;
      auVar60._2_2_ = sVar33 - sVar96;
      sVar36 = auVar269._4_2_;
      auVar60._4_2_ = sVar36 - sVar97;
      sVar39 = auVar269._6_2_;
      auVar60._6_2_ = sVar39 - sVar98;
      sVar41 = auVar269._8_2_;
      auVar60._8_2_ = sVar41 - sVar103;
      sVar43 = auVar269._10_2_;
      auVar60._10_2_ = sVar43 - sVar108;
      sVar46 = auVar269._12_2_;
      sVar50 = auVar269._14_2_;
      auVar60._12_2_ = sVar46 - sVar113;
      auVar60._14_2_ = sVar50 - sVar121;
      auVar134 = pabsw(auVar134,auVar60);
      uVar37 = auVar134._0_2_;
      auVar145._0_2_ = uVar37 >> uVar525;
      uVar42 = auVar134._2_2_;
      auVar145._2_2_ = uVar42 >> uVar525;
      uVar47 = auVar134._4_2_;
      auVar145._4_2_ = uVar47 >> uVar525;
      uVar177 = auVar134._6_2_;
      auVar145._6_2_ = uVar177 >> uVar525;
      uVar205 = auVar134._8_2_;
      auVar145._8_2_ = uVar205 >> uVar525;
      uVar49 = auVar134._10_2_;
      auVar145._10_2_ = uVar49 >> uVar525;
      uVar53 = auVar134._12_2_;
      uVar285 = auVar134._14_2_;
      auVar145._12_2_ = uVar53 >> uVar525;
      auVar145._14_2_ = uVar285 >> uVar525;
      auVar554 = psubusw(local_158,auVar145);
      auVar324 = lddqu(auVar323,*(undefined1 (*) [16])
                                 (*(undefined1 (*) [16])((long)in + 0x120) + lVar12 * 2));
      sVar131 = auVar324._0_2_;
      auVar146._0_2_ = sVar131 - sVar454;
      sVar164 = auVar324._2_2_;
      auVar146._2_2_ = sVar164 - sVar474;
      sVar173 = auVar324._4_2_;
      auVar146._4_2_ = sVar173 - sVar477;
      sVar182 = auVar324._6_2_;
      auVar146._6_2_ = sVar182 - sVar480;
      sVar191 = auVar324._8_2_;
      auVar146._8_2_ = sVar191 - sVar482;
      sVar201 = auVar324._10_2_;
      auVar146._10_2_ = sVar201 - sVar485;
      sVar211 = auVar324._12_2_;
      sVar221 = auVar324._14_2_;
      auVar146._12_2_ = sVar211 - sVar487;
      auVar146._14_2_ = sVar221 - sVar490;
      auVar323 = pabsw(auVar392,auVar146);
      uVar289 = auVar323._0_2_;
      auVar463._0_2_ = uVar289 >> uVar525;
      uVar293 = auVar323._2_2_;
      auVar463._2_2_ = uVar293 >> uVar525;
      uVar297 = auVar323._4_2_;
      auVar463._4_2_ = uVar297 >> uVar525;
      uVar302 = auVar323._6_2_;
      auVar463._6_2_ = uVar302 >> uVar525;
      uVar307 = auVar323._8_2_;
      auVar463._8_2_ = uVar307 >> uVar525;
      uVar196 = auVar323._10_2_;
      auVar463._10_2_ = uVar196 >> uVar525;
      uVar206 = auVar323._12_2_;
      uVar216 = auVar323._14_2_;
      auVar463._12_2_ = uVar206 >> uVar525;
      auVar463._14_2_ = uVar216 >> uVar525;
      auVar134 = psubusw(local_158,auVar463);
      sVar132 = auVar554._0_2_;
      sVar165 = auVar554._2_2_;
      sVar174 = auVar554._4_2_;
      sVar183 = auVar554._6_2_;
      sVar192 = auVar554._8_2_;
      sVar202 = auVar554._10_2_;
      sVar212 = auVar554._12_2_;
      sVar222 = auVar554._14_2_;
      sVar18 = auVar134._0_2_;
      sVar19 = auVar134._2_2_;
      sVar64 = auVar134._4_2_;
      sVar66 = auVar134._6_2_;
      sVar102 = auVar134._8_2_;
      sVar107 = auVar134._10_2_;
      sVar112 = auVar134._12_2_;
      sVar120 = auVar134._14_2_;
      auVar134 = psraw(auVar60,0xf);
      auVar555._0_2_ =
           (((short)uVar37 < sVar132) * uVar37 | (ushort)((short)uVar37 >= sVar132) * sVar132) +
           auVar134._0_2_;
      auVar555._2_2_ =
           (((short)uVar42 < sVar165) * uVar42 | (ushort)((short)uVar42 >= sVar165) * sVar165) +
           auVar134._2_2_;
      auVar555._4_2_ =
           (((short)uVar47 < sVar174) * uVar47 | (ushort)((short)uVar47 >= sVar174) * sVar174) +
           auVar134._4_2_;
      auVar555._6_2_ =
           (((short)uVar177 < sVar183) * uVar177 | (ushort)((short)uVar177 >= sVar183) * sVar183) +
           auVar134._6_2_;
      auVar555._8_2_ =
           (((short)uVar205 < sVar192) * uVar205 | (ushort)((short)uVar205 >= sVar192) * sVar192) +
           auVar134._8_2_;
      auVar555._10_2_ =
           (((short)uVar49 < sVar202) * uVar49 | (ushort)((short)uVar49 >= sVar202) * sVar202) +
           auVar134._10_2_;
      auVar555._12_2_ =
           (((short)uVar53 < sVar212) * uVar53 | (ushort)((short)uVar53 >= sVar212) * sVar212) +
           auVar134._12_2_;
      auVar555._14_2_ =
           (((short)uVar285 < sVar222) * uVar285 | (ushort)((short)uVar285 >= sVar222) * sVar222) +
           auVar134._14_2_;
      auVar555 = auVar555 ^ auVar134;
      auVar392 = psraw(auVar146,0xf);
      auVar526._0_2_ =
           (((short)uVar289 < sVar18) * uVar289 | (ushort)((short)uVar289 >= sVar18) * sVar18) +
           auVar392._0_2_;
      auVar526._2_2_ =
           (((short)uVar293 < sVar19) * uVar293 | (ushort)((short)uVar293 >= sVar19) * sVar19) +
           auVar392._2_2_;
      auVar526._4_2_ =
           (((short)uVar297 < sVar64) * uVar297 | (ushort)((short)uVar297 >= sVar64) * sVar64) +
           auVar392._4_2_;
      auVar526._6_2_ =
           (((short)uVar302 < sVar66) * uVar302 | (ushort)((short)uVar302 >= sVar66) * sVar66) +
           auVar392._6_2_;
      auVar526._8_2_ =
           (((short)uVar307 < sVar102) * uVar307 | (ushort)((short)uVar307 >= sVar102) * sVar102) +
           auVar392._8_2_;
      auVar526._10_2_ =
           (((short)uVar196 < sVar107) * uVar196 | (ushort)((short)uVar196 >= sVar107) * sVar107) +
           auVar392._10_2_;
      auVar526._12_2_ =
           (((short)uVar206 < sVar112) * uVar206 | (ushort)((short)uVar206 >= sVar112) * sVar112) +
           auVar392._12_2_;
      auVar526._14_2_ =
           (((short)uVar216 < sVar120) * uVar216 | (ushort)((short)uVar216 >= sVar120) * sVar120) +
           auVar392._14_2_;
      auVar526 = auVar526 ^ auVar392;
      auVar323 = lddqu(auVar323,*(undefined1 (*) [16])((long)in + lVar12 * -2));
      sVar384 = auVar323._0_2_;
      auVar393._0_2_ = sVar384 - sVar76;
      sVar400 = auVar323._2_2_;
      auVar393._2_2_ = sVar400 - sVar96;
      sVar405 = auVar323._4_2_;
      auVar393._4_2_ = sVar405 - sVar97;
      sVar409 = auVar323._6_2_;
      auVar393._6_2_ = sVar409 - sVar98;
      sVar413 = auVar323._8_2_;
      auVar393._8_2_ = sVar413 - sVar103;
      sVar418 = auVar323._10_2_;
      auVar393._10_2_ = sVar418 - sVar108;
      sVar423 = auVar323._12_2_;
      sVar428 = auVar323._14_2_;
      auVar393._12_2_ = sVar423 - sVar113;
      auVar393._14_2_ = sVar428 - sVar121;
      auVar392 = lddqu(auVar392,*(undefined1 (*) [16])((long)in + lVar12 * -2 + 0x120));
      sVar132 = auVar392._0_2_;
      auVar147._0_2_ = sVar132 - sVar454;
      sVar165 = auVar392._2_2_;
      auVar147._2_2_ = sVar165 - sVar474;
      sVar174 = auVar392._4_2_;
      auVar147._4_2_ = sVar174 - sVar477;
      sVar183 = auVar392._6_2_;
      auVar147._6_2_ = sVar183 - sVar480;
      sVar192 = auVar392._8_2_;
      auVar147._8_2_ = sVar192 - sVar482;
      sVar202 = auVar392._10_2_;
      auVar147._10_2_ = sVar202 - sVar485;
      sVar212 = auVar392._12_2_;
      sVar222 = auVar392._14_2_;
      auVar147._12_2_ = sVar212 - sVar487;
      auVar147._14_2_ = sVar222 - sVar490;
      auVar229 = pabsw(auVar229,auVar393);
      uVar289 = auVar229._0_2_;
      auVar464._0_2_ = uVar289 >> uVar525;
      uVar293 = auVar229._2_2_;
      auVar464._2_2_ = uVar293 >> uVar525;
      uVar297 = auVar229._4_2_;
      auVar464._4_2_ = uVar297 >> uVar525;
      uVar302 = auVar229._6_2_;
      auVar464._6_2_ = uVar302 >> uVar525;
      uVar307 = auVar229._8_2_;
      auVar464._8_2_ = uVar307 >> uVar525;
      uVar196 = auVar229._10_2_;
      auVar464._10_2_ = uVar196 >> uVar525;
      uVar206 = auVar229._12_2_;
      uVar216 = auVar229._14_2_;
      auVar464._12_2_ = uVar206 >> uVar525;
      auVar464._14_2_ = uVar216 >> uVar525;
      auVar229 = pabsw(auVar134,auVar147);
      uVar37 = auVar229._0_2_;
      auVar32._0_2_ = uVar37 >> uVar525;
      uVar42 = auVar229._2_2_;
      auVar32._2_2_ = uVar42 >> uVar525;
      uVar47 = auVar229._4_2_;
      auVar32._4_2_ = uVar47 >> uVar525;
      uVar177 = auVar229._6_2_;
      auVar32._6_2_ = uVar177 >> uVar525;
      uVar205 = auVar229._8_2_;
      auVar32._8_2_ = uVar205 >> uVar525;
      uVar49 = auVar229._10_2_;
      auVar32._10_2_ = uVar49 >> uVar525;
      uVar53 = auVar229._12_2_;
      uVar285 = auVar229._14_2_;
      auVar32._12_2_ = uVar53 >> uVar525;
      auVar32._14_2_ = uVar285 >> uVar525;
      auVar229 = psubusw(local_158,auVar464);
      auVar134 = psubusw(local_158,auVar32);
      sVar18 = auVar229._0_2_;
      sVar19 = auVar229._2_2_;
      sVar64 = auVar229._4_2_;
      sVar66 = auVar229._6_2_;
      sVar102 = auVar229._8_2_;
      sVar107 = auVar229._10_2_;
      sVar112 = auVar229._12_2_;
      sVar120 = auVar229._14_2_;
      sVar453 = auVar134._0_2_;
      sVar473 = auVar134._2_2_;
      sVar476 = auVar134._4_2_;
      sVar479 = auVar134._6_2_;
      sVar481 = auVar134._8_2_;
      sVar484 = auVar134._10_2_;
      sVar486 = auVar134._12_2_;
      sVar489 = auVar134._14_2_;
      auVar229 = psraw(auVar393,0xf);
      auVar85._0_2_ =
           (((short)uVar289 < sVar18) * uVar289 | (ushort)((short)uVar289 >= sVar18) * sVar18) +
           auVar229._0_2_;
      auVar85._2_2_ =
           (((short)uVar293 < sVar19) * uVar293 | (ushort)((short)uVar293 >= sVar19) * sVar19) +
           auVar229._2_2_;
      auVar85._4_2_ =
           (((short)uVar297 < sVar64) * uVar297 | (ushort)((short)uVar297 >= sVar64) * sVar64) +
           auVar229._4_2_;
      auVar85._6_2_ =
           (((short)uVar302 < sVar66) * uVar302 | (ushort)((short)uVar302 >= sVar66) * sVar66) +
           auVar229._6_2_;
      auVar85._8_2_ =
           (((short)uVar307 < sVar102) * uVar307 | (ushort)((short)uVar307 >= sVar102) * sVar102) +
           auVar229._8_2_;
      auVar85._10_2_ =
           (((short)uVar196 < sVar107) * uVar196 | (ushort)((short)uVar196 >= sVar107) * sVar107) +
           auVar229._10_2_;
      auVar85._12_2_ =
           (((short)uVar206 < sVar112) * uVar206 | (ushort)((short)uVar206 >= sVar112) * sVar112) +
           auVar229._12_2_;
      auVar85._14_2_ =
           (((short)uVar216 < sVar120) * uVar216 | (ushort)((short)uVar216 >= sVar120) * sVar120) +
           auVar229._14_2_;
      auVar85 = auVar85 ^ auVar229;
      auVar229 = psraw(auVar147,0xf);
      auVar465._0_2_ =
           (((short)uVar37 < sVar453) * uVar37 | (ushort)((short)uVar37 >= sVar453) * sVar453) +
           auVar229._0_2_;
      auVar465._2_2_ =
           (((short)uVar42 < sVar473) * uVar42 | (ushort)((short)uVar42 >= sVar473) * sVar473) +
           auVar229._2_2_;
      auVar465._4_2_ =
           (((short)uVar47 < sVar476) * uVar47 | (ushort)((short)uVar47 >= sVar476) * sVar476) +
           auVar229._4_2_;
      auVar465._6_2_ =
           (((short)uVar177 < sVar479) * uVar177 | (ushort)((short)uVar177 >= sVar479) * sVar479) +
           auVar229._6_2_;
      auVar465._8_2_ =
           (((short)uVar205 < sVar481) * uVar205 | (ushort)((short)uVar205 >= sVar481) * sVar481) +
           auVar229._8_2_;
      auVar465._10_2_ =
           (((short)uVar49 < sVar484) * uVar49 | (ushort)((short)uVar49 >= sVar484) * sVar484) +
           auVar229._10_2_;
      auVar465._12_2_ =
           (((short)uVar53 < sVar486) * uVar53 | (ushort)((short)uVar53 >= sVar486) * sVar486) +
           auVar229._12_2_;
      auVar465._14_2_ =
           (((short)uVar285 < sVar489) * uVar285 | (ushort)((short)uVar285 >= sVar489) * sVar489) +
           auVar229._14_2_;
      auVar465 = auVar465 ^ auVar229;
      local_188 = auVar24._0_2_;
      sStack_186 = auVar24._2_2_;
      auVar86._0_2_ =
           (auVar85._0_2_ + auVar555._0_2_ + auVar515._0_2_ + auVar59._0_2_) * local_188 +
           (auVar364._0_2_ + auVar514._0_2_ + auVar320._0_2_) * local_178 + auVar391._0_2_;
      auVar86._2_2_ =
           (auVar85._2_2_ + auVar555._2_2_ + auVar515._2_2_ + auVar59._2_2_) * sStack_186 +
           (auVar364._2_2_ + auVar514._2_2_ + auVar320._2_2_) * sStack_176 + auVar391._2_2_;
      auVar86._4_2_ =
           (auVar85._4_2_ + auVar555._4_2_ + auVar515._4_2_ + auVar59._4_2_) * local_188 +
           (auVar364._4_2_ + auVar514._4_2_ + auVar320._4_2_) * local_178 + auVar391._4_2_;
      auVar86._6_2_ =
           (auVar85._6_2_ + auVar555._6_2_ + auVar515._6_2_ + auVar59._6_2_) * sStack_186 +
           (auVar364._6_2_ + auVar514._6_2_ + auVar320._6_2_) * sStack_176 + auVar391._6_2_;
      auVar86._8_2_ =
           (auVar85._8_2_ + auVar555._8_2_ + auVar515._8_2_ + auVar59._8_2_) * local_188 +
           (auVar364._8_2_ + auVar514._8_2_ + auVar320._8_2_) * local_178 + auVar391._8_2_;
      auVar86._10_2_ =
           (auVar85._10_2_ + auVar555._10_2_ + auVar515._10_2_ + auVar59._10_2_) * sStack_186 +
           (auVar364._10_2_ + auVar514._10_2_ + auVar320._10_2_) * sStack_176 + auVar391._10_2_;
      auVar86._12_2_ =
           (auVar85._12_2_ + auVar555._12_2_ + auVar515._12_2_ + auVar59._12_2_) * local_188 +
           (auVar364._12_2_ + auVar514._12_2_ + auVar320._12_2_) * local_178 + auVar391._12_2_;
      auVar86._14_2_ =
           (auVar85._14_2_ + auVar555._14_2_ + auVar515._14_2_ + auVar59._14_2_) * sStack_186 +
           (auVar364._14_2_ + auVar514._14_2_ + auVar320._14_2_) * sStack_176 + auVar391._14_2_;
      auVar466._0_2_ =
           (auVar465._0_2_ + auVar526._0_2_ + auVar539._0_2_ + auVar31._0_2_) * local_188 +
           (auVar496._0_2_ + auVar460._0_2_ + auVar81._0_2_) * local_178 +
           (auVar58._0_2_ + auVar360._0_2_) * sVar125 + (auVar271._0_2_ + auVar26._0_2_) * sVar21;
      auVar466._2_2_ =
           (auVar465._2_2_ + auVar526._2_2_ + auVar539._2_2_ + auVar31._2_2_) * sStack_186 +
           (auVar496._2_2_ + auVar460._2_2_ + auVar81._2_2_) * sStack_176 +
           (auVar58._2_2_ + auVar360._2_2_) * sVar158 + (auVar271._2_2_ + auVar26._2_2_) * sVar38;
      auVar466._4_2_ =
           (auVar465._4_2_ + auVar526._4_2_ + auVar539._4_2_ + auVar31._4_2_) * local_188 +
           (auVar496._4_2_ + auVar460._4_2_ + auVar81._4_2_) * local_178 +
           (auVar58._4_2_ + auVar360._4_2_) * sVar125 + (auVar271._4_2_ + auVar26._4_2_) * sVar21;
      auVar466._6_2_ =
           (auVar465._6_2_ + auVar526._6_2_ + auVar539._6_2_ + auVar31._6_2_) * sStack_186 +
           (auVar496._6_2_ + auVar460._6_2_ + auVar81._6_2_) * sStack_176 +
           (auVar58._6_2_ + auVar360._6_2_) * sVar158 + (auVar271._6_2_ + auVar26._6_2_) * sVar38;
      auVar466._8_2_ =
           (auVar465._8_2_ + auVar526._8_2_ + auVar539._8_2_ + auVar31._8_2_) * local_188 +
           (auVar496._8_2_ + auVar460._8_2_ + auVar81._8_2_) * local_178 +
           (auVar58._8_2_ + auVar360._8_2_) * sVar125 + (auVar271._8_2_ + auVar26._8_2_) * sVar21;
      auVar466._10_2_ =
           (auVar465._10_2_ + auVar526._10_2_ + auVar539._10_2_ + auVar31._10_2_) * sStack_186 +
           (auVar496._10_2_ + auVar460._10_2_ + auVar81._10_2_) * sStack_176 +
           (auVar58._10_2_ + auVar360._10_2_) * sVar158 +
           (auVar271._10_2_ + auVar26._10_2_) * sVar38;
      auVar466._12_2_ =
           (auVar465._12_2_ + auVar526._12_2_ + auVar539._12_2_ + auVar31._12_2_) * local_188 +
           (auVar496._12_2_ + auVar460._12_2_ + auVar81._12_2_) * local_178 +
           (auVar58._12_2_ + auVar360._12_2_) * sVar125 +
           (auVar271._12_2_ + auVar26._12_2_) * sVar21;
      auVar466._14_2_ =
           (auVar465._14_2_ + auVar526._14_2_ + auVar539._14_2_ + auVar31._14_2_) * sStack_186 +
           (auVar496._14_2_ + auVar460._14_2_ + auVar81._14_2_) * sStack_176 +
           (auVar58._14_2_ + auVar360._14_2_) * sVar158 +
           (auVar271._14_2_ + auVar26._14_2_) * sVar38;
      uVar385 = (ushort)(sVar69 < sVar491) * sVar69 | (ushort)(sVar69 >= sVar491) * sVar491;
      uVar401 = (ushort)(sVar71 < sVar498) * sVar71 | (ushort)(sVar71 >= sVar498) * sVar498;
      uVar406 = (ushort)(sVar73 < sVar499) * sVar73 | (ushort)(sVar73 >= sVar499) * sVar499;
      uVar410 = (ushort)(sVar75 < sVar500) * sVar75 | (ushort)(sVar75 >= sVar500) * sVar500;
      uVar414 = (ushort)(sVar99 < sVar501) * sVar99 | (ushort)(sVar99 >= sVar501) * sVar501;
      uVar419 = (ushort)(sVar104 < sVar503) * sVar104 | (ushort)(sVar104 >= sVar503) * sVar503;
      uVar424 = (ushort)(sVar109 < sVar505) * sVar109 | (ushort)(sVar109 >= sVar505) * sVar505;
      uVar429 = (ushort)(sVar117 < sVar507) * sVar117 | (ushort)(sVar117 >= sVar507) * sVar507;
      auVar138 = auVar138 & _DAT_004c0740;
      auVar315 = auVar315 & _DAT_004c0740;
      sVar18 = auVar138._0_2_;
      sVar21 = auVar315._0_2_;
      uVar37 = (ushort)(sVar21 < sVar18) * sVar18 | (ushort)(sVar21 >= sVar18) * sVar21;
      sVar18 = auVar138._2_2_;
      sVar21 = auVar315._2_2_;
      uVar42 = (ushort)(sVar21 < sVar18) * sVar18 | (ushort)(sVar21 >= sVar18) * sVar21;
      sVar18 = auVar138._4_2_;
      sVar21 = auVar315._4_2_;
      uVar47 = (ushort)(sVar21 < sVar18) * sVar18 | (ushort)(sVar21 >= sVar18) * sVar21;
      sVar18 = auVar138._6_2_;
      sVar21 = auVar315._6_2_;
      uVar177 = (ushort)(sVar21 < sVar18) * sVar18 | (ushort)(sVar21 >= sVar18) * sVar21;
      sVar18 = auVar138._8_2_;
      sVar21 = auVar315._8_2_;
      uVar205 = (ushort)(sVar21 < sVar18) * sVar18 | (ushort)(sVar21 >= sVar18) * sVar21;
      sVar18 = auVar138._10_2_;
      sVar21 = auVar315._10_2_;
      uVar49 = (ushort)(sVar21 < sVar18) * sVar18 | (ushort)(sVar21 >= sVar18) * sVar21;
      sVar18 = auVar138._12_2_;
      sVar21 = auVar315._12_2_;
      sVar19 = auVar315._14_2_;
      uVar53 = (ushort)(sVar21 < sVar18) * sVar18 | (ushort)(sVar21 >= sVar18) * sVar21;
      sVar18 = auVar138._14_2_;
      uVar285 = (ushort)(sVar19 < sVar18) * sVar18 | (ushort)(sVar19 >= sVar18) * sVar19;
      uVar289 = (ushort)(sVar311 < sVar509) * sVar311 | (ushort)(sVar311 >= sVar509) * sVar509;
      uVar297 = (ushort)(sVar330 < sVar517) * sVar330 | (ushort)(sVar330 >= sVar517) * sVar517;
      uVar307 = (ushort)(sVar333 < sVar518) * sVar333 | (ushort)(sVar333 >= sVar518) * sVar518;
      uVar206 = (ushort)(sVar336 < sVar519) * sVar336 | (ushort)(sVar336 >= sVar519) * sVar519;
      uVar225 = (ushort)(sVar340 < sVar520) * sVar340 | (ushort)(sVar340 >= sVar520) * sVar520;
      uVar241 = (ushort)(sVar343 < sVar521) * sVar343 | (ushort)(sVar343 >= sVar521) * sVar521;
      uVar249 = (ushort)(sVar347 < sVar522) * sVar347 | (ushort)(sVar347 >= sVar522) * sVar522;
      uVar257 = (ushort)(sVar351 < sVar523) * sVar351 | (ushort)(sVar351 >= sVar523) * sVar523;
      auVar492 = auVar492 & _DAT_004c0740;
      auVar317 = auVar317 & _DAT_004c0740;
      sVar18 = auVar492._0_2_;
      sVar21 = auVar317._0_2_;
      uVar293 = (ushort)(sVar21 < sVar18) * sVar18 | (ushort)(sVar21 >= sVar18) * sVar21;
      sVar18 = auVar492._2_2_;
      sVar21 = auVar317._2_2_;
      uVar302 = (ushort)(sVar21 < sVar18) * sVar18 | (ushort)(sVar21 >= sVar18) * sVar21;
      sVar18 = auVar492._4_2_;
      sVar21 = auVar317._4_2_;
      uVar196 = (ushort)(sVar21 < sVar18) * sVar18 | (ushort)(sVar21 >= sVar18) * sVar21;
      sVar18 = auVar492._6_2_;
      sVar21 = auVar317._6_2_;
      uVar216 = (ushort)(sVar21 < sVar18) * sVar18 | (ushort)(sVar21 >= sVar18) * sVar21;
      sVar18 = auVar492._8_2_;
      sVar21 = auVar317._8_2_;
      uVar238 = (ushort)(sVar21 < sVar18) * sVar18 | (ushort)(sVar21 >= sVar18) * sVar21;
      sVar18 = auVar492._10_2_;
      sVar21 = auVar317._10_2_;
      uVar245 = (ushort)(sVar21 < sVar18) * sVar18 | (ushort)(sVar21 >= sVar18) * sVar21;
      sVar18 = auVar492._12_2_;
      sVar21 = auVar317._12_2_;
      sVar19 = auVar317._14_2_;
      uVar253 = (ushort)(sVar21 < sVar18) * sVar18 | (ushort)(sVar21 >= sVar18) * sVar21;
      sVar18 = auVar492._14_2_;
      uVar261 = (ushort)(sVar19 < sVar18) * sVar18 | (ushort)(sVar19 >= sVar18) * sVar19;
      in_XMM8._0_2_ =
           (ushort)(sVar355 < (short)uVar385) * sVar355 | (sVar355 >= (short)uVar385) * uVar385;
      in_XMM8._2_2_ =
           (ushort)(sVar370 < (short)uVar401) * sVar370 | (sVar370 >= (short)uVar401) * uVar401;
      in_XMM8._4_2_ =
           (ushort)(sVar372 < (short)uVar406) * sVar372 | (sVar372 >= (short)uVar406) * uVar406;
      in_XMM8._6_2_ =
           (ushort)(sVar374 < (short)uVar410) * sVar374 | (sVar374 >= (short)uVar410) * uVar410;
      in_XMM8._8_2_ =
           (ushort)(sVar376 < (short)uVar414) * sVar376 | (sVar376 >= (short)uVar414) * uVar414;
      in_XMM8._10_2_ =
           (ushort)(sVar378 < (short)uVar419) * sVar378 | (sVar378 >= (short)uVar419) * uVar419;
      in_XMM8._12_2_ =
           (ushort)(sVar380 < (short)uVar424) * sVar380 | (sVar380 >= (short)uVar424) * uVar424;
      in_XMM8._14_2_ =
           (ushort)(sVar382 < (short)uVar429) * sVar382 | (sVar382 >= (short)uVar429) * uVar429;
      auVar361 = auVar361 & _DAT_004c0740;
      sVar18 = auVar361._0_2_;
      uVar37 = (sVar18 < (short)uVar37) * uVar37 | (ushort)(sVar18 >= (short)uVar37) * sVar18;
      sVar18 = auVar361._2_2_;
      uVar42 = (sVar18 < (short)uVar42) * uVar42 | (ushort)(sVar18 >= (short)uVar42) * sVar18;
      sVar18 = auVar361._4_2_;
      uVar47 = (sVar18 < (short)uVar47) * uVar47 | (ushort)(sVar18 >= (short)uVar47) * sVar18;
      sVar18 = auVar361._6_2_;
      uVar177 = (sVar18 < (short)uVar177) * uVar177 | (ushort)(sVar18 >= (short)uVar177) * sVar18;
      sVar18 = auVar361._8_2_;
      uVar205 = (sVar18 < (short)uVar205) * uVar205 | (ushort)(sVar18 >= (short)uVar205) * sVar18;
      sVar18 = auVar361._10_2_;
      uVar49 = (sVar18 < (short)uVar49) * uVar49 | (ushort)(sVar18 >= (short)uVar49) * sVar18;
      sVar18 = auVar361._12_2_;
      sVar21 = auVar361._14_2_;
      uVar53 = (sVar18 < (short)uVar53) * uVar53 | (ushort)(sVar18 >= (short)uVar53) * sVar18;
      uVar285 = (sVar21 < (short)uVar285) * uVar285 | (ushort)(sVar21 >= (short)uVar285) * sVar21;
      uVar385 = ((short)uVar37 < (short)uVar20) * uVar20 | ((short)uVar37 >= (short)uVar20) * uVar37
      ;
      uVar401 = ((short)uVar42 < (short)uVar126) * uVar126 |
                ((short)uVar42 >= (short)uVar126) * uVar42;
      uVar406 = ((short)uVar47 < (short)uVar159) * uVar159 |
                ((short)uVar47 >= (short)uVar159) * uVar47;
      uVar410 = ((short)uVar177 < (short)uVar168) * uVar168 |
                ((short)uVar177 >= (short)uVar168) * uVar177;
      uVar414 = ((short)uVar205 < (short)uVar186) * uVar186 |
                ((short)uVar205 >= (short)uVar186) * uVar205;
      uVar419 = ((short)uVar49 < (short)uVar45) * uVar45 | ((short)uVar49 >= (short)uVar45) * uVar49
      ;
      uVar424 = ((short)uVar53 < (short)uVar48) * uVar48 | ((short)uVar53 >= (short)uVar48) * uVar53
      ;
      uVar429 = ((short)uVar285 < (short)uVar52) * uVar52 |
                ((short)uVar285 >= (short)uVar52) * uVar285;
      uVar433 = (ushort)(sVar127 < (short)uVar289) * sVar127 | (sVar127 >= (short)uVar289) * uVar289
      ;
      uVar441 = (ushort)(sVar160 < (short)uVar297) * sVar160 | (sVar160 >= (short)uVar297) * uVar297
      ;
      uVar443 = (ushort)(sVar169 < (short)uVar307) * sVar169 | (sVar169 >= (short)uVar307) * uVar307
      ;
      uVar445 = (ushort)(sVar178 < (short)uVar206) * sVar178 | (sVar178 >= (short)uVar206) * uVar206
      ;
      uVar225 = (ushort)(sVar187 < (short)uVar225) * sVar187 | (sVar187 >= (short)uVar225) * uVar225
      ;
      uVar241 = (ushort)(sVar197 < (short)uVar241) * sVar197 | (sVar197 >= (short)uVar241) * uVar241
      ;
      uVar249 = (ushort)(sVar207 < (short)uVar249) * sVar207 | (sVar207 >= (short)uVar249) * uVar249
      ;
      uVar257 = (ushort)(sVar217 < (short)uVar257) * sVar217 | (sVar217 >= (short)uVar257) * uVar257
      ;
      auVar140 = auVar140 & _DAT_004c0740;
      sVar18 = auVar140._0_2_;
      uVar20 = (sVar18 < (short)uVar293) * uVar293 | (ushort)(sVar18 >= (short)uVar293) * sVar18;
      sVar18 = auVar140._2_2_;
      uVar37 = (sVar18 < (short)uVar302) * uVar302 | (ushort)(sVar18 >= (short)uVar302) * sVar18;
      sVar18 = auVar140._4_2_;
      uVar126 = (sVar18 < (short)uVar196) * uVar196 | (ushort)(sVar18 >= (short)uVar196) * sVar18;
      sVar18 = auVar140._6_2_;
      uVar42 = (sVar18 < (short)uVar216) * uVar216 | (ushort)(sVar18 >= (short)uVar216) * sVar18;
      sVar18 = auVar140._8_2_;
      uVar159 = (sVar18 < (short)uVar238) * uVar238 | (ushort)(sVar18 >= (short)uVar238) * sVar18;
      sVar18 = auVar140._10_2_;
      uVar47 = (sVar18 < (short)uVar245) * uVar245 | (ushort)(sVar18 >= (short)uVar245) * sVar18;
      sVar18 = auVar140._12_2_;
      sVar21 = auVar140._14_2_;
      uVar168 = (sVar18 < (short)uVar253) * uVar253 | (ushort)(sVar18 >= (short)uVar253) * sVar18;
      uVar177 = (sVar21 < (short)uVar261) * uVar261 | (ushort)(sVar21 >= (short)uVar261) * sVar21;
      uVar238 = ((short)uVar20 < (short)uVar34) * uVar34 | ((short)uVar20 >= (short)uVar34) * uVar20
      ;
      uVar245 = ((short)uVar37 < (short)uVar40) * uVar40 | ((short)uVar37 >= (short)uVar40) * uVar37
      ;
      uVar253 = ((short)uVar126 < (short)uVar44) * uVar44 |
                ((short)uVar126 >= (short)uVar44) * uVar126;
      uVar261 = ((short)uVar42 < (short)uVar51) * uVar51 | ((short)uVar42 >= (short)uVar51) * uVar42
      ;
      uVar502 = ((short)uVar159 < (short)uVar195) * uVar195 |
                ((short)uVar159 >= (short)uVar195) * uVar159;
      uVar504 = ((short)uVar47 < (short)uVar215) * uVar215 |
                ((short)uVar47 >= (short)uVar215) * uVar47;
      uVar506 = ((short)uVar168 < (short)uVar265) * uVar265 |
                ((short)uVar168 >= (short)uVar265) * uVar168;
      uVar508 = ((short)uVar177 < (short)uVar282) * uVar282 |
                ((short)uVar177 >= (short)uVar282) * uVar177;
      uVar20 = (ushort)(sVar129 < sVar128) * sVar129 | (ushort)(sVar129 >= sVar128) * sVar128;
      uVar37 = (ushort)(sVar162 < sVar161) * sVar162 | (ushort)(sVar162 >= sVar161) * sVar161;
      uVar40 = (ushort)(sVar171 < sVar170) * sVar171 | (ushort)(sVar171 >= sVar170) * sVar170;
      uVar159 = (ushort)(sVar180 < sVar179) * sVar180 | (ushort)(sVar180 >= sVar179) * sVar179;
      uVar47 = (ushort)(sVar189 < sVar188) * sVar189 | (ushort)(sVar189 >= sVar188) * sVar188;
      uVar51 = (ushort)(sVar199 < sVar198) * sVar199 | (ushort)(sVar199 >= sVar198) * sVar198;
      uVar186 = (ushort)(sVar209 < sVar208) * sVar209 | (ushort)(sVar209 >= sVar208) * sVar208;
      uVar205 = (ushort)(sVar219 < sVar218) * sVar219 | (ushort)(sVar219 >= sVar218) * sVar218;
      auVar357 = auVar357 & _DAT_004c0740;
      auVar227 = auVar227 & _DAT_004c0740;
      sVar18 = auVar357._0_2_;
      sVar21 = auVar227._0_2_;
      uVar34 = (ushort)(sVar21 < sVar18) * sVar18 | (ushort)(sVar21 >= sVar18) * sVar21;
      sVar18 = auVar357._2_2_;
      sVar21 = auVar227._2_2_;
      uVar126 = (ushort)(sVar21 < sVar18) * sVar18 | (ushort)(sVar21 >= sVar18) * sVar21;
      sVar18 = auVar357._4_2_;
      sVar21 = auVar227._4_2_;
      uVar42 = (ushort)(sVar21 < sVar18) * sVar18 | (ushort)(sVar21 >= sVar18) * sVar21;
      sVar18 = auVar357._6_2_;
      sVar21 = auVar227._6_2_;
      uVar44 = (ushort)(sVar21 < sVar18) * sVar18 | (ushort)(sVar21 >= sVar18) * sVar21;
      sVar18 = auVar357._8_2_;
      sVar21 = auVar227._8_2_;
      uVar168 = (ushort)(sVar21 < sVar18) * sVar18 | (ushort)(sVar21 >= sVar18) * sVar21;
      sVar18 = auVar357._10_2_;
      sVar21 = auVar227._10_2_;
      uVar177 = (ushort)(sVar21 < sVar18) * sVar18 | (ushort)(sVar21 >= sVar18) * sVar21;
      sVar18 = auVar357._12_2_;
      sVar21 = auVar227._12_2_;
      sVar19 = auVar227._14_2_;
      uVar195 = (ushort)(sVar21 < sVar18) * sVar18 | (ushort)(sVar21 >= sVar18) * sVar21;
      sVar18 = auVar357._14_2_;
      uVar45 = (ushort)(sVar19 < sVar18) * sVar18 | (ushort)(sVar19 >= sVar18) * sVar19;
      uVar215 = (ushort)(sVar534 < sVar356) * sVar534 | (ushort)(sVar534 >= sVar356) * sVar356;
      uVar48 = (ushort)(sVar541 < sVar371) * sVar541 | (ushort)(sVar541 >= sVar371) * sVar371;
      uVar53 = (ushort)(sVar542 < sVar373) * sVar542 | (ushort)(sVar542 >= sVar373) * sVar373;
      uVar282 = (ushort)(sVar543 < sVar375) * sVar543 | (ushort)(sVar543 >= sVar375) * sVar375;
      uVar289 = (ushort)(sVar544 < sVar377) * sVar544 | (ushort)(sVar544 >= sVar377) * sVar377;
      uVar297 = (ushort)(sVar546 < sVar379) * sVar546 | (ushort)(sVar546 >= sVar379) * sVar379;
      uVar307 = (ushort)(sVar548 < sVar381) * sVar548 | (ushort)(sVar548 >= sVar381) * sVar381;
      uVar206 = (ushort)(sVar550 < sVar383) * sVar550 | (ushort)(sVar550 >= sVar383) * sVar383;
      auVar136 = auVar136 & _DAT_004c0740;
      auVar537 = auVar537 & _DAT_004c0740;
      sVar18 = auVar136._0_2_;
      sVar21 = auVar537._0_2_;
      uVar49 = (ushort)(sVar21 < sVar18) * sVar18 | (ushort)(sVar21 >= sVar18) * sVar21;
      sVar18 = auVar136._2_2_;
      sVar21 = auVar537._2_2_;
      uVar265 = (ushort)(sVar21 < sVar18) * sVar18 | (ushort)(sVar21 >= sVar18) * sVar21;
      sVar18 = auVar136._4_2_;
      sVar21 = auVar537._4_2_;
      uVar52 = (ushort)(sVar21 < sVar18) * sVar18 | (ushort)(sVar21 >= sVar18) * sVar21;
      sVar18 = auVar136._6_2_;
      sVar21 = auVar537._6_2_;
      uVar285 = (ushort)(sVar21 < sVar18) * sVar18 | (ushort)(sVar21 >= sVar18) * sVar21;
      sVar18 = auVar136._8_2_;
      sVar21 = auVar537._8_2_;
      uVar293 = (ushort)(sVar21 < sVar18) * sVar18 | (ushort)(sVar21 >= sVar18) * sVar21;
      sVar18 = auVar136._10_2_;
      sVar21 = auVar537._10_2_;
      uVar302 = (ushort)(sVar21 < sVar18) * sVar18 | (ushort)(sVar21 >= sVar18) * sVar21;
      sVar18 = auVar136._12_2_;
      sVar21 = auVar537._12_2_;
      sVar19 = auVar537._14_2_;
      uVar196 = (ushort)(sVar21 < sVar18) * sVar18 | (ushort)(sVar21 >= sVar18) * sVar21;
      sVar18 = auVar136._14_2_;
      uVar216 = (ushort)(sVar19 < sVar18) * sVar18 | (ushort)(sVar19 >= sVar18) * sVar19;
      uVar524 = (ushort)(sVar68 < (short)uVar20) * sVar68 | (sVar68 >= (short)uVar20) * uVar20;
      uVar527 = (ushort)(sVar70 < (short)uVar37) * sVar70 | (sVar70 >= (short)uVar37) * uVar37;
      uVar528 = (ushort)(sVar72 < (short)uVar40) * sVar72 | (sVar72 >= (short)uVar40) * uVar40;
      uVar529 = (ushort)(sVar74 < (short)uVar159) * sVar74 | (sVar74 >= (short)uVar159) * uVar159;
      uVar530 = (ushort)(sVar100 < (short)uVar47) * sVar100 | (sVar100 >= (short)uVar47) * uVar47;
      uVar531 = (ushort)(sVar105 < (short)uVar51) * sVar105 | (sVar105 >= (short)uVar51) * uVar51;
      uVar532 = (ushort)(sVar110 < (short)uVar186) * sVar110 | (sVar110 >= (short)uVar186) * uVar186
      ;
      uVar533 = (ushort)(sVar118 < (short)uVar205) * sVar118 | (sVar118 >= (short)uVar205) * uVar205
      ;
      auVar54 = auVar54 & _DAT_004c0740;
      sVar18 = auVar54._0_2_;
      uVar20 = (sVar18 < (short)uVar34) * uVar34 | (ushort)(sVar18 >= (short)uVar34) * sVar18;
      sVar18 = auVar54._2_2_;
      uVar34 = (sVar18 < (short)uVar126) * uVar126 | (ushort)(sVar18 >= (short)uVar126) * sVar18;
      sVar18 = auVar54._4_2_;
      uVar37 = (sVar18 < (short)uVar42) * uVar42 | (ushort)(sVar18 >= (short)uVar42) * sVar18;
      sVar18 = auVar54._6_2_;
      uVar126 = (sVar18 < (short)uVar44) * uVar44 | (ushort)(sVar18 >= (short)uVar44) * sVar18;
      sVar18 = auVar54._8_2_;
      uVar40 = (sVar18 < (short)uVar168) * uVar168 | (ushort)(sVar18 >= (short)uVar168) * sVar18;
      sVar18 = auVar54._10_2_;
      uVar42 = (sVar18 < (short)uVar177) * uVar177 | (ushort)(sVar18 >= (short)uVar177) * sVar18;
      sVar18 = auVar54._12_2_;
      sVar21 = auVar54._14_2_;
      uVar159 = (sVar18 < (short)uVar195) * uVar195 | (ushort)(sVar18 >= (short)uVar195) * sVar18;
      uVar44 = (sVar21 < (short)uVar45) * uVar45 | (ushort)(sVar21 >= (short)uVar45) * sVar21;
      uVar215 = (ushort)(sVar130 < (short)uVar215) * sVar130 | (sVar130 >= (short)uVar215) * uVar215
      ;
      uVar48 = (ushort)(sVar163 < (short)uVar48) * sVar163 | (sVar163 >= (short)uVar48) * uVar48;
      uVar53 = (ushort)(sVar172 < (short)uVar53) * sVar172 | (sVar172 >= (short)uVar53) * uVar53;
      uVar282 = (ushort)(sVar181 < (short)uVar282) * sVar181 | (sVar181 >= (short)uVar282) * uVar282
      ;
      uVar545 = (ushort)(sVar190 < (short)uVar289) * sVar190 | (sVar190 >= (short)uVar289) * uVar289
      ;
      uVar547 = (ushort)(sVar200 < (short)uVar297) * sVar200 | (sVar200 >= (short)uVar297) * uVar297
      ;
      uVar549 = (ushort)(sVar210 < (short)uVar307) * sVar210 | (sVar210 >= (short)uVar307) * uVar307
      ;
      uVar551 = (ushort)(sVar220 < (short)uVar206) * sVar220 | (sVar220 >= (short)uVar206) * uVar206
      ;
      auVar389 = auVar389 & _DAT_004c0740;
      sVar18 = auVar389._0_2_;
      uVar47 = (sVar18 < (short)uVar49) * uVar49 | (ushort)(sVar18 >= (short)uVar49) * sVar18;
      sVar18 = auVar389._2_2_;
      uVar168 = (sVar18 < (short)uVar265) * uVar265 | (ushort)(sVar18 >= (short)uVar265) * sVar18;
      sVar18 = auVar389._4_2_;
      uVar51 = (sVar18 < (short)uVar52) * uVar52 | (ushort)(sVar18 >= (short)uVar52) * sVar18;
      sVar18 = auVar389._6_2_;
      uVar177 = (sVar18 < (short)uVar285) * uVar285 | (ushort)(sVar18 >= (short)uVar285) * sVar18;
      sVar18 = auVar389._8_2_;
      uVar186 = (sVar18 < (short)uVar293) * uVar293 | (ushort)(sVar18 >= (short)uVar293) * sVar18;
      sVar18 = auVar389._10_2_;
      uVar195 = (sVar18 < (short)uVar302) * uVar302 | (ushort)(sVar18 >= (short)uVar302) * sVar18;
      sVar18 = auVar389._12_2_;
      sVar21 = auVar389._14_2_;
      uVar205 = (sVar18 < (short)uVar196) * uVar196 | (ushort)(sVar18 >= (short)uVar196) * sVar18;
      uVar45 = (sVar21 < (short)uVar216) * uVar216 | (ushort)(sVar21 >= (short)uVar216) * sVar21;
      uVar524 = (ushort)(sVar63 < (short)uVar524) * sVar63 | (sVar63 >= (short)uVar524) * uVar524;
      uVar527 = (ushort)(sVar62 < (short)uVar527) * sVar62 | (sVar62 >= (short)uVar527) * uVar527;
      uVar528 = (ushort)(sVar65 < (short)uVar528) * sVar65 | (sVar65 >= (short)uVar528) * uVar528;
      uVar529 = (ushort)(sVar67 < (short)uVar529) * sVar67 | (sVar67 >= (short)uVar529) * uVar529;
      uVar530 = (ushort)(sVar101 < (short)uVar530) * sVar101 | (sVar101 >= (short)uVar530) * uVar530
      ;
      uVar531 = (ushort)(sVar106 < (short)uVar531) * sVar106 | (sVar106 >= (short)uVar531) * uVar531
      ;
      uVar532 = (ushort)(sVar111 < (short)uVar532) * sVar111 | (sVar111 >= (short)uVar532) * uVar532
      ;
      uVar533 = (ushort)(sVar119 < (short)uVar533) * sVar119 | (sVar119 >= (short)uVar533) * uVar533
      ;
      auVar83 = auVar83 & _DAT_004c0740;
      sVar18 = auVar83._0_2_;
      uVar20 = (sVar18 < (short)uVar20) * uVar20 | (ushort)(sVar18 >= (short)uVar20) * sVar18;
      sVar18 = auVar83._2_2_;
      uVar34 = (sVar18 < (short)uVar34) * uVar34 | (ushort)(sVar18 >= (short)uVar34) * sVar18;
      sVar18 = auVar83._4_2_;
      uVar37 = (sVar18 < (short)uVar37) * uVar37 | (ushort)(sVar18 >= (short)uVar37) * sVar18;
      sVar18 = auVar83._6_2_;
      uVar126 = (sVar18 < (short)uVar126) * uVar126 | (ushort)(sVar18 >= (short)uVar126) * sVar18;
      sVar18 = auVar83._8_2_;
      uVar40 = (sVar18 < (short)uVar40) * uVar40 | (ushort)(sVar18 >= (short)uVar40) * sVar18;
      sVar18 = auVar83._10_2_;
      uVar42 = (sVar18 < (short)uVar42) * uVar42 | (ushort)(sVar18 >= (short)uVar42) * sVar18;
      sVar18 = auVar83._12_2_;
      sVar21 = auVar83._14_2_;
      uVar159 = (sVar18 < (short)uVar159) * uVar159 | (ushort)(sVar18 >= (short)uVar159) * sVar18;
      uVar44 = (sVar21 < (short)uVar44) * uVar44 | (ushort)(sVar21 >= (short)uVar44) * sVar21;
      uVar289 = ((short)uVar20 < (short)uVar385) * uVar385 |
                ((short)uVar20 >= (short)uVar385) * uVar20;
      uVar293 = ((short)uVar34 < (short)uVar401) * uVar401 |
                ((short)uVar34 >= (short)uVar401) * uVar34;
      uVar297 = ((short)uVar37 < (short)uVar406) * uVar406 |
                ((short)uVar37 >= (short)uVar406) * uVar37;
      uVar302 = ((short)uVar126 < (short)uVar410) * uVar410 |
                ((short)uVar126 >= (short)uVar410) * uVar126;
      uVar307 = ((short)uVar40 < (short)uVar414) * uVar414 |
                ((short)uVar40 >= (short)uVar414) * uVar40;
      uVar196 = ((short)uVar42 < (short)uVar419) * uVar419 |
                ((short)uVar42 >= (short)uVar419) * uVar42;
      uVar206 = ((short)uVar159 < (short)uVar424) * uVar424 |
                ((short)uVar159 >= (short)uVar424) * uVar159;
      uVar216 = ((short)uVar44 < (short)uVar429) * uVar429 |
                ((short)uVar44 >= (short)uVar429) * uVar44;
      uVar385 = (ushort)(sVar312 < (short)uVar215) * sVar312 | (sVar312 >= (short)uVar215) * uVar215
      ;
      uVar401 = (ushort)(sVar331 < (short)uVar48) * sVar331 | (sVar331 >= (short)uVar48) * uVar48;
      uVar406 = (ushort)(sVar334 < (short)uVar53) * sVar334 | (sVar334 >= (short)uVar53) * uVar53;
      uVar410 = (ushort)(sVar337 < (short)uVar282) * sVar337 | (sVar337 >= (short)uVar282) * uVar282
      ;
      uVar414 = (ushort)(sVar341 < (short)uVar545) * sVar341 | (sVar341 >= (short)uVar545) * uVar545
      ;
      uVar419 = (ushort)(sVar344 < (short)uVar547) * sVar344 | (sVar344 >= (short)uVar547) * uVar547
      ;
      uVar424 = (ushort)(sVar348 < (short)uVar549) * sVar348 | (sVar348 >= (short)uVar549) * uVar549
      ;
      uVar429 = (ushort)(sVar352 < (short)uVar551) * sVar352 | (sVar352 >= (short)uVar551) * uVar551
      ;
      auVar29 = auVar29 & _DAT_004c0740;
      sVar18 = auVar29._0_2_;
      uVar20 = (sVar18 < (short)uVar47) * uVar47 | (ushort)(sVar18 >= (short)uVar47) * sVar18;
      sVar18 = auVar29._2_2_;
      uVar34 = (sVar18 < (short)uVar168) * uVar168 | (ushort)(sVar18 >= (short)uVar168) * sVar18;
      sVar18 = auVar29._4_2_;
      uVar37 = (sVar18 < (short)uVar51) * uVar51 | (ushort)(sVar18 >= (short)uVar51) * sVar18;
      sVar18 = auVar29._6_2_;
      uVar126 = (sVar18 < (short)uVar177) * uVar177 | (ushort)(sVar18 >= (short)uVar177) * sVar18;
      sVar18 = auVar29._8_2_;
      uVar40 = (sVar18 < (short)uVar186) * uVar186 | (ushort)(sVar18 >= (short)uVar186) * sVar18;
      sVar18 = auVar29._10_2_;
      uVar42 = (sVar18 < (short)uVar195) * uVar195 | (ushort)(sVar18 >= (short)uVar195) * sVar18;
      sVar18 = auVar29._12_2_;
      sVar21 = auVar29._14_2_;
      uVar159 = (sVar18 < (short)uVar205) * uVar205 | (ushort)(sVar18 >= (short)uVar205) * sVar18;
      uVar44 = (sVar21 < (short)uVar45) * uVar45 | (ushort)(sVar21 >= (short)uVar45) * sVar21;
      uVar20 = ((short)uVar20 < (short)uVar238) * uVar238 |
               ((short)uVar20 >= (short)uVar238) * uVar20;
      uVar34 = ((short)uVar34 < (short)uVar245) * uVar245 |
               ((short)uVar34 >= (short)uVar245) * uVar34;
      uVar37 = ((short)uVar37 < (short)uVar253) * uVar253 |
               ((short)uVar37 >= (short)uVar253) * uVar37;
      uVar126 = ((short)uVar126 < (short)uVar261) * uVar261 |
                ((short)uVar126 >= (short)uVar261) * uVar126;
      uVar40 = ((short)uVar40 < (short)uVar502) * uVar502 |
               ((short)uVar40 >= (short)uVar502) * uVar40;
      uVar42 = ((short)uVar42 < (short)uVar504) * uVar504 |
               ((short)uVar42 >= (short)uVar504) * uVar42;
      uVar159 = ((short)uVar159 < (short)uVar506) * uVar506 |
                ((short)uVar159 >= (short)uVar506) * uVar159;
      uVar44 = ((short)uVar44 < (short)uVar508) * uVar508 |
               ((short)uVar44 >= (short)uVar508) * uVar44;
      uVar47 = (ushort)(sVar384 < sVar35) * sVar384 | (ushort)(sVar384 >= sVar35) * sVar35;
      uVar51 = (ushort)(sVar400 < sVar33) * sVar400 | (ushort)(sVar400 >= sVar33) * sVar33;
      uVar186 = (ushort)(sVar405 < sVar36) * sVar405 | (ushort)(sVar405 >= sVar36) * sVar36;
      uVar205 = (ushort)(sVar409 < sVar39) * sVar409 | (ushort)(sVar409 >= sVar39) * sVar39;
      uVar215 = (ushort)(sVar413 < sVar41) * sVar413 | (ushort)(sVar413 >= sVar41) * sVar41;
      uVar48 = (ushort)(sVar418 < sVar43) * sVar418 | (ushort)(sVar418 >= sVar43) * sVar43;
      uVar53 = (ushort)(sVar423 < sVar46) * sVar423 | (ushort)(sVar423 >= sVar46) * sVar46;
      uVar282 = (ushort)(sVar428 < sVar50) * sVar428 | (ushort)(sVar428 >= sVar50) * sVar50;
      in_XMM4 = auVar269 & _DAT_004c0740;
      auVar323 = auVar323 & _DAT_004c0740;
      sVar18 = in_XMM4._0_2_;
      sVar21 = auVar323._0_2_;
      uVar168 = (ushort)(sVar21 < sVar18) * sVar18 | (ushort)(sVar21 >= sVar18) * sVar21;
      sVar18 = in_XMM4._2_2_;
      sVar21 = auVar323._2_2_;
      uVar177 = (ushort)(sVar21 < sVar18) * sVar18 | (ushort)(sVar21 >= sVar18) * sVar21;
      sVar18 = in_XMM4._4_2_;
      sVar21 = auVar323._4_2_;
      uVar195 = (ushort)(sVar21 < sVar18) * sVar18 | (ushort)(sVar21 >= sVar18) * sVar21;
      sVar18 = in_XMM4._6_2_;
      sVar21 = auVar323._6_2_;
      uVar45 = (ushort)(sVar21 < sVar18) * sVar18 | (ushort)(sVar21 >= sVar18) * sVar21;
      sVar18 = in_XMM4._8_2_;
      sVar21 = auVar323._8_2_;
      uVar49 = (ushort)(sVar21 < sVar18) * sVar18 | (ushort)(sVar21 >= sVar18) * sVar21;
      sVar18 = in_XMM4._10_2_;
      sVar21 = auVar323._10_2_;
      uVar265 = (ushort)(sVar21 < sVar18) * sVar18 | (ushort)(sVar21 >= sVar18) * sVar21;
      sVar18 = in_XMM4._12_2_;
      sVar21 = auVar323._12_2_;
      sVar19 = auVar323._14_2_;
      uVar52 = (ushort)(sVar21 < sVar18) * sVar18 | (ushort)(sVar21 >= sVar18) * sVar21;
      sVar18 = in_XMM4._14_2_;
      uVar285 = (ushort)(sVar19 < sVar18) * sVar18 | (ushort)(sVar19 >= sVar18) * sVar19;
      in_XMM1._0_2_ =
           ((short)uVar168 < (short)uVar289) * uVar289 |
           ((short)uVar168 >= (short)uVar289) * uVar168;
      in_XMM1._2_2_ =
           ((short)uVar177 < (short)uVar293) * uVar293 |
           ((short)uVar177 >= (short)uVar293) * uVar177;
      in_XMM1._4_2_ =
           ((short)uVar195 < (short)uVar297) * uVar297 |
           ((short)uVar195 >= (short)uVar297) * uVar195;
      in_XMM1._6_2_ =
           ((short)uVar45 < (short)uVar302) * uVar302 | ((short)uVar45 >= (short)uVar302) * uVar45;
      in_XMM1._8_2_ =
           ((short)uVar49 < (short)uVar307) * uVar307 | ((short)uVar49 >= (short)uVar307) * uVar49;
      in_XMM1._10_2_ =
           ((short)uVar265 < (short)uVar196) * uVar196 |
           ((short)uVar265 >= (short)uVar196) * uVar265;
      in_XMM1._12_2_ =
           ((short)uVar52 < (short)uVar206) * uVar206 | ((short)uVar52 >= (short)uVar206) * uVar52;
      in_XMM1._14_2_ =
           ((short)uVar285 < (short)uVar216) * uVar216 |
           ((short)uVar285 >= (short)uVar216) * uVar285;
      uVar168 = (ushort)(sVar132 < sVar131) * sVar132 | (ushort)(sVar132 >= sVar131) * sVar131;
      uVar177 = (ushort)(sVar165 < sVar164) * sVar165 | (ushort)(sVar165 >= sVar164) * sVar164;
      uVar195 = (ushort)(sVar174 < sVar173) * sVar174 | (ushort)(sVar174 >= sVar173) * sVar173;
      uVar45 = (ushort)(sVar183 < sVar182) * sVar183 | (ushort)(sVar183 >= sVar182) * sVar182;
      uVar49 = (ushort)(sVar192 < sVar191) * sVar192 | (ushort)(sVar192 >= sVar191) * sVar191;
      uVar265 = (ushort)(sVar202 < sVar201) * sVar202 | (ushort)(sVar202 >= sVar201) * sVar201;
      uVar52 = (ushort)(sVar212 < sVar211) * sVar212 | (ushort)(sVar212 >= sVar211) * sVar211;
      uVar285 = (ushort)(sVar222 < sVar221) * sVar222 | (ushort)(sVar222 >= sVar221) * sVar221;
      auVar148._0_8_ = auVar324._0_8_ & (ulong)DAT_004c0740;
      auVar148._8_8_ = auVar324._8_8_ & DAT_004c0740._8_8_;
      auVar392 = auVar392 & _DAT_004c0740;
      sVar18 = (short)auVar148._0_8_;
      sVar21 = auVar392._0_2_;
      uVar289 = (ushort)(sVar21 < sVar18) * sVar18 | (ushort)(sVar21 >= sVar18) * sVar21;
      sVar18 = (short)(auVar148._0_8_ >> 0x10);
      sVar21 = auVar392._2_2_;
      uVar293 = (ushort)(sVar21 < sVar18) * sVar18 | (ushort)(sVar21 >= sVar18) * sVar21;
      sVar18 = (short)(auVar148._0_8_ >> 0x20);
      sVar21 = auVar392._4_2_;
      uVar297 = (ushort)(sVar21 < sVar18) * sVar18 | (ushort)(sVar21 >= sVar18) * sVar21;
      sVar18 = (short)(auVar148._0_8_ >> 0x30);
      sVar21 = auVar392._6_2_;
      uVar302 = (ushort)(sVar21 < sVar18) * sVar18 | (ushort)(sVar21 >= sVar18) * sVar21;
      sVar18 = (short)auVar148._8_8_;
      sVar21 = auVar392._8_2_;
      uVar307 = (ushort)(sVar21 < sVar18) * sVar18 | (ushort)(sVar21 >= sVar18) * sVar21;
      sVar18 = (short)(auVar148._8_8_ >> 0x10);
      sVar21 = auVar392._10_2_;
      uVar196 = (ushort)(sVar21 < sVar18) * sVar18 | (ushort)(sVar21 >= sVar18) * sVar21;
      sVar18 = (short)(auVar148._8_8_ >> 0x20);
      sVar21 = auVar392._12_2_;
      sVar19 = auVar392._14_2_;
      uVar206 = (ushort)(sVar21 < sVar18) * sVar18 | (ushort)(sVar21 >= sVar18) * sVar21;
      sVar18 = (short)(auVar148._8_8_ >> 0x30);
      uVar216 = (ushort)(sVar19 < sVar18) * sVar18 | (ushort)(sVar19 >= sVar18) * sVar19;
      in_XMM7._0_2_ =
           ((short)uVar289 < (short)uVar20) * uVar20 | ((short)uVar289 >= (short)uVar20) * uVar289;
      in_XMM7._2_2_ =
           ((short)uVar293 < (short)uVar34) * uVar34 | ((short)uVar293 >= (short)uVar34) * uVar293;
      in_XMM7._4_2_ =
           ((short)uVar297 < (short)uVar37) * uVar37 | ((short)uVar297 >= (short)uVar37) * uVar297;
      in_XMM7._6_2_ =
           ((short)uVar302 < (short)uVar126) * uVar126 |
           ((short)uVar302 >= (short)uVar126) * uVar302;
      in_XMM7._8_2_ =
           ((short)uVar307 < (short)uVar40) * uVar40 | ((short)uVar307 >= (short)uVar40) * uVar307;
      in_XMM7._10_2_ =
           ((short)uVar196 < (short)uVar42) * uVar42 | ((short)uVar196 >= (short)uVar42) * uVar196;
      in_XMM7._12_2_ =
           ((short)uVar206 < (short)uVar159) * uVar159 |
           ((short)uVar206 >= (short)uVar159) * uVar206;
      in_XMM7._14_2_ =
           ((short)uVar216 < (short)uVar44) * uVar44 | ((short)uVar216 >= (short)uVar44) * uVar216;
      uVar20 = ((short)auVar77._0_2_ < (short)in_XMM8._0_2_) * auVar77._0_2_ |
               ((short)auVar77._0_2_ >= (short)in_XMM8._0_2_) * in_XMM8._0_2_;
      uVar34 = ((short)auVar77._2_2_ < (short)in_XMM8._2_2_) * auVar77._2_2_ |
               ((short)auVar77._2_2_ >= (short)in_XMM8._2_2_) * in_XMM8._2_2_;
      uVar37 = ((short)auVar77._4_2_ < (short)in_XMM8._4_2_) * auVar77._4_2_ |
               ((short)auVar77._4_2_ >= (short)in_XMM8._4_2_) * in_XMM8._4_2_;
      uVar126 = ((short)auVar77._6_2_ < (short)in_XMM8._6_2_) * auVar77._6_2_ |
                ((short)auVar77._6_2_ >= (short)in_XMM8._6_2_) * in_XMM8._6_2_;
      uVar40 = ((short)auVar77._8_2_ < (short)in_XMM8._8_2_) * auVar77._8_2_ |
               ((short)auVar77._8_2_ >= (short)in_XMM8._8_2_) * in_XMM8._8_2_;
      uVar42 = ((short)auVar77._10_2_ < (short)in_XMM8._10_2_) * auVar77._10_2_ |
               ((short)auVar77._10_2_ >= (short)in_XMM8._10_2_) * in_XMM8._10_2_;
      uVar159 = ((short)auVar77._12_2_ < (short)in_XMM8._12_2_) * auVar77._12_2_ |
                ((short)auVar77._12_2_ >= (short)in_XMM8._12_2_) * in_XMM8._12_2_;
      uVar44 = ((short)auVar77._14_2_ < (short)in_XMM8._14_2_) * auVar77._14_2_ |
               ((short)auVar77._14_2_ >= (short)in_XMM8._14_2_) * in_XMM8._14_2_;
      uVar289 = ((short)auVar139._0_2_ < (short)uVar433) * auVar139._0_2_ |
                ((short)auVar139._0_2_ >= (short)uVar433) * uVar433;
      uVar293 = ((short)auVar139._2_2_ < (short)uVar441) * auVar139._2_2_ |
                ((short)auVar139._2_2_ >= (short)uVar441) * uVar441;
      uVar297 = ((short)auVar139._4_2_ < (short)uVar443) * auVar139._4_2_ |
                ((short)auVar139._4_2_ >= (short)uVar443) * uVar443;
      uVar302 = ((short)auVar139._6_2_ < (short)uVar445) * auVar139._6_2_ |
                ((short)auVar139._6_2_ >= (short)uVar445) * uVar445;
      uVar307 = ((short)auVar139._8_2_ < (short)uVar225) * auVar139._8_2_ |
                ((short)auVar139._8_2_ >= (short)uVar225) * uVar225;
      uVar196 = ((short)auVar139._10_2_ < (short)uVar241) * auVar139._10_2_ |
                ((short)auVar139._10_2_ >= (short)uVar241) * uVar241;
      uVar206 = ((short)auVar139._12_2_ < (short)uVar249) * auVar139._12_2_ |
                ((short)auVar139._12_2_ >= (short)uVar249) * uVar249;
      uVar216 = ((short)auVar139._14_2_ < (short)uVar257) * auVar139._14_2_ |
                ((short)auVar139._14_2_ >= (short)uVar257) * uVar257;
      in_XMM13._0_2_ =
           ((short)uVar20 < (short)uVar524) * uVar20 | ((short)uVar20 >= (short)uVar524) * uVar524;
      in_XMM13._2_2_ =
           ((short)uVar34 < (short)uVar527) * uVar34 | ((short)uVar34 >= (short)uVar527) * uVar527;
      in_XMM13._4_2_ =
           ((short)uVar37 < (short)uVar528) * uVar37 | ((short)uVar37 >= (short)uVar528) * uVar528;
      in_XMM13._6_2_ =
           ((short)uVar126 < (short)uVar529) * uVar126 |
           ((short)uVar126 >= (short)uVar529) * uVar529;
      in_XMM13._8_2_ =
           ((short)uVar40 < (short)uVar530) * uVar40 | ((short)uVar40 >= (short)uVar530) * uVar530;
      in_XMM13._10_2_ =
           ((short)uVar42 < (short)uVar531) * uVar42 | ((short)uVar42 >= (short)uVar531) * uVar531;
      in_XMM13._12_2_ =
           ((short)uVar159 < (short)uVar532) * uVar159 |
           ((short)uVar159 >= (short)uVar532) * uVar532;
      in_XMM13._14_2_ =
           ((short)uVar44 < (short)uVar533) * uVar44 | ((short)uVar44 >= (short)uVar533) * uVar533;
      uVar289 = ((short)uVar289 < (short)uVar385) * uVar289 |
                ((short)uVar289 >= (short)uVar385) * uVar385;
      uVar293 = ((short)uVar293 < (short)uVar401) * uVar293 |
                ((short)uVar293 >= (short)uVar401) * uVar401;
      uVar297 = ((short)uVar297 < (short)uVar406) * uVar297 |
                ((short)uVar297 >= (short)uVar406) * uVar406;
      uVar302 = ((short)uVar302 < (short)uVar410) * uVar302 |
                ((short)uVar302 >= (short)uVar410) * uVar410;
      uVar307 = ((short)uVar307 < (short)uVar414) * uVar307 |
                ((short)uVar307 >= (short)uVar414) * uVar414;
      uVar196 = ((short)uVar196 < (short)uVar419) * uVar196 |
                ((short)uVar196 >= (short)uVar419) * uVar419;
      uVar206 = ((short)uVar206 < (short)uVar424) * uVar206 |
                ((short)uVar206 >= (short)uVar424) * uVar424;
      uVar216 = ((short)uVar216 < (short)uVar429) * uVar216 |
                ((short)uVar216 >= (short)uVar429) * uVar429;
      uVar20 = ((short)in_XMM13._0_2_ < (short)uVar47) * in_XMM13._0_2_ |
               ((short)in_XMM13._0_2_ >= (short)uVar47) * uVar47;
      uVar34 = ((short)in_XMM13._2_2_ < (short)uVar51) * in_XMM13._2_2_ |
               ((short)in_XMM13._2_2_ >= (short)uVar51) * uVar51;
      uVar37 = ((short)in_XMM13._4_2_ < (short)uVar186) * in_XMM13._4_2_ |
               ((short)in_XMM13._4_2_ >= (short)uVar186) * uVar186;
      uVar126 = ((short)in_XMM13._6_2_ < (short)uVar205) * in_XMM13._6_2_ |
                ((short)in_XMM13._6_2_ >= (short)uVar205) * uVar205;
      uVar40 = ((short)in_XMM13._8_2_ < (short)uVar215) * in_XMM13._8_2_ |
               ((short)in_XMM13._8_2_ >= (short)uVar215) * uVar215;
      uVar42 = ((short)in_XMM13._10_2_ < (short)uVar48) * in_XMM13._10_2_ |
               ((short)in_XMM13._10_2_ >= (short)uVar48) * uVar48;
      uVar159 = ((short)in_XMM13._12_2_ < (short)uVar53) * in_XMM13._12_2_ |
                ((short)in_XMM13._12_2_ >= (short)uVar53) * uVar53;
      uVar44 = ((short)in_XMM13._14_2_ < (short)uVar282) * in_XMM13._14_2_ |
               ((short)in_XMM13._14_2_ >= (short)uVar282) * uVar282;
      in_XMM6._0_2_ =
           ((short)uVar289 < (short)uVar168) * uVar289 |
           ((short)uVar289 >= (short)uVar168) * uVar168;
      in_XMM6._2_2_ =
           ((short)uVar293 < (short)uVar177) * uVar293 |
           ((short)uVar293 >= (short)uVar177) * uVar177;
      in_XMM6._4_2_ =
           ((short)uVar297 < (short)uVar195) * uVar297 |
           ((short)uVar297 >= (short)uVar195) * uVar195;
      in_XMM6._6_2_ =
           ((short)uVar302 < (short)uVar45) * uVar302 | ((short)uVar302 >= (short)uVar45) * uVar45;
      in_XMM6._8_2_ =
           ((short)uVar307 < (short)uVar49) * uVar307 | ((short)uVar307 >= (short)uVar49) * uVar49;
      in_XMM6._10_2_ =
           ((short)uVar196 < (short)uVar265) * uVar196 |
           ((short)uVar196 >= (short)uVar265) * uVar265;
      in_XMM6._12_2_ =
           ((short)uVar206 < (short)uVar52) * uVar206 | ((short)uVar206 >= (short)uVar52) * uVar52;
      in_XMM6._14_2_ =
           ((short)uVar216 < (short)uVar285) * uVar216 |
           ((short)uVar216 >= (short)uVar285) * uVar285;
      auVar229 = psraw(auVar86,0xf);
      in_XMM3 = pmovsxbw(auVar148,0x808080808080808);
      auVar87._0_2_ = auVar86._0_2_ + in_XMM3._0_2_ + auVar229._0_2_;
      auVar87._2_2_ = auVar86._2_2_ + in_XMM3._2_2_ + auVar229._2_2_;
      auVar87._4_2_ = auVar86._4_2_ + in_XMM3._4_2_ + auVar229._4_2_;
      auVar87._6_2_ = auVar86._6_2_ + in_XMM3._6_2_ + auVar229._6_2_;
      auVar87._8_2_ = auVar86._8_2_ + in_XMM3._8_2_ + auVar229._8_2_;
      auVar87._10_2_ = auVar86._10_2_ + in_XMM3._10_2_ + auVar229._10_2_;
      auVar87._12_2_ = auVar86._12_2_ + in_XMM3._12_2_ + auVar229._12_2_;
      auVar87._14_2_ = auVar86._14_2_ + in_XMM3._14_2_ + auVar229._14_2_;
      auVar229 = psraw(auVar466,0xf);
      auVar467._0_2_ = auVar466._0_2_ + in_XMM3._0_2_ + auVar229._0_2_;
      auVar467._2_2_ = auVar466._2_2_ + in_XMM3._2_2_ + auVar229._2_2_;
      auVar467._4_2_ = auVar466._4_2_ + in_XMM3._4_2_ + auVar229._4_2_;
      auVar467._6_2_ = auVar466._6_2_ + in_XMM3._6_2_ + auVar229._6_2_;
      auVar467._8_2_ = auVar466._8_2_ + in_XMM3._8_2_ + auVar229._8_2_;
      auVar467._10_2_ = auVar466._10_2_ + in_XMM3._10_2_ + auVar229._10_2_;
      auVar467._12_2_ = auVar466._12_2_ + in_XMM3._12_2_ + auVar229._12_2_;
      auVar467._14_2_ = auVar466._14_2_ + in_XMM3._14_2_ + auVar229._14_2_;
      auVar229 = psraw(auVar87,4);
      sVar76 = auVar229._0_2_ + sVar76;
      sVar96 = auVar229._2_2_ + sVar96;
      sVar97 = auVar229._4_2_ + sVar97;
      sVar98 = auVar229._6_2_ + sVar98;
      sVar103 = auVar229._8_2_ + sVar103;
      sVar108 = auVar229._10_2_ + sVar108;
      sVar113 = auVar229._12_2_ + sVar113;
      sVar121 = auVar229._14_2_ + sVar121;
      uVar20 = (sVar76 < (short)uVar20) * uVar20 | (ushort)(sVar76 >= (short)uVar20) * sVar76;
      uVar34 = (sVar96 < (short)uVar34) * uVar34 | (ushort)(sVar96 >= (short)uVar34) * sVar96;
      uVar37 = (sVar97 < (short)uVar37) * uVar37 | (ushort)(sVar97 >= (short)uVar37) * sVar97;
      uVar126 = (sVar98 < (short)uVar126) * uVar126 | (ushort)(sVar98 >= (short)uVar126) * sVar98;
      uVar40 = (sVar103 < (short)uVar40) * uVar40 | (ushort)(sVar103 >= (short)uVar40) * sVar103;
      uVar42 = (sVar108 < (short)uVar42) * uVar42 | (ushort)(sVar108 >= (short)uVar42) * sVar108;
      uVar159 = (sVar113 < (short)uVar159) * uVar159 | (ushort)(sVar113 >= (short)uVar159) * sVar113
      ;
      uVar44 = (sVar121 < (short)uVar44) * uVar44 | (ushort)(sVar121 >= (short)uVar44) * sVar121;
      auVar229 = psraw(auVar467,4);
      sVar454 = auVar229._0_2_ + sVar454;
      sVar474 = auVar229._2_2_ + sVar474;
      sVar477 = auVar229._4_2_ + sVar477;
      sVar480 = auVar229._6_2_ + sVar480;
      sVar482 = auVar229._8_2_ + sVar482;
      sVar485 = auVar229._10_2_ + sVar485;
      sVar487 = auVar229._12_2_ + sVar487;
      sVar490 = auVar229._14_2_ + sVar490;
      uVar47 = (sVar454 < (short)in_XMM6._0_2_) * in_XMM6._0_2_ |
               (ushort)(sVar454 >= (short)in_XMM6._0_2_) * sVar454;
      uVar168 = (sVar474 < (short)in_XMM6._2_2_) * in_XMM6._2_2_ |
                (ushort)(sVar474 >= (short)in_XMM6._2_2_) * sVar474;
      uVar51 = (sVar477 < (short)in_XMM6._4_2_) * in_XMM6._4_2_ |
               (ushort)(sVar477 >= (short)in_XMM6._4_2_) * sVar477;
      uVar177 = (sVar480 < (short)in_XMM6._6_2_) * in_XMM6._6_2_ |
                (ushort)(sVar480 >= (short)in_XMM6._6_2_) * sVar480;
      uVar186 = (sVar482 < (short)in_XMM6._8_2_) * in_XMM6._8_2_ |
                (ushort)(sVar482 >= (short)in_XMM6._8_2_) * sVar482;
      uVar195 = (sVar485 < (short)in_XMM6._10_2_) * in_XMM6._10_2_ |
                (ushort)(sVar485 >= (short)in_XMM6._10_2_) * sVar485;
      uVar205 = (sVar487 < (short)in_XMM6._12_2_) * in_XMM6._12_2_ |
                (ushort)(sVar487 >= (short)in_XMM6._12_2_) * sVar487;
      uVar45 = (sVar490 < (short)in_XMM6._14_2_) * in_XMM6._14_2_ |
               (ushort)(sVar490 >= (short)in_XMM6._14_2_) * sVar490;
      *(ushort *)dest =
           ((short)in_XMM1._0_2_ < (short)uVar20) * in_XMM1._0_2_ |
           ((short)in_XMM1._0_2_ >= (short)uVar20) * uVar20;
      *(ushort *)((long)dest + 2) =
           ((short)in_XMM1._2_2_ < (short)uVar34) * in_XMM1._2_2_ |
           ((short)in_XMM1._2_2_ >= (short)uVar34) * uVar34;
      *(ushort *)((long)dest + 4) =
           ((short)in_XMM1._4_2_ < (short)uVar37) * in_XMM1._4_2_ |
           ((short)in_XMM1._4_2_ >= (short)uVar37) * uVar37;
      *(ushort *)((long)dest + 6) =
           ((short)in_XMM1._6_2_ < (short)uVar126) * in_XMM1._6_2_ |
           ((short)in_XMM1._6_2_ >= (short)uVar126) * uVar126;
      *(ushort *)((long)dest + 8) =
           ((short)in_XMM1._8_2_ < (short)uVar40) * in_XMM1._8_2_ |
           ((short)in_XMM1._8_2_ >= (short)uVar40) * uVar40;
      *(ushort *)((long)dest + 10) =
           ((short)in_XMM1._10_2_ < (short)uVar42) * in_XMM1._10_2_ |
           ((short)in_XMM1._10_2_ >= (short)uVar42) * uVar42;
      *(ushort *)((long)dest + 0xc) =
           ((short)in_XMM1._12_2_ < (short)uVar159) * in_XMM1._12_2_ |
           ((short)in_XMM1._12_2_ >= (short)uVar159) * uVar159;
      *(ushort *)((long)dest + 0xe) =
           ((short)in_XMM1._14_2_ < (short)uVar44) * in_XMM1._14_2_ |
           ((short)in_XMM1._14_2_ >= (short)uVar44) * uVar44;
      puVar1 = (ushort *)((long)dest + (long)dstride * 2);
      *puVar1 = ((short)in_XMM7._0_2_ < (short)uVar47) * in_XMM7._0_2_ |
                ((short)in_XMM7._0_2_ >= (short)uVar47) * uVar47;
      puVar1[1] = ((short)in_XMM7._2_2_ < (short)uVar168) * in_XMM7._2_2_ |
                  ((short)in_XMM7._2_2_ >= (short)uVar168) * uVar168;
      puVar1[2] = ((short)in_XMM7._4_2_ < (short)uVar51) * in_XMM7._4_2_ |
                  ((short)in_XMM7._4_2_ >= (short)uVar51) * uVar51;
      puVar1[3] = ((short)in_XMM7._6_2_ < (short)uVar177) * in_XMM7._6_2_ |
                  ((short)in_XMM7._6_2_ >= (short)uVar177) * uVar177;
      puVar1[4] = ((short)in_XMM7._8_2_ < (short)uVar186) * in_XMM7._8_2_ |
                  ((short)in_XMM7._8_2_ >= (short)uVar186) * uVar186;
      puVar1[5] = ((short)in_XMM7._10_2_ < (short)uVar195) * in_XMM7._10_2_ |
                  ((short)in_XMM7._10_2_ >= (short)uVar195) * uVar195;
      puVar1[6] = ((short)in_XMM7._12_2_ < (short)uVar205) * in_XMM7._12_2_ |
                  ((short)in_XMM7._12_2_ >= (short)uVar205) * uVar205;
      puVar1[7] = ((short)in_XMM7._14_2_ < (short)uVar45) * in_XMM7._14_2_ |
                  ((short)in_XMM7._14_2_ >= (short)uVar45) * uVar45;
      dest = (void *)((long)dest + (long)dstride * 2 * 2);
      in = (uint16_t *)((long)in + 0x240);
    }
  }
  else {
    local_158._0_4_ = pri_damping;
    if (pri_strength != 0) {
      iVar6 = 0x1f;
      if (pri_strength != 0) {
        for (; (uint)pri_strength >> iVar6 == 0; iVar6 = iVar6 + -1) {
        }
      }
      local_158._0_4_ = pri_damping - iVar6;
      if (pri_damping < iVar6) {
        local_158._0_4_ = 0;
      }
    }
    uVar16 = sec_damping;
    if (sec_strength != 0) {
      iVar6 = 0x1f;
      if (sec_strength != 0) {
        for (; (uint)sec_strength >> iVar6 == 0; iVar6 = iVar6 + -1) {
        }
      }
      uVar16 = sec_damping - iVar6;
      if (sec_damping < iVar6) {
        uVar16 = 0;
      }
    }
    auVar23 = pshuflw(ZEXT416((uint)pri_strength),ZEXT416((uint)pri_strength),0);
    local_148._4_4_ = auVar23._0_4_;
    local_148._0_4_ = local_148._4_4_;
    local_148._8_4_ = local_148._4_4_;
    local_148._12_4_ = local_148._4_4_;
    auVar23 = pshuflw(ZEXT416((uint)sec_strength),ZEXT416((uint)sec_strength),0);
    local_168._4_4_ = auVar23._0_4_;
    local_168._0_4_ = local_168._4_4_;
    local_168._8_4_ = local_168._4_4_;
    local_168._12_4_ = local_168._4_4_;
    auVar23 = pshuflw(ZEXT416((uint)2),ZEXT416((uint)2),0);
    auVar24 = pshuflw(ZEXT416((uint)1),ZEXT416((uint)1),0);
    lVar13 = (long)dstride;
    for (lVar15 = 0; lVar15 < block_height; lVar15 = lVar15 + 4) {
      uVar2 = *(undefined8 *)in;
      uVar3 = *(undefined8 *)(in + 0x90);
      auVar389._8_8_ = uVar2;
      auVar389._0_8_ = uVar3;
      uVar4 = *(undefined8 *)(in + 0x120);
      uVar5 = *(undefined8 *)(in + 0x1b0);
      auVar323._8_8_ = uVar4;
      auVar323._0_8_ = uVar5;
      local_218._8_8_ = *(undefined8 *)(in + lVar8);
      local_218._0_8_ = *(undefined8 *)(in + lVar8 + 0x90);
      local_228._8_8_ = *(undefined8 *)(in + lVar8 + 0x120);
      local_228._0_8_ = *(undefined8 *)(in + lVar8 + 0x1b0);
      sVar454 = (short)local_218._0_8_;
      sVar21 = (short)uVar3;
      auVar229._0_2_ = sVar454 - sVar21;
      sVar19 = (short)((ulong)local_218._0_8_ >> 0x10);
      sVar35 = (short)((ulong)uVar3 >> 0x10);
      auVar229._2_2_ = sVar19 - sVar35;
      sVar474 = (short)((ulong)local_218._0_8_ >> 0x20);
      sVar38 = (short)((ulong)uVar3 >> 0x20);
      auVar229._4_2_ = sVar474 - sVar38;
      sVar33 = (short)((ulong)local_218._0_8_ >> 0x30);
      sVar477 = (short)((ulong)uVar3 >> 0x30);
      auVar229._6_2_ = sVar33 - sVar477;
      sVar36 = (short)local_218._8_8_;
      sVar480 = (short)uVar2;
      auVar229._8_2_ = sVar36 - sVar480;
      sVar39 = (short)((ulong)local_218._8_8_ >> 0x10);
      sVar482 = (short)((ulong)uVar2 >> 0x10);
      auVar229._10_2_ = sVar39 - sVar482;
      sVar41 = (short)((ulong)local_218._8_8_ >> 0x20);
      sVar43 = (short)((ulong)local_218._8_8_ >> 0x30);
      sVar485 = (short)((ulong)uVar2 >> 0x20);
      auVar229._12_2_ = sVar41 - sVar485;
      sVar487 = (short)((ulong)uVar2 >> 0x30);
      auVar229._14_2_ = sVar43 - sVar487;
      sVar46 = (short)local_228._0_8_;
      sVar490 = (short)uVar5;
      auVar83._0_2_ = sVar46 - sVar490;
      sVar50 = (short)((ulong)local_228._0_8_ >> 0x10);
      sVar63 = (short)((ulong)uVar5 >> 0x10);
      auVar83._2_2_ = sVar50 - sVar63;
      sVar62 = (short)((ulong)local_228._0_8_ >> 0x20);
      sVar65 = (short)((ulong)uVar5 >> 0x20);
      auVar83._4_2_ = sVar62 - sVar65;
      sVar64 = (short)((ulong)local_228._0_8_ >> 0x30);
      sVar67 = (short)((ulong)uVar5 >> 0x30);
      auVar83._6_2_ = sVar64 - sVar67;
      sVar66 = (short)local_228._8_8_;
      sVar69 = (short)uVar4;
      auVar83._8_2_ = sVar66 - sVar69;
      sVar68 = (short)((ulong)local_228._8_8_ >> 0x10);
      sVar71 = (short)((ulong)uVar4 >> 0x10);
      auVar83._10_2_ = sVar68 - sVar71;
      sVar70 = (short)((ulong)local_228._8_8_ >> 0x20);
      sVar72 = (short)((ulong)local_228._8_8_ >> 0x30);
      sVar73 = (short)((ulong)uVar4 >> 0x20);
      auVar83._12_2_ = sVar70 - sVar73;
      sVar75 = (short)((ulong)uVar4 >> 0x30);
      auVar83._14_2_ = sVar72 - sVar75;
      auVar29 = pabsw(auVar323,auVar229);
      auVar229 = psraw(auVar229,0xf);
      local_158._4_4_ = 0;
      uVar20 = auVar29._0_2_;
      auVar149._0_2_ = uVar20 >> local_158._0_8_;
      uVar34 = auVar29._2_2_;
      auVar149._2_2_ = uVar34 >> local_158._0_8_;
      uVar37 = auVar29._4_2_;
      auVar149._4_2_ = uVar37 >> local_158._0_8_;
      uVar126 = auVar29._6_2_;
      auVar149._6_2_ = uVar126 >> local_158._0_8_;
      uVar40 = auVar29._8_2_;
      auVar149._8_2_ = uVar40 >> local_158._0_8_;
      uVar42 = auVar29._10_2_;
      auVar149._10_2_ = uVar42 >> local_158._0_8_;
      uVar159 = auVar29._12_2_;
      uVar44 = auVar29._14_2_;
      auVar149._12_2_ = uVar159 >> local_158._0_8_;
      auVar149._14_2_ = uVar44 >> local_158._0_8_;
      auVar29 = pabsw(in_XMM6,auVar83);
      uVar47 = auVar29._0_2_;
      auVar365._0_2_ = uVar47 >> local_158._0_8_;
      uVar168 = auVar29._2_2_;
      auVar365._2_2_ = uVar168 >> local_158._0_8_;
      uVar51 = auVar29._4_2_;
      auVar365._4_2_ = uVar51 >> local_158._0_8_;
      uVar177 = auVar29._6_2_;
      auVar365._6_2_ = uVar177 >> local_158._0_8_;
      uVar186 = auVar29._8_2_;
      auVar365._8_2_ = uVar186 >> local_158._0_8_;
      uVar195 = auVar29._10_2_;
      auVar365._10_2_ = uVar195 >> local_158._0_8_;
      uVar205 = auVar29._12_2_;
      uVar45 = auVar29._14_2_;
      auVar365._12_2_ = uVar205 >> local_158._0_8_;
      auVar365._14_2_ = uVar45 >> local_158._0_8_;
      auVar29 = psraw(auVar83,0xf);
      auVar357 = psubusw(local_148,auVar149);
      auVar315 = psubusw(local_148,auVar365);
      sVar101 = auVar357._0_2_;
      sVar102 = auVar357._2_2_;
      sVar103 = auVar357._4_2_;
      sVar104 = auVar357._6_2_;
      sVar105 = auVar357._8_2_;
      sVar106 = auVar357._10_2_;
      sVar107 = auVar357._12_2_;
      sVar108 = auVar357._14_2_;
      sVar18 = auVar315._0_2_;
      sVar74 = auVar315._2_2_;
      sVar76 = auVar315._4_2_;
      sVar96 = auVar315._6_2_;
      sVar97 = auVar315._8_2_;
      sVar98 = auVar315._10_2_;
      sVar99 = auVar315._12_2_;
      sVar100 = auVar315._14_2_;
      auVar274._0_2_ =
           (((short)uVar20 < sVar101) * uVar20 | (ushort)((short)uVar20 >= sVar101) * sVar101) +
           auVar229._0_2_;
      auVar274._2_2_ =
           (((short)uVar34 < sVar102) * uVar34 | (ushort)((short)uVar34 >= sVar102) * sVar102) +
           auVar229._2_2_;
      auVar274._4_2_ =
           (((short)uVar37 < sVar103) * uVar37 | (ushort)((short)uVar37 >= sVar103) * sVar103) +
           auVar229._4_2_;
      auVar274._6_2_ =
           (((short)uVar126 < sVar104) * uVar126 | (ushort)((short)uVar126 >= sVar104) * sVar104) +
           auVar229._6_2_;
      auVar274._8_2_ =
           (((short)uVar40 < sVar105) * uVar40 | (ushort)((short)uVar40 >= sVar105) * sVar105) +
           auVar229._8_2_;
      auVar274._10_2_ =
           (((short)uVar42 < sVar106) * uVar42 | (ushort)((short)uVar42 >= sVar106) * sVar106) +
           auVar229._10_2_;
      auVar274._12_2_ =
           (((short)uVar159 < sVar107) * uVar159 | (ushort)((short)uVar159 >= sVar107) * sVar107) +
           auVar229._12_2_;
      auVar274._14_2_ =
           (((short)uVar44 < sVar108) * uVar44 | (ushort)((short)uVar44 >= sVar108) * sVar108) +
           auVar229._14_2_;
      auVar230._0_2_ =
           (((short)uVar47 < sVar18) * uVar47 | (ushort)((short)uVar47 >= sVar18) * sVar18) +
           auVar29._0_2_;
      auVar230._2_2_ =
           (((short)uVar168 < sVar74) * uVar168 | (ushort)((short)uVar168 >= sVar74) * sVar74) +
           auVar29._2_2_;
      auVar230._4_2_ =
           (((short)uVar51 < sVar76) * uVar51 | (ushort)((short)uVar51 >= sVar76) * sVar76) +
           auVar29._4_2_;
      auVar230._6_2_ =
           (((short)uVar177 < sVar96) * uVar177 | (ushort)((short)uVar177 >= sVar96) * sVar96) +
           auVar29._6_2_;
      auVar230._8_2_ =
           (((short)uVar186 < sVar97) * uVar186 | (ushort)((short)uVar186 >= sVar97) * sVar97) +
           auVar29._8_2_;
      auVar230._10_2_ =
           (((short)uVar195 < sVar98) * uVar195 | (ushort)((short)uVar195 >= sVar98) * sVar98) +
           auVar29._10_2_;
      auVar230._12_2_ =
           (((short)uVar205 < sVar99) * uVar205 | (ushort)((short)uVar205 >= sVar99) * sVar99) +
           auVar29._12_2_;
      auVar230._14_2_ =
           (((short)uVar45 < sVar100) * uVar45 | (ushort)((short)uVar45 >= sVar100) * sVar100) +
           auVar29._14_2_;
      auVar274 = auVar274 ^ auVar229;
      auVar230 = auVar230 ^ auVar29;
      uVar2 = *(undefined8 *)(in + -lVar8);
      uVar3 = *(undefined8 *)(in + (0x90 - lVar8));
      auVar29._8_8_ = uVar2;
      auVar29._0_8_ = uVar3;
      uVar4 = *(undefined8 *)(in + (0x120 - lVar8));
      uVar5 = *(undefined8 *)(in + (0x1b0 - lVar8));
      auVar138._8_8_ = uVar4;
      auVar138._0_8_ = uVar5;
      sVar111 = (short)uVar3;
      auVar325._0_2_ = sVar111 - sVar21;
      sVar113 = (short)((ulong)uVar3 >> 0x10);
      auVar325._2_2_ = sVar113 - sVar35;
      sVar118 = (short)((ulong)uVar3 >> 0x20);
      auVar325._4_2_ = sVar118 - sVar38;
      sVar120 = (short)((ulong)uVar3 >> 0x30);
      auVar325._6_2_ = sVar120 - sVar477;
      sVar125 = (short)uVar2;
      auVar325._8_2_ = sVar125 - sVar480;
      sVar128 = (short)((ulong)uVar2 >> 0x10);
      auVar325._10_2_ = sVar128 - sVar482;
      sVar130 = (short)((ulong)uVar2 >> 0x20);
      sVar132 = (short)((ulong)uVar2 >> 0x30);
      auVar325._12_2_ = sVar130 - sVar485;
      auVar325._14_2_ = sVar132 - sVar487;
      sVar160 = (short)uVar5;
      auVar366._0_2_ = sVar160 - sVar490;
      sVar162 = (short)((ulong)uVar5 >> 0x10);
      auVar366._2_2_ = sVar162 - sVar63;
      sVar164 = (short)((ulong)uVar5 >> 0x20);
      auVar366._4_2_ = sVar164 - sVar65;
      sVar169 = (short)((ulong)uVar5 >> 0x30);
      auVar366._6_2_ = sVar169 - sVar67;
      sVar171 = (short)uVar4;
      auVar366._8_2_ = sVar171 - sVar69;
      sVar173 = (short)((ulong)uVar4 >> 0x10);
      auVar366._10_2_ = sVar173 - sVar71;
      sVar178 = (short)((ulong)uVar4 >> 0x20);
      sVar180 = (short)((ulong)uVar4 >> 0x30);
      auVar366._12_2_ = sVar178 - sVar73;
      auVar366._14_2_ = sVar180 - sVar75;
      auVar54 = pabsw(auVar323,auVar325);
      auVar357 = psraw(auVar325,0xf);
      auVar269 = pabsw(auVar389,auVar366);
      auVar136 = psraw(auVar366,0xf);
      uVar20 = auVar54._0_2_;
      auVar88._0_2_ = uVar20 >> local_158._0_8_;
      uVar34 = auVar54._2_2_;
      auVar88._2_2_ = uVar34 >> local_158._0_8_;
      uVar37 = auVar54._4_2_;
      auVar88._4_2_ = uVar37 >> local_158._0_8_;
      uVar126 = auVar54._6_2_;
      auVar88._6_2_ = uVar126 >> local_158._0_8_;
      uVar40 = auVar54._8_2_;
      auVar88._8_2_ = uVar40 >> local_158._0_8_;
      uVar42 = auVar54._10_2_;
      auVar88._10_2_ = uVar42 >> local_158._0_8_;
      uVar159 = auVar54._12_2_;
      uVar44 = auVar54._14_2_;
      auVar88._12_2_ = uVar159 >> local_158._0_8_;
      auVar88._14_2_ = uVar44 >> local_158._0_8_;
      uVar47 = auVar269._0_2_;
      auVar468._0_2_ = uVar47 >> local_158._0_8_;
      uVar168 = auVar269._2_2_;
      auVar468._2_2_ = uVar168 >> local_158._0_8_;
      uVar51 = auVar269._4_2_;
      auVar468._4_2_ = uVar51 >> local_158._0_8_;
      uVar177 = auVar269._6_2_;
      auVar468._6_2_ = uVar177 >> local_158._0_8_;
      uVar186 = auVar269._8_2_;
      auVar468._8_2_ = uVar186 >> local_158._0_8_;
      uVar195 = auVar269._10_2_;
      auVar468._10_2_ = uVar195 >> local_158._0_8_;
      uVar205 = auVar269._12_2_;
      uVar45 = auVar269._14_2_;
      auVar468._12_2_ = uVar205 >> local_158._0_8_;
      auVar468._14_2_ = uVar45 >> local_158._0_8_;
      auVar315 = psubusw(local_148,auVar88);
      auVar229 = psubusw(local_148,auVar468);
      sVar101 = auVar315._0_2_;
      sVar102 = auVar315._2_2_;
      sVar103 = auVar315._4_2_;
      sVar104 = auVar315._6_2_;
      sVar105 = auVar315._8_2_;
      sVar106 = auVar315._10_2_;
      sVar107 = auVar315._12_2_;
      sVar108 = auVar315._14_2_;
      sVar18 = auVar229._0_2_;
      sVar74 = auVar229._2_2_;
      sVar76 = auVar229._4_2_;
      sVar96 = auVar229._6_2_;
      sVar97 = auVar229._8_2_;
      sVar98 = auVar229._10_2_;
      sVar99 = auVar229._12_2_;
      sVar100 = auVar229._14_2_;
      auVar150._0_2_ =
           (((short)uVar20 < sVar101) * uVar20 | (ushort)((short)uVar20 >= sVar101) * sVar101) +
           auVar357._0_2_;
      auVar150._2_2_ =
           (((short)uVar34 < sVar102) * uVar34 | (ushort)((short)uVar34 >= sVar102) * sVar102) +
           auVar357._2_2_;
      auVar150._4_2_ =
           (((short)uVar37 < sVar103) * uVar37 | (ushort)((short)uVar37 >= sVar103) * sVar103) +
           auVar357._4_2_;
      auVar150._6_2_ =
           (((short)uVar126 < sVar104) * uVar126 | (ushort)((short)uVar126 >= sVar104) * sVar104) +
           auVar357._6_2_;
      auVar150._8_2_ =
           (((short)uVar40 < sVar105) * uVar40 | (ushort)((short)uVar40 >= sVar105) * sVar105) +
           auVar357._8_2_;
      auVar150._10_2_ =
           (((short)uVar42 < sVar106) * uVar42 | (ushort)((short)uVar42 >= sVar106) * sVar106) +
           auVar357._10_2_;
      auVar150._12_2_ =
           (((short)uVar159 < sVar107) * uVar159 | (ushort)((short)uVar159 >= sVar107) * sVar107) +
           auVar357._12_2_;
      auVar150._14_2_ =
           (((short)uVar44 < sVar108) * uVar44 | (ushort)((short)uVar44 >= sVar108) * sVar108) +
           auVar357._14_2_;
      auVar89._0_2_ =
           (((short)uVar47 < sVar18) * uVar47 | (ushort)((short)uVar47 >= sVar18) * sVar18) +
           auVar136._0_2_;
      auVar89._2_2_ =
           (((short)uVar168 < sVar74) * uVar168 | (ushort)((short)uVar168 >= sVar74) * sVar74) +
           auVar136._2_2_;
      auVar89._4_2_ =
           (((short)uVar51 < sVar76) * uVar51 | (ushort)((short)uVar51 >= sVar76) * sVar76) +
           auVar136._4_2_;
      auVar89._6_2_ =
           (((short)uVar177 < sVar96) * uVar177 | (ushort)((short)uVar177 >= sVar96) * sVar96) +
           auVar136._6_2_;
      auVar89._8_2_ =
           (((short)uVar186 < sVar97) * uVar186 | (ushort)((short)uVar186 >= sVar97) * sVar97) +
           auVar136._8_2_;
      auVar89._10_2_ =
           (((short)uVar195 < sVar98) * uVar195 | (ushort)((short)uVar195 >= sVar98) * sVar98) +
           auVar136._10_2_;
      auVar89._12_2_ =
           (((short)uVar205 < sVar99) * uVar205 | (ushort)((short)uVar205 >= sVar99) * sVar99) +
           auVar136._12_2_;
      auVar89._14_2_ =
           (((short)uVar45 < sVar100) * uVar45 | (ushort)((short)uVar45 >= sVar100) * sVar100) +
           auVar136._14_2_;
      auVar150 = auVar150 ^ auVar357;
      auVar89 = auVar89 ^ auVar136;
      auVar229 = pshuflw(ZEXT416((uint)cdef_pri_taps[bVar17][0]),
                         ZEXT416((uint)cdef_pri_taps[bVar17][0]),0);
      sVar96 = auVar229._0_2_;
      sVar98 = auVar229._2_2_;
      uVar2 = *(undefined8 *)(in + lVar9);
      uVar3 = *(undefined8 *)(in + lVar9 + 0x90);
      auVar556._8_8_ = uVar2;
      auVar556._0_8_ = uVar3;
      local_238._8_8_ = *(undefined8 *)(in + lVar9 + 0x120);
      local_238._0_8_ = *(undefined8 *)(in + lVar9 + 0x1b0);
      sVar112 = (short)uVar3;
      auVar326._0_2_ = sVar112 - sVar21;
      sVar117 = (short)((ulong)uVar3 >> 0x10);
      auVar326._2_2_ = sVar117 - sVar35;
      sVar119 = (short)((ulong)uVar3 >> 0x20);
      auVar326._4_2_ = sVar119 - sVar38;
      sVar121 = (short)((ulong)uVar3 >> 0x30);
      auVar326._6_2_ = sVar121 - sVar477;
      sVar127 = (short)uVar2;
      auVar326._8_2_ = sVar127 - sVar480;
      sVar129 = (short)((ulong)uVar2 >> 0x10);
      auVar326._10_2_ = sVar129 - sVar482;
      sVar131 = (short)((ulong)uVar2 >> 0x20);
      sVar158 = (short)((ulong)uVar2 >> 0x30);
      auVar326._12_2_ = sVar131 - sVar485;
      auVar326._14_2_ = sVar158 - sVar487;
      sVar161 = (short)local_238._0_8_;
      auVar367._0_2_ = sVar161 - sVar490;
      sVar163 = (short)((ulong)local_238._0_8_ >> 0x10);
      auVar367._2_2_ = sVar163 - sVar63;
      sVar165 = (short)((ulong)local_238._0_8_ >> 0x20);
      auVar367._4_2_ = sVar165 - sVar65;
      sVar170 = (short)((ulong)local_238._0_8_ >> 0x30);
      auVar367._6_2_ = sVar170 - sVar67;
      sVar172 = (short)local_238._8_8_;
      auVar367._8_2_ = sVar172 - sVar69;
      sVar174 = (short)((ulong)local_238._8_8_ >> 0x10);
      auVar367._10_2_ = sVar174 - sVar71;
      sVar179 = (short)((ulong)local_238._8_8_ >> 0x20);
      sVar181 = (short)((ulong)local_238._8_8_ >> 0x30);
      auVar367._12_2_ = sVar179 - sVar73;
      auVar367._14_2_ = sVar181 - sVar75;
      auVar229 = pabsw(auVar54,auVar326);
      auVar357 = pabsw(auVar269,auVar367);
      uVar20 = auVar229._0_2_;
      auVar231._0_2_ = uVar20 >> local_158._0_8_;
      uVar34 = auVar229._2_2_;
      auVar231._2_2_ = uVar34 >> local_158._0_8_;
      uVar37 = auVar229._4_2_;
      auVar231._4_2_ = uVar37 >> local_158._0_8_;
      uVar126 = auVar229._6_2_;
      auVar231._6_2_ = uVar126 >> local_158._0_8_;
      uVar40 = auVar229._8_2_;
      auVar231._8_2_ = uVar40 >> local_158._0_8_;
      uVar42 = auVar229._10_2_;
      auVar231._10_2_ = uVar42 >> local_158._0_8_;
      uVar159 = auVar229._12_2_;
      uVar44 = auVar229._14_2_;
      auVar231._12_2_ = uVar159 >> local_158._0_8_;
      auVar231._14_2_ = uVar44 >> local_158._0_8_;
      auVar315 = psubusw(local_148,auVar231);
      uVar47 = auVar357._0_2_;
      auVar469._0_2_ = uVar47 >> local_158._0_8_;
      uVar168 = auVar357._2_2_;
      auVar469._2_2_ = uVar168 >> local_158._0_8_;
      uVar51 = auVar357._4_2_;
      auVar469._4_2_ = uVar51 >> local_158._0_8_;
      uVar177 = auVar357._6_2_;
      auVar469._6_2_ = uVar177 >> local_158._0_8_;
      uVar186 = auVar357._8_2_;
      auVar469._8_2_ = uVar186 >> local_158._0_8_;
      uVar195 = auVar357._10_2_;
      auVar469._10_2_ = uVar195 >> local_158._0_8_;
      uVar205 = auVar357._12_2_;
      uVar45 = auVar357._14_2_;
      auVar469._12_2_ = uVar205 >> local_158._0_8_;
      auVar469._14_2_ = uVar45 >> local_158._0_8_;
      auVar229 = psubusw(local_148,auVar469);
      auVar357 = psraw(auVar326,0xf);
      auVar136 = psraw(auVar367,0xf);
      sVar103 = auVar315._0_2_;
      sVar104 = auVar315._2_2_;
      sVar105 = auVar315._4_2_;
      sVar106 = auVar315._6_2_;
      sVar107 = auVar315._8_2_;
      sVar108 = auVar315._10_2_;
      sVar109 = auVar315._12_2_;
      sVar110 = auVar315._14_2_;
      sVar18 = auVar229._0_2_;
      sVar74 = auVar229._2_2_;
      sVar76 = auVar229._4_2_;
      sVar97 = auVar229._6_2_;
      sVar99 = auVar229._8_2_;
      sVar100 = auVar229._10_2_;
      sVar101 = auVar229._12_2_;
      sVar102 = auVar229._14_2_;
      auVar275._0_2_ =
           (((short)uVar20 < sVar103) * uVar20 | (ushort)((short)uVar20 >= sVar103) * sVar103) +
           auVar357._0_2_;
      auVar275._2_2_ =
           (((short)uVar34 < sVar104) * uVar34 | (ushort)((short)uVar34 >= sVar104) * sVar104) +
           auVar357._2_2_;
      auVar275._4_2_ =
           (((short)uVar37 < sVar105) * uVar37 | (ushort)((short)uVar37 >= sVar105) * sVar105) +
           auVar357._4_2_;
      auVar275._6_2_ =
           (((short)uVar126 < sVar106) * uVar126 | (ushort)((short)uVar126 >= sVar106) * sVar106) +
           auVar357._6_2_;
      auVar275._8_2_ =
           (((short)uVar40 < sVar107) * uVar40 | (ushort)((short)uVar40 >= sVar107) * sVar107) +
           auVar357._8_2_;
      auVar275._10_2_ =
           (((short)uVar42 < sVar108) * uVar42 | (ushort)((short)uVar42 >= sVar108) * sVar108) +
           auVar357._10_2_;
      auVar275._12_2_ =
           (((short)uVar159 < sVar109) * uVar159 | (ushort)((short)uVar159 >= sVar109) * sVar109) +
           auVar357._12_2_;
      auVar275._14_2_ =
           (((short)uVar44 < sVar110) * uVar44 | (ushort)((short)uVar44 >= sVar110) * sVar110) +
           auVar357._14_2_;
      auVar232._0_2_ =
           (((short)uVar47 < sVar18) * uVar47 | (ushort)((short)uVar47 >= sVar18) * sVar18) +
           auVar136._0_2_;
      auVar232._2_2_ =
           (((short)uVar168 < sVar74) * uVar168 | (ushort)((short)uVar168 >= sVar74) * sVar74) +
           auVar136._2_2_;
      auVar232._4_2_ =
           (((short)uVar51 < sVar76) * uVar51 | (ushort)((short)uVar51 >= sVar76) * sVar76) +
           auVar136._4_2_;
      auVar232._6_2_ =
           (((short)uVar177 < sVar97) * uVar177 | (ushort)((short)uVar177 >= sVar97) * sVar97) +
           auVar136._6_2_;
      auVar232._8_2_ =
           (((short)uVar186 < sVar99) * uVar186 | (ushort)((short)uVar186 >= sVar99) * sVar99) +
           auVar136._8_2_;
      auVar232._10_2_ =
           (((short)uVar195 < sVar100) * uVar195 | (ushort)((short)uVar195 >= sVar100) * sVar100) +
           auVar136._10_2_;
      auVar232._12_2_ =
           (((short)uVar205 < sVar101) * uVar205 | (ushort)((short)uVar205 >= sVar101) * sVar101) +
           auVar136._12_2_;
      auVar232._14_2_ =
           (((short)uVar45 < sVar102) * uVar45 | (ushort)((short)uVar45 >= sVar102) * sVar102) +
           auVar136._14_2_;
      auVar275 = auVar275 ^ auVar357;
      auVar232 = auVar232 ^ auVar136;
      uVar2 = *(undefined8 *)(in + -lVar9);
      uVar3 = *(undefined8 *)(in + (0x90 - lVar9));
      uVar4 = *(undefined8 *)(in + (0x120 - lVar9));
      uVar5 = *(undefined8 *)(in + (0x1b0 - lVar9));
      auVar368._8_8_ = uVar4;
      auVar368._0_8_ = uVar5;
      uVar226 = (ushort)uVar3;
      auVar327._0_2_ = uVar226 - sVar21;
      uVar244 = (ushort)((ulong)uVar3 >> 0x10);
      auVar327._2_2_ = uVar244 - sVar35;
      uVar252 = (ushort)((ulong)uVar3 >> 0x20);
      auVar327._4_2_ = uVar252 - sVar38;
      uVar260 = (ushort)((ulong)uVar3 >> 0x30);
      auVar327._6_2_ = uVar260 - sVar477;
      uVar267 = (ushort)uVar2;
      auVar327._8_2_ = uVar267 - sVar480;
      uVar284 = (ushort)((ulong)uVar2 >> 0x10);
      auVar327._10_2_ = uVar284 - sVar482;
      uVar287 = (ushort)((ulong)uVar2 >> 0x20);
      uVar291 = (ushort)((ulong)uVar2 >> 0x30);
      auVar327._12_2_ = uVar287 - sVar485;
      auVar327._14_2_ = uVar291 - sVar487;
      auVar229 = pabsw(auVar368,auVar327);
      uVar20 = auVar229._0_2_;
      auVar435._0_2_ = uVar20 >> local_158._0_8_;
      uVar34 = auVar229._2_2_;
      auVar435._2_2_ = uVar34 >> local_158._0_8_;
      uVar37 = auVar229._4_2_;
      auVar435._4_2_ = uVar37 >> local_158._0_8_;
      uVar126 = auVar229._6_2_;
      auVar435._6_2_ = uVar126 >> local_158._0_8_;
      uVar40 = auVar229._8_2_;
      auVar435._8_2_ = uVar40 >> local_158._0_8_;
      uVar42 = auVar229._10_2_;
      auVar435._10_2_ = uVar42 >> local_158._0_8_;
      uVar159 = auVar229._12_2_;
      uVar44 = auVar229._14_2_;
      auVar435._12_2_ = uVar159 >> local_158._0_8_;
      auVar435._14_2_ = uVar44 >> local_158._0_8_;
      auVar229 = psubusw(local_148,auVar435);
      uVar240 = (ushort)uVar5;
      auVar436._0_2_ = uVar240 - sVar490;
      uVar248 = (ushort)((ulong)uVar5 >> 0x10);
      auVar436._2_2_ = uVar248 - sVar63;
      uVar256 = (ushort)((ulong)uVar5 >> 0x20);
      auVar436._4_2_ = uVar256 - sVar65;
      uVar264 = (ushort)((ulong)uVar5 >> 0x30);
      auVar436._6_2_ = uVar264 - sVar67;
      uVar313 = (ushort)uVar4;
      auVar436._8_2_ = uVar313 - sVar69;
      uVar332 = (ushort)((ulong)uVar4 >> 0x10);
      auVar436._10_2_ = uVar332 - sVar71;
      uVar335 = (ushort)((ulong)uVar4 >> 0x20);
      uVar338 = (ushort)((ulong)uVar4 >> 0x30);
      auVar436._12_2_ = uVar335 - sVar73;
      auVar436._14_2_ = uVar338 - sVar75;
      auVar315 = pabsw(auVar323,auVar436);
      uVar47 = auVar315._0_2_;
      auVar516._0_2_ = uVar47 >> local_158._0_8_;
      uVar168 = auVar315._2_2_;
      auVar516._2_2_ = uVar168 >> local_158._0_8_;
      uVar51 = auVar315._4_2_;
      auVar516._4_2_ = uVar51 >> local_158._0_8_;
      uVar177 = auVar315._6_2_;
      auVar516._6_2_ = uVar177 >> local_158._0_8_;
      uVar186 = auVar315._8_2_;
      auVar516._8_2_ = uVar186 >> local_158._0_8_;
      uVar195 = auVar315._10_2_;
      auVar516._10_2_ = uVar195 >> local_158._0_8_;
      uVar205 = auVar315._12_2_;
      uVar45 = auVar315._14_2_;
      auVar516._12_2_ = uVar205 >> local_158._0_8_;
      auVar516._14_2_ = uVar45 >> local_158._0_8_;
      auVar315 = psubusw(local_148,auVar516);
      sVar18 = auVar229._0_2_;
      sVar74 = auVar229._2_2_;
      sVar76 = auVar229._4_2_;
      sVar97 = auVar229._6_2_;
      sVar99 = auVar229._8_2_;
      sVar100 = auVar229._10_2_;
      sVar101 = auVar229._12_2_;
      sVar102 = auVar229._14_2_;
      sVar103 = auVar315._0_2_;
      sVar104 = auVar315._2_2_;
      sVar105 = auVar315._4_2_;
      sVar106 = auVar315._6_2_;
      sVar107 = auVar315._8_2_;
      sVar108 = auVar315._10_2_;
      sVar109 = auVar315._12_2_;
      sVar110 = auVar315._14_2_;
      auVar229 = psraw(auVar327,0xf);
      auVar394._0_2_ =
           (((short)uVar20 < sVar18) * uVar20 | (ushort)((short)uVar20 >= sVar18) * sVar18) +
           auVar229._0_2_;
      auVar394._2_2_ =
           (((short)uVar34 < sVar74) * uVar34 | (ushort)((short)uVar34 >= sVar74) * sVar74) +
           auVar229._2_2_;
      auVar394._4_2_ =
           (((short)uVar37 < sVar76) * uVar37 | (ushort)((short)uVar37 >= sVar76) * sVar76) +
           auVar229._4_2_;
      auVar394._6_2_ =
           (((short)uVar126 < sVar97) * uVar126 | (ushort)((short)uVar126 >= sVar97) * sVar97) +
           auVar229._6_2_;
      auVar394._8_2_ =
           (((short)uVar40 < sVar99) * uVar40 | (ushort)((short)uVar40 >= sVar99) * sVar99) +
           auVar229._8_2_;
      auVar394._10_2_ =
           (((short)uVar42 < sVar100) * uVar42 | (ushort)((short)uVar42 >= sVar100) * sVar100) +
           auVar229._10_2_;
      auVar394._12_2_ =
           (((short)uVar159 < sVar101) * uVar159 | (ushort)((short)uVar159 >= sVar101) * sVar101) +
           auVar229._12_2_;
      auVar394._14_2_ =
           (((short)uVar44 < sVar102) * uVar44 | (ushort)((short)uVar44 >= sVar102) * sVar102) +
           auVar229._14_2_;
      auVar394 = auVar394 ^ auVar229;
      auVar229 = psraw(auVar436,0xf);
      auVar470._0_2_ =
           (((short)uVar47 < sVar103) * uVar47 | (ushort)((short)uVar47 >= sVar103) * sVar103) +
           auVar229._0_2_;
      auVar470._2_2_ =
           (((short)uVar168 < sVar104) * uVar168 | (ushort)((short)uVar168 >= sVar104) * sVar104) +
           auVar229._2_2_;
      auVar470._4_2_ =
           (((short)uVar51 < sVar105) * uVar51 | (ushort)((short)uVar51 >= sVar105) * sVar105) +
           auVar229._4_2_;
      auVar470._6_2_ =
           (((short)uVar177 < sVar106) * uVar177 | (ushort)((short)uVar177 >= sVar106) * sVar106) +
           auVar229._6_2_;
      auVar470._8_2_ =
           (((short)uVar186 < sVar107) * uVar186 | (ushort)((short)uVar186 >= sVar107) * sVar107) +
           auVar229._8_2_;
      auVar470._10_2_ =
           (((short)uVar195 < sVar108) * uVar195 | (ushort)((short)uVar195 >= sVar108) * sVar108) +
           auVar229._10_2_;
      auVar470._12_2_ =
           (((short)uVar205 < sVar109) * uVar205 | (ushort)((short)uVar205 >= sVar109) * sVar109) +
           auVar229._12_2_;
      auVar470._14_2_ =
           (((short)uVar45 < sVar110) * uVar45 | (ushort)((short)uVar45 >= sVar110) * sVar110) +
           auVar229._14_2_;
      auVar470 = auVar470 ^ auVar229;
      auVar229 = pshuflw(ZEXT416((uint)cdef_pri_taps[bVar17][1]),
                         ZEXT416((uint)cdef_pri_taps[bVar17][1]),0);
      sVar97 = auVar229._0_2_;
      sVar99 = auVar229._2_2_;
      local_218 = local_218 & _DAT_004c0740;
      sVar18 = local_218._0_2_;
      uVar47 = (ushort)(sVar18 < sVar21) * sVar21 | (ushort)(sVar18 >= sVar21) * sVar18;
      sVar18 = local_218._2_2_;
      uVar168 = (ushort)(sVar18 < sVar35) * sVar35 | (ushort)(sVar18 >= sVar35) * sVar18;
      sVar18 = local_218._4_2_;
      uVar51 = (ushort)(sVar18 < sVar38) * sVar38 | (ushort)(sVar18 >= sVar38) * sVar18;
      sVar18 = local_218._6_2_;
      uVar177 = (ushort)(sVar18 < sVar477) * sVar477 | (ushort)(sVar18 >= sVar477) * sVar18;
      sVar18 = local_218._8_2_;
      uVar186 = (ushort)(sVar18 < sVar480) * sVar480 | (ushort)(sVar18 >= sVar480) * sVar18;
      sVar18 = local_218._10_2_;
      uVar195 = (ushort)(sVar18 < sVar482) * sVar482 | (ushort)(sVar18 >= sVar482) * sVar18;
      sVar18 = local_218._12_2_;
      sVar74 = local_218._14_2_;
      uVar205 = (ushort)(sVar18 < sVar485) * sVar485 | (ushort)(sVar18 >= sVar485) * sVar18;
      uVar45 = (ushort)(sVar74 < sVar487) * sVar487 | (ushort)(sVar74 >= sVar487) * sVar74;
      local_228 = local_228 & _DAT_004c0740;
      sVar18 = local_228._0_2_;
      uVar289 = (ushort)(sVar18 < sVar490) * sVar490 | (ushort)(sVar18 >= sVar490) * sVar18;
      sVar18 = local_228._2_2_;
      uVar293 = (ushort)(sVar18 < sVar63) * sVar63 | (ushort)(sVar18 >= sVar63) * sVar18;
      sVar18 = local_228._4_2_;
      uVar297 = (ushort)(sVar18 < sVar65) * sVar65 | (ushort)(sVar18 >= sVar65) * sVar18;
      sVar18 = local_228._6_2_;
      uVar302 = (ushort)(sVar18 < sVar67) * sVar67 | (ushort)(sVar18 >= sVar67) * sVar18;
      sVar18 = local_228._8_2_;
      uVar307 = (ushort)(sVar18 < sVar69) * sVar69 | (ushort)(sVar18 >= sVar69) * sVar18;
      sVar18 = local_228._10_2_;
      uVar196 = (ushort)(sVar18 < sVar71) * sVar71 | (ushort)(sVar18 >= sVar71) * sVar18;
      sVar18 = local_228._12_2_;
      sVar74 = local_228._14_2_;
      uVar206 = (ushort)(sVar18 < sVar73) * sVar73 | (ushort)(sVar18 >= sVar73) * sVar18;
      uVar216 = (ushort)(sVar74 < sVar75) * sVar75 | (ushort)(sVar74 >= sVar75) * sVar74;
      auVar29 = auVar29 & _DAT_004c0740;
      auVar138 = auVar138 & _DAT_004c0740;
      uVar20 = (ushort)(sVar112 < sVar111) * sVar112 | (ushort)(sVar112 >= sVar111) * sVar111;
      uVar34 = (ushort)(sVar117 < sVar113) * sVar117 | (ushort)(sVar117 >= sVar113) * sVar113;
      uVar37 = (ushort)(sVar119 < sVar118) * sVar119 | (ushort)(sVar119 >= sVar118) * sVar118;
      uVar126 = (ushort)(sVar121 < sVar120) * sVar121 | (ushort)(sVar121 >= sVar120) * sVar120;
      uVar40 = (ushort)(sVar127 < sVar125) * sVar127 | (ushort)(sVar127 >= sVar125) * sVar125;
      uVar42 = (ushort)(sVar129 < sVar128) * sVar129 | (ushort)(sVar129 >= sVar128) * sVar128;
      uVar159 = (ushort)(sVar131 < sVar130) * sVar131 | (ushort)(sVar131 >= sVar130) * sVar130;
      uVar44 = (ushort)(sVar158 < sVar132) * sVar158 | (ushort)(sVar158 >= sVar132) * sVar132;
      auVar556 = auVar556 & _DAT_004c0740;
      sVar18 = auVar29._0_2_;
      sVar74 = auVar556._0_2_;
      uVar215 = (ushort)(sVar74 < sVar18) * sVar18 | (ushort)(sVar74 >= sVar18) * sVar74;
      sVar18 = auVar29._2_2_;
      sVar74 = auVar556._2_2_;
      uVar49 = (ushort)(sVar74 < sVar18) * sVar18 | (ushort)(sVar74 >= sVar18) * sVar74;
      sVar18 = auVar29._4_2_;
      sVar74 = auVar556._4_2_;
      uVar48 = (ushort)(sVar74 < sVar18) * sVar18 | (ushort)(sVar74 >= sVar18) * sVar74;
      sVar18 = auVar29._6_2_;
      sVar74 = auVar556._6_2_;
      uVar265 = (ushort)(sVar74 < sVar18) * sVar18 | (ushort)(sVar74 >= sVar18) * sVar74;
      sVar18 = auVar29._8_2_;
      sVar74 = auVar556._8_2_;
      uVar53 = (ushort)(sVar74 < sVar18) * sVar18 | (ushort)(sVar74 >= sVar18) * sVar74;
      sVar18 = auVar29._10_2_;
      sVar74 = auVar556._10_2_;
      uVar52 = (ushort)(sVar74 < sVar18) * sVar18 | (ushort)(sVar74 >= sVar18) * sVar74;
      sVar18 = auVar29._12_2_;
      sVar74 = auVar556._12_2_;
      sVar76 = auVar556._14_2_;
      uVar282 = (ushort)(sVar74 < sVar18) * sVar18 | (ushort)(sVar74 >= sVar18) * sVar74;
      sVar18 = auVar29._14_2_;
      uVar285 = (ushort)(sVar76 < sVar18) * sVar18 | (ushort)(sVar76 >= sVar18) * sVar76;
      uVar552 = ((short)uVar215 < (short)uVar47) * uVar47 |
                ((short)uVar215 >= (short)uVar47) * uVar215;
      uVar558 = ((short)uVar49 < (short)uVar168) * uVar168 |
                ((short)uVar49 >= (short)uVar168) * uVar49;
      uVar559 = ((short)uVar48 < (short)uVar51) * uVar51 | ((short)uVar48 >= (short)uVar51) * uVar48
      ;
      uVar560 = ((short)uVar265 < (short)uVar177) * uVar177 |
                ((short)uVar265 >= (short)uVar177) * uVar265;
      uVar561 = ((short)uVar53 < (short)uVar186) * uVar186 |
                ((short)uVar53 >= (short)uVar186) * uVar53;
      uVar562 = ((short)uVar52 < (short)uVar195) * uVar195 |
                ((short)uVar52 >= (short)uVar195) * uVar52;
      uVar563 = ((short)uVar282 < (short)uVar205) * uVar205 |
                ((short)uVar282 >= (short)uVar205) * uVar282;
      uVar564 = ((short)uVar285 < (short)uVar45) * uVar45 |
                ((short)uVar285 >= (short)uVar45) * uVar285;
      uVar47 = (ushort)(sVar161 < sVar160) * sVar161 | (ushort)(sVar161 >= sVar160) * sVar160;
      uVar168 = (ushort)(sVar163 < sVar162) * sVar163 | (ushort)(sVar163 >= sVar162) * sVar162;
      uVar51 = (ushort)(sVar165 < sVar164) * sVar165 | (ushort)(sVar165 >= sVar164) * sVar164;
      uVar177 = (ushort)(sVar170 < sVar169) * sVar170 | (ushort)(sVar170 >= sVar169) * sVar169;
      uVar186 = (ushort)(sVar172 < sVar171) * sVar172 | (ushort)(sVar172 >= sVar171) * sVar171;
      uVar195 = (ushort)(sVar174 < sVar173) * sVar174 | (ushort)(sVar174 >= sVar173) * sVar173;
      uVar205 = (ushort)(sVar179 < sVar178) * sVar179 | (ushort)(sVar179 >= sVar178) * sVar178;
      uVar45 = (ushort)(sVar181 < sVar180) * sVar181 | (ushort)(sVar181 >= sVar180) * sVar180;
      local_238 = local_238 & _DAT_004c0740;
      sVar18 = auVar138._0_2_;
      sVar74 = local_238._0_2_;
      uVar215 = (ushort)(sVar74 < sVar18) * sVar18 | (ushort)(sVar74 >= sVar18) * sVar74;
      sVar18 = auVar138._2_2_;
      sVar74 = local_238._2_2_;
      uVar49 = (ushort)(sVar74 < sVar18) * sVar18 | (ushort)(sVar74 >= sVar18) * sVar74;
      sVar18 = auVar138._4_2_;
      sVar74 = local_238._4_2_;
      uVar48 = (ushort)(sVar74 < sVar18) * sVar18 | (ushort)(sVar74 >= sVar18) * sVar74;
      sVar18 = auVar138._6_2_;
      sVar74 = local_238._6_2_;
      uVar265 = (ushort)(sVar74 < sVar18) * sVar18 | (ushort)(sVar74 >= sVar18) * sVar74;
      sVar18 = auVar138._8_2_;
      sVar74 = local_238._8_2_;
      uVar53 = (ushort)(sVar74 < sVar18) * sVar18 | (ushort)(sVar74 >= sVar18) * sVar74;
      sVar18 = auVar138._10_2_;
      sVar74 = local_238._10_2_;
      uVar52 = (ushort)(sVar74 < sVar18) * sVar18 | (ushort)(sVar74 >= sVar18) * sVar74;
      sVar18 = auVar138._12_2_;
      sVar74 = local_238._12_2_;
      sVar76 = local_238._14_2_;
      uVar282 = (ushort)(sVar74 < sVar18) * sVar18 | (ushort)(sVar74 >= sVar18) * sVar74;
      sVar18 = auVar138._14_2_;
      uVar285 = (ushort)(sVar76 < sVar18) * sVar18 | (ushort)(sVar76 >= sVar18) * sVar76;
      uVar225 = ((short)uVar215 < (short)uVar289) * uVar289 |
                ((short)uVar215 >= (short)uVar289) * uVar215;
      uVar257 = ((short)uVar49 < (short)uVar293) * uVar293 |
                ((short)uVar49 >= (short)uVar293) * uVar49;
      uVar414 = ((short)uVar48 < (short)uVar297) * uVar297 |
                ((short)uVar48 >= (short)uVar297) * uVar48;
      uVar443 = ((short)uVar265 < (short)uVar302) * uVar302 |
                ((short)uVar265 >= (short)uVar302) * uVar265;
      uVar524 = ((short)uVar53 < (short)uVar307) * uVar307 |
                ((short)uVar53 >= (short)uVar307) * uVar53;
      uVar532 = ((short)uVar52 < (short)uVar196) * uVar196 |
                ((short)uVar52 >= (short)uVar196) * uVar52;
      uVar114 = ((short)uVar282 < (short)uVar206) * uVar206 |
                ((short)uVar282 >= (short)uVar206) * uVar282;
      uVar122 = ((short)uVar285 < (short)uVar216) * uVar216 |
                ((short)uVar285 >= (short)uVar216) * uVar285;
      uVar215 = (ushort)(sVar21 < sVar454) * sVar21 | (ushort)(sVar21 >= sVar454) * sVar454;
      uVar49 = (ushort)(sVar35 < sVar19) * sVar35 | (ushort)(sVar35 >= sVar19) * sVar19;
      uVar48 = (ushort)(sVar38 < sVar474) * sVar38 | (ushort)(sVar38 >= sVar474) * sVar474;
      uVar265 = (ushort)(sVar477 < sVar33) * sVar477 | (ushort)(sVar477 >= sVar33) * sVar33;
      uVar53 = (ushort)(sVar480 < sVar36) * sVar480 | (ushort)(sVar480 >= sVar36) * sVar36;
      uVar52 = (ushort)(sVar482 < sVar39) * sVar482 | (ushort)(sVar482 >= sVar39) * sVar39;
      uVar282 = (ushort)(sVar485 < sVar41) * sVar485 | (ushort)(sVar485 >= sVar41) * sVar41;
      uVar285 = (ushort)(sVar487 < sVar43) * sVar487 | (ushort)(sVar487 >= sVar43) * sVar43;
      uVar289 = (ushort)(sVar490 < sVar46) * sVar490 | (ushort)(sVar490 >= sVar46) * sVar46;
      uVar293 = (ushort)(sVar63 < sVar50) * sVar63 | (ushort)(sVar63 >= sVar50) * sVar50;
      uVar297 = (ushort)(sVar65 < sVar62) * sVar65 | (ushort)(sVar65 >= sVar62) * sVar62;
      uVar302 = (ushort)(sVar67 < sVar64) * sVar67 | (ushort)(sVar67 >= sVar64) * sVar64;
      uVar307 = (ushort)(sVar69 < sVar66) * sVar69 | (ushort)(sVar69 >= sVar66) * sVar66;
      uVar196 = (ushort)(sVar71 < sVar68) * sVar71 | (ushort)(sVar71 >= sVar68) * sVar68;
      uVar206 = (ushort)(sVar73 < sVar70) * sVar73 | (ushort)(sVar73 >= sVar70) * sVar70;
      uVar216 = (ushort)(sVar75 < sVar72) * sVar75 | (ushort)(sVar75 >= sVar72) * sVar72;
      uVar238 = ((short)uVar20 < (short)uVar215) * uVar20 |
                ((short)uVar20 >= (short)uVar215) * uVar215;
      uVar261 = ((short)uVar34 < (short)uVar49) * uVar34 | ((short)uVar34 >= (short)uVar49) * uVar49
      ;
      uVar419 = ((short)uVar37 < (short)uVar48) * uVar37 | ((short)uVar37 >= (short)uVar48) * uVar48
      ;
      uVar445 = ((short)uVar126 < (short)uVar265) * uVar126 |
                ((short)uVar126 >= (short)uVar265) * uVar265;
      uVar527 = ((short)uVar40 < (short)uVar53) * uVar40 | ((short)uVar40 >= (short)uVar53) * uVar53
      ;
      uVar533 = ((short)uVar42 < (short)uVar52) * uVar42 | ((short)uVar42 >= (short)uVar52) * uVar52
      ;
      uVar115 = ((short)uVar159 < (short)uVar282) * uVar159 |
                ((short)uVar159 >= (short)uVar282) * uVar282;
      uVar123 = ((short)uVar44 < (short)uVar285) * uVar44 |
                ((short)uVar44 >= (short)uVar285) * uVar285;
      uVar133 = ((short)uVar47 < (short)uVar289) * uVar47 |
                ((short)uVar47 >= (short)uVar289) * uVar289;
      uVar166 = ((short)uVar168 < (short)uVar293) * uVar168 |
                ((short)uVar168 >= (short)uVar293) * uVar293;
      uVar175 = ((short)uVar51 < (short)uVar297) * uVar51 |
                ((short)uVar51 >= (short)uVar297) * uVar297;
      uVar184 = ((short)uVar177 < (short)uVar302) * uVar177 |
                ((short)uVar177 >= (short)uVar302) * uVar302;
      uVar193 = ((short)uVar186 < (short)uVar307) * uVar186 |
                ((short)uVar186 >= (short)uVar307) * uVar307;
      uVar203 = ((short)uVar195 < (short)uVar196) * uVar195 |
                ((short)uVar195 >= (short)uVar196) * uVar196;
      uVar213 = ((short)uVar205 < (short)uVar206) * uVar205 |
                ((short)uVar205 >= (short)uVar206) * uVar206;
      uVar223 = ((short)uVar45 < (short)uVar216) * uVar45 |
                ((short)uVar45 >= (short)uVar216) * uVar216;
      uVar2 = *(undefined8 *)(in + lVar10);
      uVar3 = *(undefined8 *)(in + lVar10 + 0x90);
      auVar140._8_8_ = uVar2;
      auVar140._0_8_ = uVar3;
      uVar4 = *(undefined8 *)(in + lVar10 + 0x120);
      uVar5 = *(undefined8 *)(in + lVar10 + 0x1b0);
      uVar47 = (ushort)uVar3;
      auVar315._0_2_ = uVar47 - sVar21;
      uVar51 = (ushort)((ulong)uVar3 >> 0x10);
      auVar315._2_2_ = uVar51 - sVar35;
      uVar186 = (ushort)((ulong)uVar3 >> 0x20);
      auVar315._4_2_ = uVar186 - sVar38;
      uVar205 = (ushort)((ulong)uVar3 >> 0x30);
      auVar315._6_2_ = uVar205 - sVar477;
      uVar215 = (ushort)uVar2;
      auVar315._8_2_ = uVar215 - sVar480;
      uVar48 = (ushort)((ulong)uVar2 >> 0x10);
      auVar315._10_2_ = uVar48 - sVar482;
      uVar53 = (ushort)((ulong)uVar2 >> 0x20);
      uVar282 = (ushort)((ulong)uVar2 >> 0x30);
      auVar315._12_2_ = uVar53 - sVar485;
      auVar315._14_2_ = uVar282 - sVar487;
      auVar229 = pabsw(auVar140,auVar315);
      local_198 = (ulong)uVar16;
      uVar20 = auVar229._0_2_;
      auVar151._0_2_ = uVar20 >> local_198;
      uVar34 = auVar229._2_2_;
      auVar151._2_2_ = uVar34 >> local_198;
      uVar37 = auVar229._4_2_;
      auVar151._4_2_ = uVar37 >> local_198;
      uVar126 = auVar229._6_2_;
      auVar151._6_2_ = uVar126 >> local_198;
      uVar40 = auVar229._8_2_;
      auVar151._8_2_ = uVar40 >> local_198;
      uVar42 = auVar229._10_2_;
      auVar151._10_2_ = uVar42 >> local_198;
      uVar159 = auVar229._12_2_;
      uVar44 = auVar229._14_2_;
      auVar151._12_2_ = uVar159 >> local_198;
      auVar151._14_2_ = uVar44 >> local_198;
      auVar229 = psubusw(local_168,auVar151);
      uVar342 = (ushort)uVar5;
      auVar233._0_2_ = uVar342 - sVar490;
      uVar345 = (ushort)((ulong)uVar5 >> 0x10);
      auVar233._2_2_ = uVar345 - sVar63;
      uVar349 = (ushort)((ulong)uVar5 >> 0x20);
      auVar233._4_2_ = uVar349 - sVar65;
      uVar353 = (ushort)((ulong)uVar5 >> 0x30);
      auVar233._6_2_ = uVar353 - sVar67;
      uVar417 = (ushort)uVar4;
      auVar233._8_2_ = uVar417 - sVar69;
      uVar422 = (ushort)((ulong)uVar4 >> 0x10);
      auVar233._10_2_ = uVar422 - sVar71;
      uVar427 = (ushort)((ulong)uVar4 >> 0x20);
      uVar432 = (ushort)((ulong)uVar4 >> 0x30);
      auVar233._12_2_ = uVar427 - sVar73;
      auVar233._14_2_ = uVar432 - sVar75;
      auVar29 = pabsw(auVar138,auVar233);
      uVar168 = auVar29._0_2_;
      auVar328._0_2_ = uVar168 >> local_198;
      uVar177 = auVar29._2_2_;
      auVar328._2_2_ = uVar177 >> local_198;
      uVar195 = auVar29._4_2_;
      auVar328._4_2_ = uVar195 >> local_198;
      uVar45 = auVar29._6_2_;
      auVar328._6_2_ = uVar45 >> local_198;
      uVar49 = auVar29._8_2_;
      auVar328._8_2_ = uVar49 >> local_198;
      uVar265 = auVar29._10_2_;
      auVar328._10_2_ = uVar265 >> local_198;
      uVar52 = auVar29._12_2_;
      uVar285 = auVar29._14_2_;
      auVar328._12_2_ = uVar52 >> local_198;
      auVar328._14_2_ = uVar285 >> local_198;
      auVar29 = psubusw(local_168,auVar328);
      sVar18 = auVar229._0_2_;
      sVar454 = auVar229._2_2_;
      sVar19 = auVar229._4_2_;
      sVar474 = auVar229._6_2_;
      sVar33 = auVar229._8_2_;
      sVar36 = auVar229._10_2_;
      sVar39 = auVar229._12_2_;
      sVar41 = auVar229._14_2_;
      sVar43 = auVar29._0_2_;
      sVar46 = auVar29._2_2_;
      sVar50 = auVar29._4_2_;
      sVar62 = auVar29._6_2_;
      sVar64 = auVar29._8_2_;
      sVar66 = auVar29._10_2_;
      sVar68 = auVar29._12_2_;
      sVar70 = auVar29._14_2_;
      auVar229 = psraw(auVar315,0xf);
      auVar29 = psraw(auVar233,0xf);
      auVar90._0_2_ =
           (((short)uVar20 < sVar18) * uVar20 | (ushort)((short)uVar20 >= sVar18) * sVar18) +
           auVar229._0_2_;
      auVar90._2_2_ =
           (((short)uVar34 < sVar454) * uVar34 | (ushort)((short)uVar34 >= sVar454) * sVar454) +
           auVar229._2_2_;
      auVar90._4_2_ =
           (((short)uVar37 < sVar19) * uVar37 | (ushort)((short)uVar37 >= sVar19) * sVar19) +
           auVar229._4_2_;
      auVar90._6_2_ =
           (((short)uVar126 < sVar474) * uVar126 | (ushort)((short)uVar126 >= sVar474) * sVar474) +
           auVar229._6_2_;
      auVar90._8_2_ =
           (((short)uVar40 < sVar33) * uVar40 | (ushort)((short)uVar40 >= sVar33) * sVar33) +
           auVar229._8_2_;
      auVar90._10_2_ =
           (((short)uVar42 < sVar36) * uVar42 | (ushort)((short)uVar42 >= sVar36) * sVar36) +
           auVar229._10_2_;
      auVar90._12_2_ =
           (((short)uVar159 < sVar39) * uVar159 | (ushort)((short)uVar159 >= sVar39) * sVar39) +
           auVar229._12_2_;
      auVar90._14_2_ =
           (((short)uVar44 < sVar41) * uVar44 | (ushort)((short)uVar44 >= sVar41) * sVar41) +
           auVar229._14_2_;
      auVar152._0_2_ =
           (((short)uVar168 < sVar43) * uVar168 | (ushort)((short)uVar168 >= sVar43) * sVar43) +
           auVar29._0_2_;
      auVar152._2_2_ =
           (((short)uVar177 < sVar46) * uVar177 | (ushort)((short)uVar177 >= sVar46) * sVar46) +
           auVar29._2_2_;
      auVar152._4_2_ =
           (((short)uVar195 < sVar50) * uVar195 | (ushort)((short)uVar195 >= sVar50) * sVar50) +
           auVar29._4_2_;
      auVar152._6_2_ =
           (((short)uVar45 < sVar62) * uVar45 | (ushort)((short)uVar45 >= sVar62) * sVar62) +
           auVar29._6_2_;
      auVar152._8_2_ =
           (((short)uVar49 < sVar64) * uVar49 | (ushort)((short)uVar49 >= sVar64) * sVar64) +
           auVar29._8_2_;
      auVar152._10_2_ =
           (((short)uVar265 < sVar66) * uVar265 | (ushort)((short)uVar265 >= sVar66) * sVar66) +
           auVar29._10_2_;
      auVar152._12_2_ =
           (((short)uVar52 < sVar68) * uVar52 | (ushort)((short)uVar52 >= sVar68) * sVar68) +
           auVar29._12_2_;
      auVar152._14_2_ =
           (((short)uVar285 < sVar70) * uVar285 | (ushort)((short)uVar285 >= sVar70) * sVar70) +
           auVar29._14_2_;
      auVar90 = auVar90 ^ auVar229;
      auVar152 = auVar152 ^ auVar29;
      uVar2 = *(undefined8 *)(in + -lVar10);
      uVar3 = *(undefined8 *)(in + (0x90 - lVar10));
      uVar4 = *(undefined8 *)(in + (0x120 - lVar10));
      uVar5 = *(undefined8 *)(in + (0x1b0 - lVar10));
      uVar301 = (ushort)uVar3;
      auVar276._0_2_ = uVar301 - sVar21;
      uVar306 = (ushort)((ulong)uVar3 >> 0x10);
      auVar276._2_2_ = uVar306 - sVar35;
      uVar314 = (ushort)((ulong)uVar3 >> 0x20);
      auVar276._4_2_ = uVar314 - sVar38;
      uVar339 = (ushort)((ulong)uVar3 >> 0x30);
      auVar276._6_2_ = uVar339 - sVar477;
      uVar346 = (ushort)uVar2;
      auVar276._8_2_ = uVar346 - sVar480;
      uVar354 = (ushort)((ulong)uVar2 >> 0x10);
      auVar276._10_2_ = uVar354 - sVar482;
      uVar388 = (ushort)((ulong)uVar2 >> 0x20);
      uVar404 = (ushort)((ulong)uVar2 >> 0x30);
      auVar276._12_2_ = uVar388 - sVar485;
      auVar276._14_2_ = uVar404 - sVar487;
      uVar249 = (ushort)uVar5;
      auVar234._0_2_ = uVar249 - sVar490;
      uVar406 = (ushort)((ulong)uVar5 >> 0x10);
      auVar234._2_2_ = uVar406 - sVar63;
      uVar433 = (ushort)((ulong)uVar5 >> 0x20);
      auVar234._4_2_ = uVar433 - sVar65;
      uVar506 = (ushort)((ulong)uVar5 >> 0x30);
      auVar234._6_2_ = uVar506 - sVar67;
      uVar530 = (ushort)uVar4;
      auVar234._8_2_ = uVar530 - sVar69;
      uVar549 = (ushort)((ulong)uVar4 >> 0x10);
      auVar234._10_2_ = uVar549 - sVar71;
      uVar288 = (ushort)((ulong)uVar4 >> 0x20);
      uVar292 = (ushort)((ulong)uVar4 >> 0x30);
      auVar234._12_2_ = uVar288 - sVar73;
      auVar234._14_2_ = uVar292 - sVar75;
      auVar29 = pabsw(auVar328,auVar276);
      uVar20 = auVar29._0_2_;
      auVar357._0_2_ = uVar20 >> local_198;
      uVar34 = auVar29._2_2_;
      auVar357._2_2_ = uVar34 >> local_198;
      uVar37 = auVar29._4_2_;
      auVar357._4_2_ = uVar37 >> local_198;
      uVar126 = auVar29._6_2_;
      auVar357._6_2_ = uVar126 >> local_198;
      uVar40 = auVar29._8_2_;
      auVar357._8_2_ = uVar40 >> local_198;
      uVar42 = auVar29._10_2_;
      auVar357._10_2_ = uVar42 >> local_198;
      uVar159 = auVar29._12_2_;
      uVar44 = auVar29._14_2_;
      auVar357._12_2_ = uVar159 >> local_198;
      auVar357._14_2_ = uVar44 >> local_198;
      auVar315 = pabsw(auVar323,auVar234);
      uVar168 = auVar315._0_2_;
      auVar437._0_2_ = uVar168 >> local_198;
      uVar177 = auVar315._2_2_;
      auVar437._2_2_ = uVar177 >> local_198;
      uVar195 = auVar315._4_2_;
      auVar437._4_2_ = uVar195 >> local_198;
      uVar45 = auVar315._6_2_;
      auVar437._6_2_ = uVar45 >> local_198;
      uVar49 = auVar315._8_2_;
      auVar437._8_2_ = uVar49 >> local_198;
      uVar265 = auVar315._10_2_;
      auVar437._10_2_ = uVar265 >> local_198;
      uVar52 = auVar315._12_2_;
      uVar285 = auVar315._14_2_;
      auVar437._12_2_ = uVar52 >> local_198;
      auVar437._14_2_ = uVar285 >> local_198;
      auVar229 = psubusw(local_168,auVar357);
      auVar357 = psubusw(local_168,auVar437);
      sVar18 = auVar229._0_2_;
      sVar454 = auVar229._2_2_;
      sVar19 = auVar229._4_2_;
      sVar474 = auVar229._6_2_;
      sVar33 = auVar229._8_2_;
      sVar36 = auVar229._10_2_;
      sVar39 = auVar229._12_2_;
      sVar41 = auVar229._14_2_;
      sVar43 = auVar357._0_2_;
      sVar46 = auVar357._2_2_;
      sVar50 = auVar357._4_2_;
      sVar62 = auVar357._6_2_;
      sVar64 = auVar357._8_2_;
      sVar66 = auVar357._10_2_;
      sVar68 = auVar357._12_2_;
      sVar70 = auVar357._14_2_;
      auVar229 = psraw(auVar276,0xf);
      auVar392._0_2_ =
           (((short)uVar20 < sVar18) * uVar20 | (ushort)((short)uVar20 >= sVar18) * sVar18) +
           auVar229._0_2_;
      auVar392._2_2_ =
           (((short)uVar34 < sVar454) * uVar34 | (ushort)((short)uVar34 >= sVar454) * sVar454) +
           auVar229._2_2_;
      auVar392._4_2_ =
           (((short)uVar37 < sVar19) * uVar37 | (ushort)((short)uVar37 >= sVar19) * sVar19) +
           auVar229._4_2_;
      auVar392._6_2_ =
           (((short)uVar126 < sVar474) * uVar126 | (ushort)((short)uVar126 >= sVar474) * sVar474) +
           auVar229._6_2_;
      auVar392._8_2_ =
           (((short)uVar40 < sVar33) * uVar40 | (ushort)((short)uVar40 >= sVar33) * sVar33) +
           auVar229._8_2_;
      auVar392._10_2_ =
           (((short)uVar42 < sVar36) * uVar42 | (ushort)((short)uVar42 >= sVar36) * sVar36) +
           auVar229._10_2_;
      auVar392._12_2_ =
           (((short)uVar159 < sVar39) * uVar159 | (ushort)((short)uVar159 >= sVar39) * sVar39) +
           auVar229._12_2_;
      auVar392._14_2_ =
           (((short)uVar44 < sVar41) * uVar44 | (ushort)((short)uVar44 >= sVar41) * sVar41) +
           auVar229._14_2_;
      auVar392 = auVar392 ^ auVar229;
      auVar229 = psraw(auVar234,0xf);
      auVar395._0_2_ =
           (((short)uVar168 < sVar43) * uVar168 | (ushort)((short)uVar168 >= sVar43) * sVar43) +
           auVar229._0_2_;
      auVar395._2_2_ =
           (((short)uVar177 < sVar46) * uVar177 | (ushort)((short)uVar177 >= sVar46) * sVar46) +
           auVar229._2_2_;
      auVar395._4_2_ =
           (((short)uVar195 < sVar50) * uVar195 | (ushort)((short)uVar195 >= sVar50) * sVar50) +
           auVar229._4_2_;
      auVar395._6_2_ =
           (((short)uVar45 < sVar62) * uVar45 | (ushort)((short)uVar45 >= sVar62) * sVar62) +
           auVar229._6_2_;
      auVar395._8_2_ =
           (((short)uVar49 < sVar64) * uVar49 | (ushort)((short)uVar49 >= sVar64) * sVar64) +
           auVar229._8_2_;
      auVar395._10_2_ =
           (((short)uVar265 < sVar66) * uVar265 | (ushort)((short)uVar265 >= sVar66) * sVar66) +
           auVar229._10_2_;
      auVar395._12_2_ =
           (((short)uVar52 < sVar68) * uVar52 | (ushort)((short)uVar52 >= sVar68) * sVar68) +
           auVar229._12_2_;
      auVar395._14_2_ =
           (((short)uVar285 < sVar70) * uVar285 | (ushort)((short)uVar285 >= sVar70) * sVar70) +
           auVar229._14_2_;
      auVar395 = auVar395 ^ auVar229;
      uVar2 = *(undefined8 *)(in + lVar14);
      uVar3 = *(undefined8 *)(in + lVar14 + 0x90);
      uVar4 = *(undefined8 *)(in + lVar14 + 0x120);
      uVar5 = *(undefined8 *)(in + lVar14 + 0x1b0);
      uVar455 = (ushort)uVar3;
      auVar235._0_2_ = uVar455 - sVar21;
      uVar478 = (ushort)((ulong)uVar3 >> 0x10);
      auVar235._2_2_ = uVar478 - sVar35;
      uVar242 = (ushort)((ulong)uVar3 >> 0x20);
      auVar235._4_2_ = uVar242 - sVar38;
      uVar246 = (ushort)((ulong)uVar3 >> 0x30);
      auVar235._6_2_ = uVar246 - sVar477;
      uVar250 = (ushort)uVar2;
      auVar235._8_2_ = uVar250 - sVar480;
      uVar254 = (ushort)((ulong)uVar2 >> 0x10);
      auVar235._10_2_ = uVar254 - sVar482;
      uVar258 = (ushort)((ulong)uVar2 >> 0x20);
      uVar262 = (ushort)((ulong)uVar2 >> 0x30);
      auVar235._12_2_ = uVar258 - sVar485;
      auVar235._14_2_ = uVar262 - sVar487;
      uVar266 = (ushort)uVar5;
      auVar277._0_2_ = uVar266 - sVar490;
      uVar283 = (ushort)((ulong)uVar5 >> 0x10);
      auVar277._2_2_ = uVar283 - sVar63;
      uVar286 = (ushort)((ulong)uVar5 >> 0x20);
      auVar277._4_2_ = uVar286 - sVar65;
      uVar290 = (ushort)((ulong)uVar5 >> 0x30);
      auVar277._6_2_ = uVar290 - sVar67;
      uVar294 = (ushort)uVar4;
      auVar277._8_2_ = uVar294 - sVar69;
      uVar298 = (ushort)((ulong)uVar4 >> 0x10);
      auVar277._10_2_ = uVar298 - sVar71;
      uVar303 = (ushort)((ulong)uVar4 >> 0x20);
      uVar308 = (ushort)((ulong)uVar4 >> 0x30);
      auVar277._12_2_ = uVar303 - sVar73;
      auVar277._14_2_ = uVar308 - sVar75;
      auVar229 = pabsw(auVar29,auVar235);
      uVar20 = auVar229._0_2_;
      auVar91._0_2_ = uVar20 >> local_198;
      uVar34 = auVar229._2_2_;
      auVar91._2_2_ = uVar34 >> local_198;
      uVar37 = auVar229._4_2_;
      auVar91._4_2_ = uVar37 >> local_198;
      uVar126 = auVar229._6_2_;
      auVar91._6_2_ = uVar126 >> local_198;
      uVar40 = auVar229._8_2_;
      auVar91._8_2_ = uVar40 >> local_198;
      uVar42 = auVar229._10_2_;
      auVar91._10_2_ = uVar42 >> local_198;
      uVar159 = auVar229._12_2_;
      uVar44 = auVar229._14_2_;
      auVar91._12_2_ = uVar159 >> local_198;
      auVar91._14_2_ = uVar44 >> local_198;
      auVar229 = pabsw(auVar315,auVar277);
      uVar168 = auVar229._0_2_;
      auVar438._0_2_ = uVar168 >> local_198;
      uVar177 = auVar229._2_2_;
      auVar438._2_2_ = uVar177 >> local_198;
      uVar195 = auVar229._4_2_;
      auVar438._4_2_ = uVar195 >> local_198;
      uVar45 = auVar229._6_2_;
      auVar438._6_2_ = uVar45 >> local_198;
      uVar49 = auVar229._8_2_;
      auVar438._8_2_ = uVar49 >> local_198;
      uVar265 = auVar229._10_2_;
      auVar438._10_2_ = uVar265 >> local_198;
      uVar52 = auVar229._12_2_;
      uVar285 = auVar229._14_2_;
      auVar438._12_2_ = uVar52 >> local_198;
      auVar438._14_2_ = uVar285 >> local_198;
      auVar29 = psubusw(local_168,auVar91);
      auVar229 = psubusw(local_168,auVar438);
      sVar43 = auVar29._0_2_;
      sVar46 = auVar29._2_2_;
      sVar50 = auVar29._4_2_;
      sVar62 = auVar29._6_2_;
      sVar64 = auVar29._8_2_;
      sVar66 = auVar29._10_2_;
      sVar68 = auVar29._12_2_;
      sVar70 = auVar29._14_2_;
      sVar18 = auVar229._0_2_;
      sVar454 = auVar229._2_2_;
      sVar19 = auVar229._4_2_;
      sVar474 = auVar229._6_2_;
      sVar33 = auVar229._8_2_;
      sVar36 = auVar229._10_2_;
      sVar39 = auVar229._12_2_;
      sVar41 = auVar229._14_2_;
      auVar229 = psraw(auVar235,0xf);
      auVar153._0_2_ =
           (((short)uVar20 < sVar43) * uVar20 | (ushort)((short)uVar20 >= sVar43) * sVar43) +
           auVar229._0_2_;
      auVar153._2_2_ =
           (((short)uVar34 < sVar46) * uVar34 | (ushort)((short)uVar34 >= sVar46) * sVar46) +
           auVar229._2_2_;
      auVar153._4_2_ =
           (((short)uVar37 < sVar50) * uVar37 | (ushort)((short)uVar37 >= sVar50) * sVar50) +
           auVar229._4_2_;
      auVar153._6_2_ =
           (((short)uVar126 < sVar62) * uVar126 | (ushort)((short)uVar126 >= sVar62) * sVar62) +
           auVar229._6_2_;
      auVar153._8_2_ =
           (((short)uVar40 < sVar64) * uVar40 | (ushort)((short)uVar40 >= sVar64) * sVar64) +
           auVar229._8_2_;
      auVar153._10_2_ =
           (((short)uVar42 < sVar66) * uVar42 | (ushort)((short)uVar42 >= sVar66) * sVar66) +
           auVar229._10_2_;
      auVar153._12_2_ =
           (((short)uVar159 < sVar68) * uVar159 | (ushort)((short)uVar159 >= sVar68) * sVar68) +
           auVar229._12_2_;
      auVar153._14_2_ =
           (((short)uVar44 < sVar70) * uVar44 | (ushort)((short)uVar44 >= sVar70) * sVar70) +
           auVar229._14_2_;
      auVar153 = auVar153 ^ auVar229;
      auVar229 = psraw(auVar277,0xf);
      auVar92._0_2_ =
           (((short)uVar168 < sVar18) * uVar168 | (ushort)((short)uVar168 >= sVar18) * sVar18) +
           auVar229._0_2_;
      auVar92._2_2_ =
           (((short)uVar177 < sVar454) * uVar177 | (ushort)((short)uVar177 >= sVar454) * sVar454) +
           auVar229._2_2_;
      auVar92._4_2_ =
           (((short)uVar195 < sVar19) * uVar195 | (ushort)((short)uVar195 >= sVar19) * sVar19) +
           auVar229._4_2_;
      auVar92._6_2_ =
           (((short)uVar45 < sVar474) * uVar45 | (ushort)((short)uVar45 >= sVar474) * sVar474) +
           auVar229._6_2_;
      auVar92._8_2_ =
           (((short)uVar49 < sVar33) * uVar49 | (ushort)((short)uVar49 >= sVar33) * sVar33) +
           auVar229._8_2_;
      auVar92._10_2_ =
           (((short)uVar265 < sVar36) * uVar265 | (ushort)((short)uVar265 >= sVar36) * sVar36) +
           auVar229._10_2_;
      auVar92._12_2_ =
           (((short)uVar52 < sVar39) * uVar52 | (ushort)((short)uVar52 >= sVar39) * sVar39) +
           auVar229._12_2_;
      auVar92._14_2_ =
           (((short)uVar285 < sVar41) * uVar285 | (ushort)((short)uVar285 >= sVar41) * sVar41) +
           auVar229._14_2_;
      auVar92 = auVar92 ^ auVar229;
      uVar2 = *(undefined8 *)(in + -lVar14);
      uVar3 = *(undefined8 *)(in + (0x90 - lVar14));
      uVar4 = *(undefined8 *)(in + (0x120 - lVar14));
      uVar5 = *(undefined8 *)(in + (0x1b0 - lVar14));
      auVar278._8_8_ = uVar4;
      auVar278._0_8_ = uVar5;
      uVar475 = (ushort)uVar3;
      auVar236._0_2_ = uVar475 - sVar21;
      uVar239 = (ushort)((ulong)uVar3 >> 0x10);
      auVar236._2_2_ = uVar239 - sVar35;
      uVar243 = (ushort)((ulong)uVar3 >> 0x20);
      auVar236._4_2_ = uVar243 - sVar38;
      uVar247 = (ushort)((ulong)uVar3 >> 0x30);
      auVar236._6_2_ = uVar247 - sVar477;
      uVar251 = (ushort)uVar2;
      auVar236._8_2_ = uVar251 - sVar480;
      uVar255 = (ushort)((ulong)uVar2 >> 0x10);
      auVar236._10_2_ = uVar255 - sVar482;
      uVar259 = (ushort)((ulong)uVar2 >> 0x20);
      uVar263 = (ushort)((ulong)uVar2 >> 0x30);
      auVar236._12_2_ = uVar259 - sVar485;
      auVar236._14_2_ = uVar263 - sVar487;
      auVar29 = pabsw(auVar278,auVar236);
      uVar20 = auVar29._0_2_;
      auVar329._0_2_ = uVar20 >> local_198;
      uVar34 = auVar29._2_2_;
      auVar329._2_2_ = uVar34 >> local_198;
      uVar37 = auVar29._4_2_;
      auVar329._4_2_ = uVar37 >> local_198;
      uVar126 = auVar29._6_2_;
      auVar329._6_2_ = uVar126 >> local_198;
      uVar40 = auVar29._8_2_;
      auVar329._8_2_ = uVar40 >> local_198;
      uVar42 = auVar29._10_2_;
      auVar329._10_2_ = uVar42 >> local_198;
      uVar159 = auVar29._12_2_;
      uVar44 = auVar29._14_2_;
      auVar329._12_2_ = uVar159 >> local_198;
      auVar329._14_2_ = uVar44 >> local_198;
      auVar229 = psubusw(local_168,auVar329);
      uVar434 = (ushort)uVar5;
      auVar439._0_2_ = uVar434 - sVar490;
      uVar442 = (ushort)((ulong)uVar5 >> 0x10);
      auVar439._2_2_ = uVar442 - sVar63;
      uVar444 = (ushort)((ulong)uVar5 >> 0x20);
      auVar439._4_2_ = uVar444 - sVar65;
      uVar446 = (ushort)((ulong)uVar5 >> 0x30);
      auVar439._6_2_ = uVar446 - sVar67;
      uVar447 = (ushort)uVar4;
      auVar439._8_2_ = uVar447 - sVar69;
      uVar448 = (ushort)((ulong)uVar4 >> 0x10);
      auVar439._10_2_ = uVar448 - sVar71;
      uVar449 = (ushort)((ulong)uVar4 >> 0x20);
      uVar451 = (ushort)((ulong)uVar4 >> 0x30);
      auVar439._12_2_ = uVar449 - sVar73;
      auVar439._14_2_ = uVar451 - sVar75;
      auVar315 = pabsw(auVar389,auVar439);
      uVar168 = auVar315._0_2_;
      auVar540._0_2_ = uVar168 >> local_198;
      uVar177 = auVar315._2_2_;
      auVar540._2_2_ = uVar177 >> local_198;
      uVar195 = auVar315._4_2_;
      auVar540._4_2_ = uVar195 >> local_198;
      uVar45 = auVar315._6_2_;
      auVar540._6_2_ = uVar45 >> local_198;
      uVar49 = auVar315._8_2_;
      auVar540._8_2_ = uVar49 >> local_198;
      uVar265 = auVar315._10_2_;
      auVar540._10_2_ = uVar265 >> local_198;
      uVar52 = auVar315._12_2_;
      uVar285 = auVar315._14_2_;
      auVar540._12_2_ = uVar52 >> local_198;
      auVar540._14_2_ = uVar285 >> local_198;
      auVar315 = psubusw(local_168,auVar540);
      sVar43 = auVar229._0_2_;
      sVar46 = auVar229._2_2_;
      sVar50 = auVar229._4_2_;
      sVar62 = auVar229._6_2_;
      sVar64 = auVar229._8_2_;
      sVar66 = auVar229._10_2_;
      sVar68 = auVar229._12_2_;
      sVar70 = auVar229._14_2_;
      sVar18 = auVar315._0_2_;
      sVar454 = auVar315._2_2_;
      sVar19 = auVar315._4_2_;
      sVar474 = auVar315._6_2_;
      sVar33 = auVar315._8_2_;
      sVar36 = auVar315._10_2_;
      sVar39 = auVar315._12_2_;
      sVar41 = auVar315._14_2_;
      auVar229 = psraw(auVar236,0xf);
      auVar557._0_2_ =
           (((short)uVar20 < sVar43) * uVar20 | (ushort)((short)uVar20 >= sVar43) * sVar43) +
           auVar229._0_2_;
      auVar557._2_2_ =
           (((short)uVar34 < sVar46) * uVar34 | (ushort)((short)uVar34 >= sVar46) * sVar46) +
           auVar229._2_2_;
      auVar557._4_2_ =
           (((short)uVar37 < sVar50) * uVar37 | (ushort)((short)uVar37 >= sVar50) * sVar50) +
           auVar229._4_2_;
      auVar557._6_2_ =
           (((short)uVar126 < sVar62) * uVar126 | (ushort)((short)uVar126 >= sVar62) * sVar62) +
           auVar229._6_2_;
      auVar557._8_2_ =
           (((short)uVar40 < sVar64) * uVar40 | (ushort)((short)uVar40 >= sVar64) * sVar64) +
           auVar229._8_2_;
      auVar557._10_2_ =
           (((short)uVar42 < sVar66) * uVar42 | (ushort)((short)uVar42 >= sVar66) * sVar66) +
           auVar229._10_2_;
      auVar557._12_2_ =
           (((short)uVar159 < sVar68) * uVar159 | (ushort)((short)uVar159 >= sVar68) * sVar68) +
           auVar229._12_2_;
      auVar557._14_2_ =
           (((short)uVar44 < sVar70) * uVar44 | (ushort)((short)uVar44 >= sVar70) * sVar70) +
           auVar229._14_2_;
      auVar557 = auVar557 ^ auVar229;
      auVar315 = psraw(auVar439,0xf);
      auVar497._0_2_ =
           (((short)uVar168 < sVar18) * uVar168 | (ushort)((short)uVar168 >= sVar18) * sVar18) +
           auVar315._0_2_;
      auVar497._2_2_ =
           (((short)uVar177 < sVar454) * uVar177 | (ushort)((short)uVar177 >= sVar454) * sVar454) +
           auVar315._2_2_;
      auVar497._4_2_ =
           (((short)uVar195 < sVar19) * uVar195 | (ushort)((short)uVar195 >= sVar19) * sVar19) +
           auVar315._4_2_;
      auVar497._6_2_ =
           (((short)uVar45 < sVar474) * uVar45 | (ushort)((short)uVar45 >= sVar474) * sVar474) +
           auVar315._6_2_;
      auVar497._8_2_ =
           (((short)uVar49 < sVar33) * uVar49 | (ushort)((short)uVar49 >= sVar33) * sVar33) +
           auVar315._8_2_;
      auVar497._10_2_ =
           (((short)uVar265 < sVar36) * uVar265 | (ushort)((short)uVar265 >= sVar36) * sVar36) +
           auVar315._10_2_;
      auVar497._12_2_ =
           (((short)uVar52 < sVar39) * uVar52 | (ushort)((short)uVar52 >= sVar39) * sVar39) +
           auVar315._12_2_;
      auVar497._14_2_ =
           (((short)uVar285 < sVar41) * uVar285 | (ushort)((short)uVar285 >= sVar41) * sVar41) +
           auVar315._14_2_;
      auVar497 = auVar497 ^ auVar315;
      local_178 = auVar23._0_2_;
      sStack_176 = auVar23._2_2_;
      uVar2 = *(undefined8 *)(in + lVar11);
      uVar3 = *(undefined8 *)(in + lVar11 + 0x90);
      uVar4 = *(undefined8 *)(in + lVar11 + 0x120);
      uVar5 = *(undefined8 *)(in + lVar11 + 0x1b0);
      uVar241 = (ushort)uVar3;
      auVar93._0_2_ = uVar241 - sVar21;
      uVar385 = (ushort)((ulong)uVar3 >> 0x10);
      auVar93._2_2_ = uVar385 - sVar35;
      uVar424 = (ushort)((ulong)uVar3 >> 0x20);
      auVar93._4_2_ = uVar424 - sVar38;
      uVar502 = (ushort)((ulong)uVar3 >> 0x30);
      auVar93._6_2_ = uVar502 - sVar477;
      uVar528 = (ushort)uVar2;
      auVar93._8_2_ = uVar528 - sVar480;
      uVar545 = (ushort)((ulong)uVar2 >> 0x10);
      auVar93._10_2_ = uVar545 - sVar482;
      uVar350 = (ushort)((ulong)uVar2 >> 0x20);
      uVar483 = (ushort)((ulong)uVar2 >> 0x30);
      auVar93._12_2_ = uVar350 - sVar485;
      auVar93._14_2_ = uVar483 - sVar487;
      uVar488 = (ushort)uVar5;
      auVar154._0_2_ = uVar488 - sVar490;
      uVar167 = (ushort)((ulong)uVar5 >> 0x10);
      auVar154._2_2_ = uVar167 - sVar63;
      uVar176 = (ushort)((ulong)uVar5 >> 0x20);
      auVar154._4_2_ = uVar176 - sVar65;
      uVar185 = (ushort)((ulong)uVar5 >> 0x30);
      auVar154._6_2_ = uVar185 - sVar67;
      uVar194 = (ushort)uVar4;
      auVar154._8_2_ = uVar194 - sVar69;
      uVar204 = (ushort)((ulong)uVar4 >> 0x10);
      auVar154._10_2_ = uVar204 - sVar71;
      uVar214 = (ushort)((ulong)uVar4 >> 0x20);
      uVar224 = (ushort)((ulong)uVar4 >> 0x30);
      auVar154._12_2_ = uVar214 - sVar73;
      auVar154._14_2_ = uVar224 - sVar75;
      auVar229 = pabsw(auVar229,auVar93);
      uVar20 = auVar229._0_2_;
      auVar136._0_2_ = uVar20 >> local_198;
      uVar34 = auVar229._2_2_;
      auVar136._2_2_ = uVar34 >> local_198;
      uVar37 = auVar229._4_2_;
      auVar136._4_2_ = uVar37 >> local_198;
      uVar126 = auVar229._6_2_;
      auVar136._6_2_ = uVar126 >> local_198;
      uVar40 = auVar229._8_2_;
      auVar136._8_2_ = uVar40 >> local_198;
      uVar42 = auVar229._10_2_;
      auVar136._10_2_ = uVar42 >> local_198;
      uVar159 = auVar229._12_2_;
      uVar44 = auVar229._14_2_;
      auVar136._12_2_ = uVar159 >> local_198;
      auVar136._14_2_ = uVar44 >> local_198;
      auVar229 = pabsw(auVar29,auVar154);
      uVar168 = auVar229._0_2_;
      auVar396._0_2_ = uVar168 >> local_198;
      uVar177 = auVar229._2_2_;
      auVar396._2_2_ = uVar177 >> local_198;
      uVar195 = auVar229._4_2_;
      auVar396._4_2_ = uVar195 >> local_198;
      uVar45 = auVar229._6_2_;
      auVar396._6_2_ = uVar45 >> local_198;
      uVar49 = auVar229._8_2_;
      auVar396._8_2_ = uVar49 >> local_198;
      uVar265 = auVar229._10_2_;
      auVar396._10_2_ = uVar265 >> local_198;
      uVar52 = auVar229._12_2_;
      uVar285 = auVar229._14_2_;
      auVar396._12_2_ = uVar52 >> local_198;
      auVar396._14_2_ = uVar285 >> local_198;
      auVar29 = psubusw(local_168,auVar136);
      auVar229 = psubusw(local_168,auVar396);
      sVar43 = auVar29._0_2_;
      sVar46 = auVar29._2_2_;
      sVar50 = auVar29._4_2_;
      sVar62 = auVar29._6_2_;
      sVar64 = auVar29._8_2_;
      sVar66 = auVar29._10_2_;
      sVar68 = auVar29._12_2_;
      sVar70 = auVar29._14_2_;
      sVar18 = auVar229._0_2_;
      sVar454 = auVar229._2_2_;
      sVar19 = auVar229._4_2_;
      sVar474 = auVar229._6_2_;
      sVar33 = auVar229._8_2_;
      sVar36 = auVar229._10_2_;
      sVar39 = auVar229._12_2_;
      sVar41 = auVar229._14_2_;
      auVar229 = psraw(auVar93,0xf);
      auVar317._0_2_ =
           (((short)uVar20 < sVar43) * uVar20 | (ushort)((short)uVar20 >= sVar43) * sVar43) +
           auVar229._0_2_;
      auVar317._2_2_ =
           (((short)uVar34 < sVar46) * uVar34 | (ushort)((short)uVar34 >= sVar46) * sVar46) +
           auVar229._2_2_;
      auVar317._4_2_ =
           (((short)uVar37 < sVar50) * uVar37 | (ushort)((short)uVar37 >= sVar50) * sVar50) +
           auVar229._4_2_;
      auVar317._6_2_ =
           (((short)uVar126 < sVar62) * uVar126 | (ushort)((short)uVar126 >= sVar62) * sVar62) +
           auVar229._6_2_;
      auVar317._8_2_ =
           (((short)uVar40 < sVar64) * uVar40 | (ushort)((short)uVar40 >= sVar64) * sVar64) +
           auVar229._8_2_;
      auVar317._10_2_ =
           (((short)uVar42 < sVar66) * uVar42 | (ushort)((short)uVar42 >= sVar66) * sVar66) +
           auVar229._10_2_;
      auVar317._12_2_ =
           (((short)uVar159 < sVar68) * uVar159 | (ushort)((short)uVar159 >= sVar68) * sVar68) +
           auVar229._12_2_;
      auVar317._14_2_ =
           (((short)uVar44 < sVar70) * uVar44 | (ushort)((short)uVar44 >= sVar70) * sVar70) +
           auVar229._14_2_;
      auVar317 = auVar317 ^ auVar229;
      auVar229 = psraw(auVar154,0xf);
      auVar54._0_2_ =
           (((short)uVar168 < sVar18) * uVar168 | (ushort)((short)uVar168 >= sVar18) * sVar18) +
           auVar229._0_2_;
      auVar54._2_2_ =
           (((short)uVar177 < sVar454) * uVar177 | (ushort)((short)uVar177 >= sVar454) * sVar454) +
           auVar229._2_2_;
      auVar54._4_2_ =
           (((short)uVar195 < sVar19) * uVar195 | (ushort)((short)uVar195 >= sVar19) * sVar19) +
           auVar229._4_2_;
      auVar54._6_2_ =
           (((short)uVar45 < sVar474) * uVar45 | (ushort)((short)uVar45 >= sVar474) * sVar474) +
           auVar229._6_2_;
      auVar54._8_2_ =
           (((short)uVar49 < sVar33) * uVar49 | (ushort)((short)uVar49 >= sVar33) * sVar33) +
           auVar229._8_2_;
      auVar54._10_2_ =
           (((short)uVar265 < sVar36) * uVar265 | (ushort)((short)uVar265 >= sVar36) * sVar36) +
           auVar229._10_2_;
      auVar54._12_2_ =
           (((short)uVar52 < sVar39) * uVar52 | (ushort)((short)uVar52 >= sVar39) * sVar39) +
           auVar229._12_2_;
      auVar54._14_2_ =
           (((short)uVar285 < sVar41) * uVar285 | (ushort)((short)uVar285 >= sVar41) * sVar41) +
           auVar229._14_2_;
      auVar54 = auVar54 ^ auVar229;
      uVar2 = *(undefined8 *)(in + -lVar11);
      uVar3 = *(undefined8 *)(in + (0x90 - lVar11));
      uVar4 = *(undefined8 *)(in + (0x120 - lVar11));
      uVar5 = *(undefined8 *)(in + (0x1b0 - lVar11));
      auVar155._8_8_ = uVar4;
      auVar155._0_8_ = uVar5;
      uVar245 = (ushort)uVar3;
      auVar94._0_2_ = uVar245 - sVar21;
      uVar401 = (ushort)((ulong)uVar3 >> 0x10);
      auVar94._2_2_ = uVar401 - sVar35;
      uVar429 = (ushort)((ulong)uVar3 >> 0x20);
      auVar94._4_2_ = uVar429 - sVar38;
      uVar504 = (ushort)((ulong)uVar3 >> 0x30);
      auVar94._6_2_ = uVar504 - sVar477;
      uVar529 = (ushort)uVar2;
      auVar94._8_2_ = uVar529 - sVar480;
      uVar547 = (ushort)((ulong)uVar2 >> 0x10);
      auVar94._10_2_ = uVar547 - sVar482;
      uVar116 = (ushort)((ulong)uVar2 >> 0x20);
      uVar124 = (ushort)((ulong)uVar2 >> 0x30);
      auVar94._12_2_ = uVar116 - sVar485;
      auVar94._14_2_ = uVar124 - sVar487;
      auVar229 = pabsw(auVar155,auVar94);
      uVar20 = auVar229._0_2_;
      auVar279._0_2_ = uVar20 >> local_198;
      uVar34 = auVar229._2_2_;
      auVar279._2_2_ = uVar34 >> local_198;
      uVar37 = auVar229._4_2_;
      auVar279._4_2_ = uVar37 >> local_198;
      uVar126 = auVar229._6_2_;
      auVar279._6_2_ = uVar126 >> local_198;
      uVar40 = auVar229._8_2_;
      auVar279._8_2_ = uVar40 >> local_198;
      uVar42 = auVar229._10_2_;
      auVar279._10_2_ = uVar42 >> local_198;
      uVar159 = auVar229._12_2_;
      uVar44 = auVar229._14_2_;
      auVar279._12_2_ = uVar159 >> local_198;
      auVar279._14_2_ = uVar44 >> local_198;
      auVar229 = psubusw(local_168,auVar279);
      uVar386 = (ushort)uVar5;
      auVar397._0_2_ = uVar386 - sVar490;
      uVar402 = (ushort)((ulong)uVar5 >> 0x10);
      auVar397._2_2_ = uVar402 - sVar63;
      uVar407 = (ushort)((ulong)uVar5 >> 0x20);
      auVar397._4_2_ = uVar407 - sVar65;
      uVar411 = (ushort)((ulong)uVar5 >> 0x30);
      auVar397._6_2_ = uVar411 - sVar67;
      uVar415 = (ushort)uVar4;
      auVar397._8_2_ = uVar415 - sVar69;
      uVar420 = (ushort)((ulong)uVar4 >> 0x10);
      auVar397._10_2_ = uVar420 - sVar71;
      uVar425 = (ushort)((ulong)uVar4 >> 0x20);
      uVar430 = (ushort)((ulong)uVar4 >> 0x30);
      auVar397._12_2_ = uVar425 - sVar73;
      auVar397._14_2_ = uVar430 - sVar75;
      auVar315 = pabsw(auVar315,auVar397);
      uVar168 = auVar315._0_2_;
      auVar471._0_2_ = uVar168 >> local_198;
      uVar177 = auVar315._2_2_;
      auVar471._2_2_ = uVar177 >> local_198;
      uVar195 = auVar315._4_2_;
      auVar471._4_2_ = uVar195 >> local_198;
      uVar45 = auVar315._6_2_;
      auVar471._6_2_ = uVar45 >> local_198;
      uVar49 = auVar315._8_2_;
      auVar471._8_2_ = uVar49 >> local_198;
      uVar265 = auVar315._10_2_;
      auVar471._10_2_ = uVar265 >> local_198;
      uVar52 = auVar315._12_2_;
      uVar285 = auVar315._14_2_;
      auVar471._12_2_ = uVar52 >> local_198;
      auVar471._14_2_ = uVar285 >> local_198;
      auVar29 = psubusw(local_168,auVar471);
      sVar18 = auVar229._0_2_;
      sVar454 = auVar229._2_2_;
      sVar19 = auVar229._4_2_;
      sVar474 = auVar229._6_2_;
      sVar33 = auVar229._8_2_;
      sVar36 = auVar229._10_2_;
      sVar39 = auVar229._12_2_;
      sVar41 = auVar229._14_2_;
      sVar43 = auVar29._0_2_;
      sVar46 = auVar29._2_2_;
      sVar50 = auVar29._4_2_;
      sVar62 = auVar29._6_2_;
      sVar64 = auVar29._8_2_;
      sVar66 = auVar29._10_2_;
      sVar68 = auVar29._12_2_;
      sVar70 = auVar29._14_2_;
      auVar229 = psraw(auVar94,0xf);
      auVar237._0_2_ =
           (((short)uVar20 < sVar18) * uVar20 | (ushort)((short)uVar20 >= sVar18) * sVar18) +
           auVar229._0_2_;
      auVar237._2_2_ =
           (((short)uVar34 < sVar454) * uVar34 | (ushort)((short)uVar34 >= sVar454) * sVar454) +
           auVar229._2_2_;
      auVar237._4_2_ =
           (((short)uVar37 < sVar19) * uVar37 | (ushort)((short)uVar37 >= sVar19) * sVar19) +
           auVar229._4_2_;
      auVar237._6_2_ =
           (((short)uVar126 < sVar474) * uVar126 | (ushort)((short)uVar126 >= sVar474) * sVar474) +
           auVar229._6_2_;
      auVar237._8_2_ =
           (((short)uVar40 < sVar33) * uVar40 | (ushort)((short)uVar40 >= sVar33) * sVar33) +
           auVar229._8_2_;
      auVar237._10_2_ =
           (((short)uVar42 < sVar36) * uVar42 | (ushort)((short)uVar42 >= sVar36) * sVar36) +
           auVar229._10_2_;
      auVar237._12_2_ =
           (((short)uVar159 < sVar39) * uVar159 | (ushort)((short)uVar159 >= sVar39) * sVar39) +
           auVar229._12_2_;
      auVar237._14_2_ =
           (((short)uVar44 < sVar41) * uVar44 | (ushort)((short)uVar44 >= sVar41) * sVar41) +
           auVar229._14_2_;
      auVar237 = auVar237 ^ auVar229;
      auVar229 = psraw(auVar397,0xf);
      auVar369._0_2_ =
           (((short)uVar168 < sVar43) * uVar168 | (ushort)((short)uVar168 >= sVar43) * sVar43) +
           auVar229._0_2_;
      auVar369._2_2_ =
           (((short)uVar177 < sVar46) * uVar177 | (ushort)((short)uVar177 >= sVar46) * sVar46) +
           auVar229._2_2_;
      auVar369._4_2_ =
           (((short)uVar195 < sVar50) * uVar195 | (ushort)((short)uVar195 >= sVar50) * sVar50) +
           auVar229._4_2_;
      auVar369._6_2_ =
           (((short)uVar45 < sVar62) * uVar45 | (ushort)((short)uVar45 >= sVar62) * sVar62) +
           auVar229._6_2_;
      auVar369._8_2_ =
           (((short)uVar49 < sVar64) * uVar49 | (ushort)((short)uVar49 >= sVar64) * sVar64) +
           auVar229._8_2_;
      auVar369._10_2_ =
           (((short)uVar265 < sVar66) * uVar265 | (ushort)((short)uVar265 >= sVar66) * sVar66) +
           auVar229._10_2_;
      auVar369._12_2_ =
           (((short)uVar52 < sVar68) * uVar52 | (ushort)((short)uVar52 >= sVar68) * sVar68) +
           auVar229._12_2_;
      auVar369._14_2_ =
           (((short)uVar285 < sVar70) * uVar285 | (ushort)((short)uVar285 >= sVar70) * sVar70) +
           auVar229._14_2_;
      auVar369 = auVar369 ^ auVar229;
      uVar2 = *(undefined8 *)(in + lVar12);
      uVar3 = *(undefined8 *)(in + lVar12 + 0x90);
      uVar4 = *(undefined8 *)(in + lVar12 + 0x120);
      uVar5 = *(undefined8 *)(in + lVar12 + 0x1b0);
      auVar537._8_8_ = uVar4;
      auVar537._0_8_ = uVar5;
      uVar168 = (ushort)uVar3;
      auVar269._0_2_ = uVar168 - sVar21;
      uVar177 = (ushort)((ulong)uVar3 >> 0x10);
      auVar269._2_2_ = uVar177 - sVar35;
      uVar195 = (ushort)((ulong)uVar3 >> 0x20);
      auVar269._4_2_ = uVar195 - sVar38;
      uVar45 = (ushort)((ulong)uVar3 >> 0x30);
      auVar269._6_2_ = uVar45 - sVar477;
      uVar49 = (ushort)uVar2;
      auVar269._8_2_ = uVar49 - sVar480;
      uVar265 = (ushort)((ulong)uVar2 >> 0x10);
      auVar269._10_2_ = uVar265 - sVar482;
      uVar52 = (ushort)((ulong)uVar2 >> 0x20);
      uVar285 = (ushort)((ulong)uVar2 >> 0x30);
      auVar269._12_2_ = uVar52 - sVar485;
      auVar269._14_2_ = uVar285 - sVar487;
      auVar229 = pabsw(auVar537,auVar269);
      uVar20 = auVar229._0_2_;
      auVar156._0_2_ = uVar20 >> local_198;
      uVar34 = auVar229._2_2_;
      auVar156._2_2_ = uVar34 >> local_198;
      uVar37 = auVar229._4_2_;
      auVar156._4_2_ = uVar37 >> local_198;
      uVar126 = auVar229._6_2_;
      auVar156._6_2_ = uVar126 >> local_198;
      uVar40 = auVar229._8_2_;
      auVar156._8_2_ = uVar40 >> local_198;
      uVar42 = auVar229._10_2_;
      auVar156._10_2_ = uVar42 >> local_198;
      uVar159 = auVar229._12_2_;
      uVar44 = auVar229._14_2_;
      auVar156._12_2_ = uVar159 >> local_198;
      auVar156._14_2_ = uVar44 >> local_198;
      auVar229 = psubusw(local_168,auVar156);
      uVar387 = (ushort)uVar5;
      auVar398._0_2_ = uVar387 - sVar490;
      uVar403 = (ushort)((ulong)uVar5 >> 0x10);
      auVar398._2_2_ = uVar403 - sVar63;
      uVar408 = (ushort)((ulong)uVar5 >> 0x20);
      auVar398._4_2_ = uVar408 - sVar65;
      uVar412 = (ushort)((ulong)uVar5 >> 0x30);
      auVar398._6_2_ = uVar412 - sVar67;
      uVar416 = (ushort)uVar4;
      auVar398._8_2_ = uVar416 - sVar69;
      uVar421 = (ushort)((ulong)uVar4 >> 0x10);
      auVar398._10_2_ = uVar421 - sVar71;
      uVar426 = (ushort)((ulong)uVar4 >> 0x20);
      uVar431 = (ushort)((ulong)uVar4 >> 0x30);
      auVar398._12_2_ = uVar426 - sVar73;
      auVar398._14_2_ = uVar431 - sVar75;
      auVar29 = pabsw(auVar315,auVar398);
      uVar289 = auVar29._0_2_;
      auVar472._0_2_ = uVar289 >> local_198;
      uVar293 = auVar29._2_2_;
      auVar472._2_2_ = uVar293 >> local_198;
      uVar297 = auVar29._4_2_;
      auVar472._4_2_ = uVar297 >> local_198;
      uVar302 = auVar29._6_2_;
      auVar472._6_2_ = uVar302 >> local_198;
      uVar307 = auVar29._8_2_;
      auVar472._8_2_ = uVar307 >> local_198;
      uVar196 = auVar29._10_2_;
      auVar472._10_2_ = uVar196 >> local_198;
      uVar206 = auVar29._12_2_;
      uVar216 = auVar29._14_2_;
      auVar472._12_2_ = uVar206 >> local_198;
      auVar472._14_2_ = uVar216 >> local_198;
      auVar29 = psubusw(local_168,auVar472);
      sVar18 = auVar229._0_2_;
      sVar454 = auVar229._2_2_;
      sVar19 = auVar229._4_2_;
      sVar474 = auVar229._6_2_;
      sVar33 = auVar229._8_2_;
      sVar36 = auVar229._10_2_;
      sVar39 = auVar229._12_2_;
      sVar41 = auVar229._14_2_;
      sVar43 = auVar29._0_2_;
      sVar46 = auVar29._2_2_;
      sVar50 = auVar29._4_2_;
      sVar62 = auVar29._6_2_;
      sVar64 = auVar29._8_2_;
      sVar66 = auVar29._10_2_;
      sVar68 = auVar29._12_2_;
      sVar70 = auVar29._14_2_;
      auVar229 = psraw(auVar269,0xf);
      auVar95._0_2_ =
           (((short)uVar20 < sVar18) * uVar20 | (ushort)((short)uVar20 >= sVar18) * sVar18) +
           auVar229._0_2_;
      auVar95._2_2_ =
           (((short)uVar34 < sVar454) * uVar34 | (ushort)((short)uVar34 >= sVar454) * sVar454) +
           auVar229._2_2_;
      auVar95._4_2_ =
           (((short)uVar37 < sVar19) * uVar37 | (ushort)((short)uVar37 >= sVar19) * sVar19) +
           auVar229._4_2_;
      auVar95._6_2_ =
           (((short)uVar126 < sVar474) * uVar126 | (ushort)((short)uVar126 >= sVar474) * sVar474) +
           auVar229._6_2_;
      auVar95._8_2_ =
           (((short)uVar40 < sVar33) * uVar40 | (ushort)((short)uVar40 >= sVar33) * sVar33) +
           auVar229._8_2_;
      auVar95._10_2_ =
           (((short)uVar42 < sVar36) * uVar42 | (ushort)((short)uVar42 >= sVar36) * sVar36) +
           auVar229._10_2_;
      auVar95._12_2_ =
           (((short)uVar159 < sVar39) * uVar159 | (ushort)((short)uVar159 >= sVar39) * sVar39) +
           auVar229._12_2_;
      auVar95._14_2_ =
           (((short)uVar44 < sVar41) * uVar44 | (ushort)((short)uVar44 >= sVar41) * sVar41) +
           auVar229._14_2_;
      auVar95 = auVar95 ^ auVar229;
      auVar229 = psraw(auVar398,0xf);
      auVar157._0_2_ =
           (((short)uVar289 < sVar43) * uVar289 | (ushort)((short)uVar289 >= sVar43) * sVar43) +
           auVar229._0_2_;
      auVar157._2_2_ =
           (((short)uVar293 < sVar46) * uVar293 | (ushort)((short)uVar293 >= sVar46) * sVar46) +
           auVar229._2_2_;
      auVar157._4_2_ =
           (((short)uVar297 < sVar50) * uVar297 | (ushort)((short)uVar297 >= sVar50) * sVar50) +
           auVar229._4_2_;
      auVar157._6_2_ =
           (((short)uVar302 < sVar62) * uVar302 | (ushort)((short)uVar302 >= sVar62) * sVar62) +
           auVar229._6_2_;
      auVar157._8_2_ =
           (((short)uVar307 < sVar64) * uVar307 | (ushort)((short)uVar307 >= sVar64) * sVar64) +
           auVar229._8_2_;
      auVar157._10_2_ =
           (((short)uVar196 < sVar66) * uVar196 | (ushort)((short)uVar196 >= sVar66) * sVar66) +
           auVar229._10_2_;
      auVar157._12_2_ =
           (((short)uVar206 < sVar68) * uVar206 | (ushort)((short)uVar206 >= sVar68) * sVar68) +
           auVar229._12_2_;
      auVar157._14_2_ =
           (((short)uVar216 < sVar70) * uVar216 | (ushort)((short)uVar216 >= sVar70) * sVar70) +
           auVar229._14_2_;
      auVar157 = auVar157 ^ auVar229;
      uVar40 = in[4 - lVar12];
      uVar42 = in[5 - lVar12];
      uVar159 = in[6 - lVar12];
      uVar44 = in[7 - lVar12];
      puVar1 = in + (0x90 - lVar12);
      uVar20 = *puVar1;
      uVar34 = puVar1[1];
      uVar37 = puVar1[2];
      uVar126 = puVar1[3];
      uVar2 = *(undefined8 *)(in + (0x120 - lVar12));
      uVar3 = *(undefined8 *)(in + (0x1b0 - lVar12));
      auVar399._0_2_ = uVar20 - sVar21;
      auVar399._2_2_ = uVar34 - sVar35;
      auVar399._4_2_ = uVar37 - sVar38;
      auVar399._6_2_ = uVar126 - sVar477;
      auVar399._8_2_ = uVar40 - sVar480;
      auVar399._10_2_ = uVar42 - sVar482;
      auVar399._12_2_ = uVar159 - sVar485;
      auVar399._14_2_ = uVar44 - sVar487;
      uVar253 = (ushort)uVar3;
      auVar440._0_2_ = uVar253 - sVar490;
      uVar410 = (ushort)((ulong)uVar3 >> 0x10);
      auVar440._2_2_ = uVar410 - sVar63;
      uVar441 = (ushort)((ulong)uVar3 >> 0x20);
      auVar440._4_2_ = uVar441 - sVar65;
      uVar508 = (ushort)((ulong)uVar3 >> 0x30);
      auVar440._6_2_ = uVar508 - sVar67;
      uVar531 = (ushort)uVar2;
      auVar440._8_2_ = uVar531 - sVar69;
      uVar551 = (ushort)((ulong)uVar2 >> 0x10);
      auVar440._10_2_ = uVar551 - sVar71;
      uVar450 = (ushort)((ulong)uVar2 >> 0x20);
      uVar452 = (ushort)((ulong)uVar2 >> 0x30);
      auVar440._12_2_ = uVar450 - sVar73;
      auVar440._14_2_ = uVar452 - sVar75;
      auVar229 = pabsw(auVar472,auVar399);
      uVar289 = auVar229._0_2_;
      auVar324._0_2_ = uVar289 >> local_198;
      uVar293 = auVar229._2_2_;
      auVar324._2_2_ = uVar293 >> local_198;
      uVar297 = auVar229._4_2_;
      auVar324._4_2_ = uVar297 >> local_198;
      uVar302 = auVar229._6_2_;
      auVar324._6_2_ = uVar302 >> local_198;
      uVar307 = auVar229._8_2_;
      auVar324._8_2_ = uVar307 >> local_198;
      uVar196 = auVar229._10_2_;
      auVar324._10_2_ = uVar196 >> local_198;
      uVar206 = auVar229._12_2_;
      uVar216 = auVar229._14_2_;
      auVar324._12_2_ = uVar206 >> local_198;
      auVar324._14_2_ = uVar216 >> local_198;
      auVar229 = pabsw(auVar389,auVar440);
      uVar296 = auVar229._0_2_;
      auVar280._0_2_ = uVar296 >> local_198;
      uVar300 = auVar229._2_2_;
      auVar280._2_2_ = uVar300 >> local_198;
      uVar305 = auVar229._4_2_;
      auVar280._4_2_ = uVar305 >> local_198;
      uVar310 = auVar229._6_2_;
      auVar280._6_2_ = uVar310 >> local_198;
      uVar295 = auVar229._8_2_;
      auVar280._8_2_ = uVar295 >> local_198;
      uVar299 = auVar229._10_2_;
      auVar280._10_2_ = uVar299 >> local_198;
      uVar304 = auVar229._12_2_;
      uVar309 = auVar229._14_2_;
      auVar280._12_2_ = uVar304 >> local_198;
      auVar280._14_2_ = uVar309 >> local_198;
      auVar229 = psubusw(local_168,auVar324);
      auVar29 = psubusw(local_168,auVar280);
      sVar18 = auVar229._0_2_;
      sVar454 = auVar229._2_2_;
      sVar19 = auVar229._4_2_;
      sVar474 = auVar229._6_2_;
      sVar33 = auVar229._8_2_;
      sVar36 = auVar229._10_2_;
      sVar39 = auVar229._12_2_;
      sVar41 = auVar229._14_2_;
      sVar43 = auVar29._0_2_;
      sVar46 = auVar29._2_2_;
      sVar50 = auVar29._4_2_;
      sVar62 = auVar29._6_2_;
      sVar64 = auVar29._8_2_;
      sVar66 = auVar29._10_2_;
      sVar68 = auVar29._12_2_;
      sVar70 = auVar29._14_2_;
      auVar229 = psraw(auVar399,0xf);
      auVar134._0_2_ =
           (((short)uVar289 < sVar18) * uVar289 | (ushort)((short)uVar289 >= sVar18) * sVar18) +
           auVar229._0_2_;
      auVar134._2_2_ =
           (((short)uVar293 < sVar454) * uVar293 | (ushort)((short)uVar293 >= sVar454) * sVar454) +
           auVar229._2_2_;
      auVar134._4_2_ =
           (((short)uVar297 < sVar19) * uVar297 | (ushort)((short)uVar297 >= sVar19) * sVar19) +
           auVar229._4_2_;
      auVar134._6_2_ =
           (((short)uVar302 < sVar474) * uVar302 | (ushort)((short)uVar302 >= sVar474) * sVar474) +
           auVar229._6_2_;
      auVar134._8_2_ =
           (((short)uVar307 < sVar33) * uVar307 | (ushort)((short)uVar307 >= sVar33) * sVar33) +
           auVar229._8_2_;
      auVar134._10_2_ =
           (((short)uVar196 < sVar36) * uVar196 | (ushort)((short)uVar196 >= sVar36) * sVar36) +
           auVar229._10_2_;
      auVar134._12_2_ =
           (((short)uVar206 < sVar39) * uVar206 | (ushort)((short)uVar206 >= sVar39) * sVar39) +
           auVar229._12_2_;
      auVar134._14_2_ =
           (((short)uVar216 < sVar41) * uVar216 | (ushort)((short)uVar216 >= sVar41) * sVar41) +
           auVar229._14_2_;
      auVar134 = auVar134 ^ auVar229;
      auVar229 = psraw(auVar440,0xf);
      auVar361._0_2_ =
           (((short)uVar296 < sVar43) * uVar296 | (ushort)((short)uVar296 >= sVar43) * sVar43) +
           auVar229._0_2_;
      auVar361._2_2_ =
           (((short)uVar300 < sVar46) * uVar300 | (ushort)((short)uVar300 >= sVar46) * sVar46) +
           auVar229._2_2_;
      auVar361._4_2_ =
           (((short)uVar305 < sVar50) * uVar305 | (ushort)((short)uVar305 >= sVar50) * sVar50) +
           auVar229._4_2_;
      auVar361._6_2_ =
           (((short)uVar310 < sVar62) * uVar310 | (ushort)((short)uVar310 >= sVar62) * sVar62) +
           auVar229._6_2_;
      auVar361._8_2_ =
           (((short)uVar295 < sVar64) * uVar295 | (ushort)((short)uVar295 >= sVar64) * sVar64) +
           auVar229._8_2_;
      auVar361._10_2_ =
           (((short)uVar299 < sVar66) * uVar299 | (ushort)((short)uVar299 >= sVar66) * sVar66) +
           auVar229._10_2_;
      auVar361._12_2_ =
           (((short)uVar304 < sVar68) * uVar304 | (ushort)((short)uVar304 >= sVar68) * sVar68) +
           auVar229._12_2_;
      auVar361._14_2_ =
           (((short)uVar309 < sVar70) * uVar309 | (ushort)((short)uVar309 >= sVar70) * sVar70) +
           auVar229._14_2_;
      auVar361 = auVar361 ^ auVar229;
      local_188 = auVar24._0_2_;
      sStack_186 = auVar24._2_2_;
      auVar492._0_2_ =
           (auVar134._0_2_ + auVar95._0_2_ + auVar237._0_2_ + auVar317._0_2_) * local_188 +
           (auVar557._0_2_ + auVar153._0_2_ + auVar392._0_2_ + auVar90._0_2_) * local_178 +
           (auVar394._0_2_ + auVar275._0_2_) * sVar97 + (auVar150._0_2_ + auVar274._0_2_) * sVar96;
      auVar492._2_2_ =
           (auVar134._2_2_ + auVar95._2_2_ + auVar237._2_2_ + auVar317._2_2_) * sStack_186 +
           (auVar557._2_2_ + auVar153._2_2_ + auVar392._2_2_ + auVar90._2_2_) * sStack_176 +
           (auVar394._2_2_ + auVar275._2_2_) * sVar99 + (auVar150._2_2_ + auVar274._2_2_) * sVar98;
      auVar492._4_2_ =
           (auVar134._4_2_ + auVar95._4_2_ + auVar237._4_2_ + auVar317._4_2_) * local_188 +
           (auVar557._4_2_ + auVar153._4_2_ + auVar392._4_2_ + auVar90._4_2_) * local_178 +
           (auVar394._4_2_ + auVar275._4_2_) * sVar97 + (auVar150._4_2_ + auVar274._4_2_) * sVar96;
      auVar492._6_2_ =
           (auVar134._6_2_ + auVar95._6_2_ + auVar237._6_2_ + auVar317._6_2_) * sStack_186 +
           (auVar557._6_2_ + auVar153._6_2_ + auVar392._6_2_ + auVar90._6_2_) * sStack_176 +
           (auVar394._6_2_ + auVar275._6_2_) * sVar99 + (auVar150._6_2_ + auVar274._6_2_) * sVar98;
      auVar492._8_2_ =
           (auVar134._8_2_ + auVar95._8_2_ + auVar237._8_2_ + auVar317._8_2_) * local_188 +
           (auVar557._8_2_ + auVar153._8_2_ + auVar392._8_2_ + auVar90._8_2_) * local_178 +
           (auVar394._8_2_ + auVar275._8_2_) * sVar97 + (auVar150._8_2_ + auVar274._8_2_) * sVar96;
      auVar492._10_2_ =
           (auVar134._10_2_ + auVar95._10_2_ + auVar237._10_2_ + auVar317._10_2_) * sStack_186 +
           (auVar557._10_2_ + auVar153._10_2_ + auVar392._10_2_ + auVar90._10_2_) * sStack_176 +
           (auVar394._10_2_ + auVar275._10_2_) * sVar99 +
           (auVar150._10_2_ + auVar274._10_2_) * sVar98;
      auVar492._12_2_ =
           (auVar134._12_2_ + auVar95._12_2_ + auVar237._12_2_ + auVar317._12_2_) * local_188 +
           (auVar557._12_2_ + auVar153._12_2_ + auVar392._12_2_ + auVar90._12_2_) * local_178 +
           (auVar394._12_2_ + auVar275._12_2_) * sVar97 +
           (auVar150._12_2_ + auVar274._12_2_) * sVar96;
      auVar492._14_2_ =
           (auVar134._14_2_ + auVar95._14_2_ + auVar237._14_2_ + auVar317._14_2_) * sStack_186 +
           (auVar557._14_2_ + auVar153._14_2_ + auVar392._14_2_ + auVar90._14_2_) * sStack_176 +
           (auVar394._14_2_ + auVar275._14_2_) * sVar99 +
           (auVar150._14_2_ + auVar274._14_2_) * sVar98;
      auVar554._0_2_ =
           (auVar361._0_2_ + auVar157._0_2_ + auVar369._0_2_ + auVar54._0_2_) * local_188 +
           (auVar497._0_2_ + auVar92._0_2_ + auVar395._0_2_ + auVar152._0_2_) * local_178 +
           (auVar470._0_2_ + auVar232._0_2_) * sVar97 + (auVar89._0_2_ + auVar230._0_2_) * sVar96;
      auVar554._2_2_ =
           (auVar361._2_2_ + auVar157._2_2_ + auVar369._2_2_ + auVar54._2_2_) * sStack_186 +
           (auVar497._2_2_ + auVar92._2_2_ + auVar395._2_2_ + auVar152._2_2_) * sStack_176 +
           (auVar470._2_2_ + auVar232._2_2_) * sVar99 + (auVar89._2_2_ + auVar230._2_2_) * sVar98;
      auVar554._4_2_ =
           (auVar361._4_2_ + auVar157._4_2_ + auVar369._4_2_ + auVar54._4_2_) * local_188 +
           (auVar497._4_2_ + auVar92._4_2_ + auVar395._4_2_ + auVar152._4_2_) * local_178 +
           (auVar470._4_2_ + auVar232._4_2_) * sVar97 + (auVar89._4_2_ + auVar230._4_2_) * sVar96;
      auVar554._6_2_ =
           (auVar361._6_2_ + auVar157._6_2_ + auVar369._6_2_ + auVar54._6_2_) * sStack_186 +
           (auVar497._6_2_ + auVar92._6_2_ + auVar395._6_2_ + auVar152._6_2_) * sStack_176 +
           (auVar470._6_2_ + auVar232._6_2_) * sVar99 + (auVar89._6_2_ + auVar230._6_2_) * sVar98;
      auVar554._8_2_ =
           (auVar361._8_2_ + auVar157._8_2_ + auVar369._8_2_ + auVar54._8_2_) * local_188 +
           (auVar497._8_2_ + auVar92._8_2_ + auVar395._8_2_ + auVar152._8_2_) * local_178 +
           (auVar470._8_2_ + auVar232._8_2_) * sVar97 + (auVar89._8_2_ + auVar230._8_2_) * sVar96;
      auVar554._10_2_ =
           (auVar361._10_2_ + auVar157._10_2_ + auVar369._10_2_ + auVar54._10_2_) * sStack_186 +
           (auVar497._10_2_ + auVar92._10_2_ + auVar395._10_2_ + auVar152._10_2_) * sStack_176 +
           (auVar470._10_2_ + auVar232._10_2_) * sVar99 +
           (auVar89._10_2_ + auVar230._10_2_) * sVar98;
      auVar554._12_2_ =
           (auVar361._12_2_ + auVar157._12_2_ + auVar369._12_2_ + auVar54._12_2_) * local_188 +
           (auVar497._12_2_ + auVar92._12_2_ + auVar395._12_2_ + auVar152._12_2_) * local_178 +
           (auVar470._12_2_ + auVar232._12_2_) * sVar97 +
           (auVar89._12_2_ + auVar230._12_2_) * sVar96;
      auVar554._14_2_ =
           (auVar361._14_2_ + auVar157._14_2_ + auVar369._14_2_ + auVar54._14_2_) * sStack_186 +
           (auVar497._14_2_ + auVar92._14_2_ + auVar395._14_2_ + auVar152._14_2_) * sStack_176 +
           (auVar470._14_2_ + auVar232._14_2_) * sVar99 +
           (auVar89._14_2_ + auVar230._14_2_) * sVar98;
      uVar289 = ((short)uVar226 < (short)uVar47) * uVar226 |
                ((short)uVar226 >= (short)uVar47) * uVar47;
      uVar293 = ((short)uVar244 < (short)uVar51) * uVar244 |
                ((short)uVar244 >= (short)uVar51) * uVar51;
      uVar297 = ((short)uVar252 < (short)uVar186) * uVar252 |
                ((short)uVar252 >= (short)uVar186) * uVar186;
      uVar302 = ((short)uVar260 < (short)uVar205) * uVar260 |
                ((short)uVar260 >= (short)uVar205) * uVar205;
      uVar307 = ((short)uVar267 < (short)uVar215) * uVar267 |
                ((short)uVar267 >= (short)uVar215) * uVar215;
      uVar196 = ((short)uVar284 < (short)uVar48) * uVar284 |
                ((short)uVar284 >= (short)uVar48) * uVar48;
      uVar206 = ((short)uVar287 < (short)uVar53) * uVar287 |
                ((short)uVar287 >= (short)uVar53) * uVar53;
      uVar216 = ((short)uVar291 < (short)uVar282) * uVar291 |
                ((short)uVar291 >= (short)uVar282) * uVar282;
      uVar226 = uVar226 & 0xbfff;
      uVar244 = uVar244 & 0xbfff;
      uVar252 = uVar252 & 0xbfff;
      uVar260 = uVar260 & 0xbfff;
      uVar267 = uVar267 & 0xbfff;
      uVar284 = uVar284 & 0xbfff;
      uVar287 = uVar287 & 0xbfff;
      uVar291 = uVar291 & 0xbfff;
      uVar47 = uVar47 & 0xbfff;
      uVar51 = uVar51 & 0xbfff;
      uVar186 = uVar186 & 0xbfff;
      uVar205 = uVar205 & 0xbfff;
      uVar215 = uVar215 & 0xbfff;
      uVar48 = uVar48 & 0xbfff;
      uVar53 = uVar53 & 0xbfff;
      uVar282 = uVar282 & 0xbfff;
      uVar47 = ((short)uVar47 < (short)uVar226) * uVar226 |
               ((short)uVar47 >= (short)uVar226) * uVar47;
      uVar51 = ((short)uVar51 < (short)uVar244) * uVar244 |
               ((short)uVar51 >= (short)uVar244) * uVar51;
      uVar186 = ((short)uVar186 < (short)uVar252) * uVar252 |
                ((short)uVar186 >= (short)uVar252) * uVar186;
      uVar205 = ((short)uVar205 < (short)uVar260) * uVar260 |
                ((short)uVar205 >= (short)uVar260) * uVar205;
      uVar215 = ((short)uVar215 < (short)uVar267) * uVar267 |
                ((short)uVar215 >= (short)uVar267) * uVar215;
      uVar48 = ((short)uVar48 < (short)uVar284) * uVar284 |
               ((short)uVar48 >= (short)uVar284) * uVar48;
      uVar53 = ((short)uVar53 < (short)uVar287) * uVar287 |
               ((short)uVar53 >= (short)uVar287) * uVar53;
      uVar282 = ((short)uVar282 < (short)uVar291) * uVar291 |
                ((short)uVar282 >= (short)uVar291) * uVar282;
      uVar267 = ((short)uVar240 < (short)uVar342) * uVar240 |
                ((short)uVar240 >= (short)uVar342) * uVar342;
      uVar284 = ((short)uVar248 < (short)uVar345) * uVar248 |
                ((short)uVar248 >= (short)uVar345) * uVar345;
      uVar287 = ((short)uVar256 < (short)uVar349) * uVar256 |
                ((short)uVar256 >= (short)uVar349) * uVar349;
      uVar291 = ((short)uVar264 < (short)uVar353) * uVar264 |
                ((short)uVar264 >= (short)uVar353) * uVar353;
      uVar296 = ((short)uVar313 < (short)uVar417) * uVar313 |
                ((short)uVar313 >= (short)uVar417) * uVar417;
      uVar300 = ((short)uVar332 < (short)uVar422) * uVar332 |
                ((short)uVar332 >= (short)uVar422) * uVar422;
      uVar305 = ((short)uVar335 < (short)uVar427) * uVar335 |
                ((short)uVar335 >= (short)uVar427) * uVar427;
      uVar310 = ((short)uVar338 < (short)uVar432) * uVar338 |
                ((short)uVar338 >= (short)uVar432) * uVar432;
      uVar240 = uVar240 & 0xbfff;
      uVar248 = uVar248 & 0xbfff;
      uVar256 = uVar256 & 0xbfff;
      uVar264 = uVar264 & 0xbfff;
      uVar313 = uVar313 & 0xbfff;
      uVar332 = uVar332 & 0xbfff;
      uVar335 = uVar335 & 0xbfff;
      uVar338 = uVar338 & 0xbfff;
      uVar342 = uVar342 & 0xbfff;
      uVar345 = uVar345 & 0xbfff;
      uVar349 = uVar349 & 0xbfff;
      uVar353 = uVar353 & 0xbfff;
      uVar417 = uVar417 & 0xbfff;
      uVar422 = uVar422 & 0xbfff;
      uVar427 = uVar427 & 0xbfff;
      uVar432 = uVar432 & 0xbfff;
      uVar226 = ((short)uVar342 < (short)uVar240) * uVar240 |
                ((short)uVar342 >= (short)uVar240) * uVar342;
      uVar240 = ((short)uVar345 < (short)uVar248) * uVar248 |
                ((short)uVar345 >= (short)uVar248) * uVar345;
      uVar244 = ((short)uVar349 < (short)uVar256) * uVar256 |
                ((short)uVar349 >= (short)uVar256) * uVar349;
      uVar248 = ((short)uVar353 < (short)uVar264) * uVar264 |
                ((short)uVar353 >= (short)uVar264) * uVar353;
      uVar252 = ((short)uVar417 < (short)uVar313) * uVar313 |
                ((short)uVar417 >= (short)uVar313) * uVar417;
      uVar256 = ((short)uVar422 < (short)uVar332) * uVar332 |
                ((short)uVar422 >= (short)uVar332) * uVar422;
      uVar260 = ((short)uVar427 < (short)uVar335) * uVar335 |
                ((short)uVar427 >= (short)uVar335) * uVar427;
      uVar264 = ((short)uVar432 < (short)uVar338) * uVar338 |
                ((short)uVar432 >= (short)uVar338) * uVar432;
      uVar313 = ((short)uVar301 < (short)uVar289) * uVar301 |
                ((short)uVar301 >= (short)uVar289) * uVar289;
      uVar332 = ((short)uVar306 < (short)uVar293) * uVar306 |
                ((short)uVar306 >= (short)uVar293) * uVar293;
      uVar335 = ((short)uVar314 < (short)uVar297) * uVar314 |
                ((short)uVar314 >= (short)uVar297) * uVar297;
      uVar338 = ((short)uVar339 < (short)uVar302) * uVar339 |
                ((short)uVar339 >= (short)uVar302) * uVar302;
      uVar342 = ((short)uVar346 < (short)uVar307) * uVar346 |
                ((short)uVar346 >= (short)uVar307) * uVar307;
      uVar345 = ((short)uVar354 < (short)uVar196) * uVar354 |
                ((short)uVar354 >= (short)uVar196) * uVar196;
      uVar349 = ((short)uVar388 < (short)uVar206) * uVar388 |
                ((short)uVar388 >= (short)uVar206) * uVar206;
      uVar353 = ((short)uVar404 < (short)uVar216) * uVar404 |
                ((short)uVar404 >= (short)uVar216) * uVar216;
      uVar301 = uVar301 & 0xbfff;
      uVar306 = uVar306 & 0xbfff;
      uVar314 = uVar314 & 0xbfff;
      uVar339 = uVar339 & 0xbfff;
      uVar346 = uVar346 & 0xbfff;
      uVar354 = uVar354 & 0xbfff;
      uVar388 = uVar388 & 0xbfff;
      uVar404 = uVar404 & 0xbfff;
      uVar47 = ((short)uVar301 < (short)uVar47) * uVar47 |
               ((short)uVar301 >= (short)uVar47) * uVar301;
      uVar51 = ((short)uVar306 < (short)uVar51) * uVar51 |
               ((short)uVar306 >= (short)uVar51) * uVar306;
      uVar186 = ((short)uVar314 < (short)uVar186) * uVar186 |
                ((short)uVar314 >= (short)uVar186) * uVar314;
      uVar205 = ((short)uVar339 < (short)uVar205) * uVar205 |
                ((short)uVar339 >= (short)uVar205) * uVar339;
      uVar215 = ((short)uVar346 < (short)uVar215) * uVar215 |
                ((short)uVar346 >= (short)uVar215) * uVar346;
      uVar48 = ((short)uVar354 < (short)uVar48) * uVar48 |
               ((short)uVar354 >= (short)uVar48) * uVar354;
      uVar53 = ((short)uVar388 < (short)uVar53) * uVar53 |
               ((short)uVar388 >= (short)uVar53) * uVar388;
      uVar282 = ((short)uVar404 < (short)uVar282) * uVar282 |
                ((short)uVar404 >= (short)uVar282) * uVar404;
      uVar289 = ((short)uVar47 < (short)uVar552) * uVar552 |
                ((short)uVar47 >= (short)uVar552) * uVar47;
      uVar293 = ((short)uVar51 < (short)uVar558) * uVar558 |
                ((short)uVar51 >= (short)uVar558) * uVar51;
      uVar297 = ((short)uVar186 < (short)uVar559) * uVar559 |
                ((short)uVar186 >= (short)uVar559) * uVar186;
      uVar302 = ((short)uVar205 < (short)uVar560) * uVar560 |
                ((short)uVar205 >= (short)uVar560) * uVar205;
      uVar307 = ((short)uVar215 < (short)uVar561) * uVar561 |
                ((short)uVar215 >= (short)uVar561) * uVar215;
      uVar196 = ((short)uVar48 < (short)uVar562) * uVar562 |
                ((short)uVar48 >= (short)uVar562) * uVar48;
      uVar206 = ((short)uVar53 < (short)uVar563) * uVar563 |
                ((short)uVar53 >= (short)uVar563) * uVar53;
      uVar216 = ((short)uVar282 < (short)uVar564) * uVar564 |
                ((short)uVar282 >= (short)uVar564) * uVar282;
      uVar388 = ((short)uVar249 < (short)uVar267) * uVar249 |
                ((short)uVar249 >= (short)uVar267) * uVar267;
      uVar404 = ((short)uVar406 < (short)uVar284) * uVar406 |
                ((short)uVar406 >= (short)uVar284) * uVar284;
      uVar287 = ((short)uVar433 < (short)uVar287) * uVar433 |
                ((short)uVar433 >= (short)uVar287) * uVar287;
      uVar291 = ((short)uVar506 < (short)uVar291) * uVar506 |
                ((short)uVar506 >= (short)uVar291) * uVar291;
      uVar417 = ((short)uVar530 < (short)uVar296) * uVar530 |
                ((short)uVar530 >= (short)uVar296) * uVar296;
      uVar422 = ((short)uVar549 < (short)uVar300) * uVar549 |
                ((short)uVar549 >= (short)uVar300) * uVar300;
      uVar427 = ((short)uVar288 < (short)uVar305) * uVar288 |
                ((short)uVar288 >= (short)uVar305) * uVar305;
      uVar432 = ((short)uVar292 < (short)uVar310) * uVar292 |
                ((short)uVar292 >= (short)uVar310) * uVar310;
      uVar249 = uVar249 & 0xbfff;
      uVar406 = uVar406 & 0xbfff;
      uVar433 = uVar433 & 0xbfff;
      uVar506 = uVar506 & 0xbfff;
      uVar530 = uVar530 & 0xbfff;
      uVar549 = uVar549 & 0xbfff;
      uVar288 = uVar288 & 0xbfff;
      uVar292 = uVar292 & 0xbfff;
      uVar47 = ((short)uVar249 < (short)uVar226) * uVar226 |
               ((short)uVar249 >= (short)uVar226) * uVar249;
      uVar51 = ((short)uVar406 < (short)uVar240) * uVar240 |
               ((short)uVar406 >= (short)uVar240) * uVar406;
      uVar186 = ((short)uVar433 < (short)uVar244) * uVar244 |
                ((short)uVar433 >= (short)uVar244) * uVar433;
      uVar205 = ((short)uVar506 < (short)uVar248) * uVar248 |
                ((short)uVar506 >= (short)uVar248) * uVar506;
      uVar215 = ((short)uVar530 < (short)uVar252) * uVar252 |
                ((short)uVar530 >= (short)uVar252) * uVar530;
      uVar48 = ((short)uVar549 < (short)uVar256) * uVar256 |
               ((short)uVar549 >= (short)uVar256) * uVar549;
      uVar53 = ((short)uVar288 < (short)uVar260) * uVar260 |
               ((short)uVar288 >= (short)uVar260) * uVar288;
      uVar282 = ((short)uVar292 < (short)uVar264) * uVar264 |
                ((short)uVar292 >= (short)uVar264) * uVar292;
      uVar47 = ((short)uVar47 < (short)uVar225) * uVar225 |
               ((short)uVar47 >= (short)uVar225) * uVar47;
      uVar51 = ((short)uVar51 < (short)uVar257) * uVar257 |
               ((short)uVar51 >= (short)uVar257) * uVar51;
      uVar186 = ((short)uVar186 < (short)uVar414) * uVar414 |
                ((short)uVar186 >= (short)uVar414) * uVar186;
      uVar205 = ((short)uVar205 < (short)uVar443) * uVar443 |
                ((short)uVar205 >= (short)uVar443) * uVar205;
      uVar215 = ((short)uVar215 < (short)uVar524) * uVar524 |
                ((short)uVar215 >= (short)uVar524) * uVar215;
      uVar48 = ((short)uVar48 < (short)uVar532) * uVar532 |
               ((short)uVar48 >= (short)uVar532) * uVar48;
      uVar53 = ((short)uVar53 < (short)uVar114) * uVar114 |
               ((short)uVar53 >= (short)uVar114) * uVar53;
      uVar282 = ((short)uVar282 < (short)uVar122) * uVar122 |
                ((short)uVar282 >= (short)uVar122) * uVar282;
      uVar524 = ((short)uVar455 < (short)uVar475) * uVar455 |
                ((short)uVar455 >= (short)uVar475) * uVar475;
      uVar532 = ((short)uVar478 < (short)uVar239) * uVar478 |
                ((short)uVar478 >= (short)uVar239) * uVar239;
      uVar114 = ((short)uVar242 < (short)uVar243) * uVar242 |
                ((short)uVar242 >= (short)uVar243) * uVar243;
      uVar122 = ((short)uVar246 < (short)uVar247) * uVar246 |
                ((short)uVar246 >= (short)uVar247) * uVar247;
      uVar226 = ((short)uVar250 < (short)uVar251) * uVar250 |
                ((short)uVar250 >= (short)uVar251) * uVar251;
      uVar301 = ((short)uVar254 < (short)uVar255) * uVar254 |
                ((short)uVar254 >= (short)uVar255) * uVar255;
      uVar248 = ((short)uVar258 < (short)uVar259) * uVar258 |
                ((short)uVar258 >= (short)uVar259) * uVar259;
      uVar252 = ((short)uVar262 < (short)uVar263) * uVar262 |
                ((short)uVar262 >= (short)uVar263) * uVar263;
      uVar455 = uVar455 & 0xbfff;
      uVar478 = uVar478 & 0xbfff;
      uVar242 = uVar242 & 0xbfff;
      uVar246 = uVar246 & 0xbfff;
      uVar250 = uVar250 & 0xbfff;
      uVar254 = uVar254 & 0xbfff;
      uVar258 = uVar258 & 0xbfff;
      uVar262 = uVar262 & 0xbfff;
      uVar475 = uVar475 & 0xbfff;
      uVar239 = uVar239 & 0xbfff;
      uVar243 = uVar243 & 0xbfff;
      uVar247 = uVar247 & 0xbfff;
      uVar251 = uVar251 & 0xbfff;
      uVar255 = uVar255 & 0xbfff;
      uVar259 = uVar259 & 0xbfff;
      uVar263 = uVar263 & 0xbfff;
      uVar225 = ((short)uVar475 < (short)uVar455) * uVar455 |
                ((short)uVar475 >= (short)uVar455) * uVar475;
      uVar249 = ((short)uVar239 < (short)uVar478) * uVar478 |
                ((short)uVar239 >= (short)uVar478) * uVar239;
      uVar257 = ((short)uVar243 < (short)uVar242) * uVar242 |
                ((short)uVar243 >= (short)uVar242) * uVar243;
      uVar406 = ((short)uVar247 < (short)uVar246) * uVar246 |
                ((short)uVar247 >= (short)uVar246) * uVar247;
      uVar414 = ((short)uVar251 < (short)uVar250) * uVar250 |
                ((short)uVar251 >= (short)uVar250) * uVar251;
      uVar433 = ((short)uVar255 < (short)uVar254) * uVar254 |
                ((short)uVar255 >= (short)uVar254) * uVar255;
      uVar443 = ((short)uVar259 < (short)uVar258) * uVar258 |
                ((short)uVar259 >= (short)uVar258) * uVar259;
      uVar506 = ((short)uVar263 < (short)uVar262) * uVar262 |
                ((short)uVar263 >= (short)uVar262) * uVar263;
      uVar314 = ((short)uVar266 < (short)uVar434) * uVar266 |
                ((short)uVar266 >= (short)uVar434) * uVar434;
      uVar260 = ((short)uVar283 < (short)uVar442) * uVar283 |
                ((short)uVar283 >= (short)uVar442) * uVar442;
      uVar264 = ((short)uVar286 < (short)uVar444) * uVar286 |
                ((short)uVar286 >= (short)uVar444) * uVar444;
      uVar339 = ((short)uVar290 < (short)uVar446) * uVar290 |
                ((short)uVar290 >= (short)uVar446) * uVar446;
      uVar267 = ((short)uVar294 < (short)uVar447) * uVar294 |
                ((short)uVar294 >= (short)uVar447) * uVar447;
      uVar346 = ((short)uVar298 < (short)uVar448) * uVar298 |
                ((short)uVar298 >= (short)uVar448) * uVar448;
      uVar284 = ((short)uVar303 < (short)uVar449) * uVar303 |
                ((short)uVar303 >= (short)uVar449) * uVar449;
      uVar354 = ((short)uVar308 < (short)uVar451) * uVar308 |
                ((short)uVar308 >= (short)uVar451) * uVar451;
      uVar266 = uVar266 & 0xbfff;
      uVar283 = uVar283 & 0xbfff;
      uVar286 = uVar286 & 0xbfff;
      uVar290 = uVar290 & 0xbfff;
      uVar294 = uVar294 & 0xbfff;
      uVar298 = uVar298 & 0xbfff;
      uVar303 = uVar303 & 0xbfff;
      uVar308 = uVar308 & 0xbfff;
      uVar434 = uVar434 & 0xbfff;
      uVar442 = uVar442 & 0xbfff;
      uVar444 = uVar444 & 0xbfff;
      uVar446 = uVar446 & 0xbfff;
      uVar447 = uVar447 & 0xbfff;
      uVar448 = uVar448 & 0xbfff;
      uVar449 = uVar449 & 0xbfff;
      uVar451 = uVar451 & 0xbfff;
      uVar530 = ((short)uVar434 < (short)uVar266) * uVar266 |
                ((short)uVar434 >= (short)uVar266) * uVar434;
      uVar549 = ((short)uVar442 < (short)uVar283) * uVar283 |
                ((short)uVar442 >= (short)uVar283) * uVar442;
      uVar288 = ((short)uVar444 < (short)uVar286) * uVar286 |
                ((short)uVar444 >= (short)uVar286) * uVar444;
      uVar292 = ((short)uVar446 < (short)uVar290) * uVar290 |
                ((short)uVar446 >= (short)uVar290) * uVar446;
      uVar240 = ((short)uVar447 < (short)uVar294) * uVar294 |
                ((short)uVar447 >= (short)uVar294) * uVar447;
      uVar244 = ((short)uVar448 < (short)uVar298) * uVar298 |
                ((short)uVar448 >= (short)uVar298) * uVar448;
      uVar306 = ((short)uVar449 < (short)uVar303) * uVar303 |
                ((short)uVar449 >= (short)uVar303) * uVar449;
      uVar256 = ((short)uVar451 < (short)uVar308) * uVar308 |
                ((short)uVar451 >= (short)uVar308) * uVar451;
      uVar455 = ((short)uVar241 < (short)uVar524) * uVar241 |
                ((short)uVar241 >= (short)uVar524) * uVar524;
      uVar475 = ((short)uVar385 < (short)uVar532) * uVar385 |
                ((short)uVar385 >= (short)uVar532) * uVar532;
      uVar478 = ((short)uVar424 < (short)uVar114) * uVar424 |
                ((short)uVar424 >= (short)uVar114) * uVar114;
      uVar122 = ((short)uVar502 < (short)uVar122) * uVar502 |
                ((short)uVar502 >= (short)uVar122) * uVar122;
      uVar226 = ((short)uVar528 < (short)uVar226) * uVar528 |
                ((short)uVar528 >= (short)uVar226) * uVar226;
      uVar301 = ((short)uVar545 < (short)uVar301) * uVar545 |
                ((short)uVar545 >= (short)uVar301) * uVar301;
      uVar248 = ((short)uVar350 < (short)uVar248) * uVar350 |
                ((short)uVar350 >= (short)uVar248) * uVar248;
      uVar252 = ((short)uVar483 < (short)uVar252) * uVar483 |
                ((short)uVar483 >= (short)uVar252) * uVar252;
      uVar241 = uVar241 & 0xbfff;
      uVar385 = uVar385 & 0xbfff;
      uVar424 = uVar424 & 0xbfff;
      uVar502 = uVar502 & 0xbfff;
      uVar528 = uVar528 & 0xbfff;
      uVar545 = uVar545 & 0xbfff;
      uVar350 = uVar350 & 0xbfff;
      uVar483 = uVar483 & 0xbfff;
      uVar524 = ((short)uVar241 < (short)uVar225) * uVar225 |
                ((short)uVar241 >= (short)uVar225) * uVar241;
      uVar532 = ((short)uVar385 < (short)uVar249) * uVar249 |
                ((short)uVar385 >= (short)uVar249) * uVar385;
      uVar114 = ((short)uVar424 < (short)uVar257) * uVar257 |
                ((short)uVar424 >= (short)uVar257) * uVar424;
      uVar502 = ((short)uVar502 < (short)uVar406) * uVar406 |
                ((short)uVar502 >= (short)uVar406) * uVar502;
      uVar528 = ((short)uVar528 < (short)uVar414) * uVar414 |
                ((short)uVar528 >= (short)uVar414) * uVar528;
      uVar545 = ((short)uVar545 < (short)uVar433) * uVar433 |
                ((short)uVar545 >= (short)uVar433) * uVar545;
      uVar350 = ((short)uVar350 < (short)uVar443) * uVar443 |
                ((short)uVar350 >= (short)uVar443) * uVar350;
      uVar506 = ((short)uVar483 < (short)uVar506) * uVar506 |
                ((short)uVar483 >= (short)uVar506) * uVar483;
      uVar314 = ((short)uVar488 < (short)uVar314) * uVar488 |
                ((short)uVar488 >= (short)uVar314) * uVar314;
      uVar260 = ((short)uVar167 < (short)uVar260) * uVar167 |
                ((short)uVar167 >= (short)uVar260) * uVar260;
      uVar264 = ((short)uVar176 < (short)uVar264) * uVar176 |
                ((short)uVar176 >= (short)uVar264) * uVar264;
      uVar339 = ((short)uVar185 < (short)uVar339) * uVar185 |
                ((short)uVar185 >= (short)uVar339) * uVar339;
      uVar267 = ((short)uVar194 < (short)uVar267) * uVar194 |
                ((short)uVar194 >= (short)uVar267) * uVar267;
      uVar346 = ((short)uVar204 < (short)uVar346) * uVar204 |
                ((short)uVar204 >= (short)uVar346) * uVar346;
      uVar284 = ((short)uVar214 < (short)uVar284) * uVar214 |
                ((short)uVar214 >= (short)uVar284) * uVar284;
      uVar354 = ((short)uVar224 < (short)uVar354) * uVar224 |
                ((short)uVar224 >= (short)uVar354) * uVar354;
      uVar488 = uVar488 & 0xbfff;
      uVar167 = uVar167 & 0xbfff;
      uVar176 = uVar176 & 0xbfff;
      uVar185 = uVar185 & 0xbfff;
      uVar194 = uVar194 & 0xbfff;
      uVar204 = uVar204 & 0xbfff;
      uVar214 = uVar214 & 0xbfff;
      uVar224 = uVar224 & 0xbfff;
      uVar225 = ((short)uVar488 < (short)uVar530) * uVar530 |
                ((short)uVar488 >= (short)uVar530) * uVar488;
      uVar241 = ((short)uVar167 < (short)uVar549) * uVar549 |
                ((short)uVar167 >= (short)uVar549) * uVar167;
      uVar249 = ((short)uVar176 < (short)uVar288) * uVar288 |
                ((short)uVar176 >= (short)uVar288) * uVar176;
      uVar257 = ((short)uVar185 < (short)uVar292) * uVar292 |
                ((short)uVar185 >= (short)uVar292) * uVar185;
      uVar385 = ((short)uVar194 < (short)uVar240) * uVar240 |
                ((short)uVar194 >= (short)uVar240) * uVar194;
      uVar406 = ((short)uVar204 < (short)uVar244) * uVar244 |
                ((short)uVar204 >= (short)uVar244) * uVar204;
      uVar414 = ((short)uVar214 < (short)uVar306) * uVar306 |
                ((short)uVar214 >= (short)uVar306) * uVar214;
      uVar424 = ((short)uVar224 < (short)uVar256) * uVar256 |
                ((short)uVar224 >= (short)uVar256) * uVar224;
      uVar530 = ((short)uVar245 < (short)uVar455) * uVar245 |
                ((short)uVar245 >= (short)uVar455) * uVar455;
      uVar549 = ((short)uVar401 < (short)uVar475) * uVar401 |
                ((short)uVar401 >= (short)uVar475) * uVar475;
      uVar288 = ((short)uVar429 < (short)uVar478) * uVar429 |
                ((short)uVar429 >= (short)uVar478) * uVar478;
      uVar122 = ((short)uVar504 < (short)uVar122) * uVar504 |
                ((short)uVar504 >= (short)uVar122) * uVar122;
      uVar483 = ((short)uVar529 < (short)uVar226) * uVar529 |
                ((short)uVar529 >= (short)uVar226) * uVar226;
      uVar292 = ((short)uVar547 < (short)uVar301) * uVar547 |
                ((short)uVar547 >= (short)uVar301) * uVar301;
      uVar488 = ((short)uVar116 < (short)uVar248) * uVar116 |
                ((short)uVar116 >= (short)uVar248) * uVar248;
      uVar226 = ((short)uVar124 < (short)uVar252) * uVar124 |
                ((short)uVar124 >= (short)uVar252) * uVar252;
      uVar245 = uVar245 & 0xbfff;
      uVar401 = uVar401 & 0xbfff;
      uVar429 = uVar429 & 0xbfff;
      uVar504 = uVar504 & 0xbfff;
      uVar529 = uVar529 & 0xbfff;
      uVar547 = uVar547 & 0xbfff;
      uVar116 = uVar116 & 0xbfff;
      uVar124 = uVar124 & 0xbfff;
      uVar245 = ((short)uVar245 < (short)uVar524) * uVar524 |
                ((short)uVar245 >= (short)uVar524) * uVar245;
      uVar401 = ((short)uVar401 < (short)uVar532) * uVar532 |
                ((short)uVar401 >= (short)uVar532) * uVar401;
      uVar429 = ((short)uVar429 < (short)uVar114) * uVar114 |
                ((short)uVar429 >= (short)uVar114) * uVar429;
      uVar433 = ((short)uVar504 < (short)uVar502) * uVar502 |
                ((short)uVar504 >= (short)uVar502) * uVar504;
      uVar443 = ((short)uVar529 < (short)uVar528) * uVar528 |
                ((short)uVar529 >= (short)uVar528) * uVar529;
      uVar502 = ((short)uVar547 < (short)uVar545) * uVar545 |
                ((short)uVar547 >= (short)uVar545) * uVar547;
      uVar504 = ((short)uVar116 < (short)uVar350) * uVar350 |
                ((short)uVar116 >= (short)uVar350) * uVar116;
      uVar506 = ((short)uVar124 < (short)uVar506) * uVar506 |
                ((short)uVar124 >= (short)uVar506) * uVar124;
      uVar289 = ((short)uVar245 < (short)uVar289) * uVar289 |
                ((short)uVar245 >= (short)uVar289) * uVar245;
      uVar293 = ((short)uVar401 < (short)uVar293) * uVar293 |
                ((short)uVar401 >= (short)uVar293) * uVar401;
      uVar297 = ((short)uVar429 < (short)uVar297) * uVar297 |
                ((short)uVar429 >= (short)uVar297) * uVar429;
      uVar302 = ((short)uVar433 < (short)uVar302) * uVar302 |
                ((short)uVar433 >= (short)uVar302) * uVar433;
      uVar307 = ((short)uVar443 < (short)uVar307) * uVar307 |
                ((short)uVar443 >= (short)uVar307) * uVar443;
      uVar196 = ((short)uVar502 < (short)uVar196) * uVar196 |
                ((short)uVar502 >= (short)uVar196) * uVar502;
      uVar206 = ((short)uVar504 < (short)uVar206) * uVar206 |
                ((short)uVar504 >= (short)uVar206) * uVar504;
      uVar216 = ((short)uVar506 < (short)uVar216) * uVar216 |
                ((short)uVar506 >= (short)uVar216) * uVar506;
      uVar429 = ((short)uVar386 < (short)uVar314) * uVar386 |
                ((short)uVar386 >= (short)uVar314) * uVar314;
      uVar433 = ((short)uVar402 < (short)uVar260) * uVar402 |
                ((short)uVar402 >= (short)uVar260) * uVar260;
      uVar443 = ((short)uVar407 < (short)uVar264) * uVar407 |
                ((short)uVar407 >= (short)uVar264) * uVar264;
      uVar502 = ((short)uVar411 < (short)uVar339) * uVar411 |
                ((short)uVar411 >= (short)uVar339) * uVar339;
      uVar504 = ((short)uVar415 < (short)uVar267) * uVar415 |
                ((short)uVar415 >= (short)uVar267) * uVar267;
      uVar506 = ((short)uVar420 < (short)uVar346) * uVar420 |
                ((short)uVar420 >= (short)uVar346) * uVar346;
      uVar524 = ((short)uVar425 < (short)uVar284) * uVar425 |
                ((short)uVar425 >= (short)uVar284) * uVar284;
      uVar528 = ((short)uVar430 < (short)uVar354) * uVar430 |
                ((short)uVar430 >= (short)uVar354) * uVar354;
      uVar386 = uVar386 & 0xbfff;
      uVar402 = uVar402 & 0xbfff;
      uVar407 = uVar407 & 0xbfff;
      uVar411 = uVar411 & 0xbfff;
      uVar415 = uVar415 & 0xbfff;
      uVar420 = uVar420 & 0xbfff;
      uVar425 = uVar425 & 0xbfff;
      uVar430 = uVar430 & 0xbfff;
      uVar225 = ((short)uVar386 < (short)uVar225) * uVar225 |
                ((short)uVar386 >= (short)uVar225) * uVar386;
      uVar241 = ((short)uVar402 < (short)uVar241) * uVar241 |
                ((short)uVar402 >= (short)uVar241) * uVar402;
      uVar245 = ((short)uVar407 < (short)uVar249) * uVar249 |
                ((short)uVar407 >= (short)uVar249) * uVar407;
      uVar249 = ((short)uVar411 < (short)uVar257) * uVar257 |
                ((short)uVar411 >= (short)uVar257) * uVar411;
      uVar257 = ((short)uVar415 < (short)uVar385) * uVar385 |
                ((short)uVar415 >= (short)uVar385) * uVar415;
      uVar385 = ((short)uVar420 < (short)uVar406) * uVar406 |
                ((short)uVar420 >= (short)uVar406) * uVar420;
      uVar401 = ((short)uVar425 < (short)uVar414) * uVar414 |
                ((short)uVar425 >= (short)uVar414) * uVar425;
      uVar406 = ((short)uVar430 < (short)uVar424) * uVar424 |
                ((short)uVar430 >= (short)uVar424) * uVar430;
      in_XMM6._0_2_ =
           ((short)uVar225 < (short)uVar47) * uVar47 | ((short)uVar225 >= (short)uVar47) * uVar225;
      in_XMM6._2_2_ =
           ((short)uVar241 < (short)uVar51) * uVar51 | ((short)uVar241 >= (short)uVar51) * uVar241;
      in_XMM6._4_2_ =
           ((short)uVar245 < (short)uVar186) * uVar186 |
           ((short)uVar245 >= (short)uVar186) * uVar245;
      in_XMM6._6_2_ =
           ((short)uVar249 < (short)uVar205) * uVar205 |
           ((short)uVar249 >= (short)uVar205) * uVar249;
      in_XMM6._8_2_ =
           ((short)uVar257 < (short)uVar215) * uVar215 |
           ((short)uVar257 >= (short)uVar215) * uVar257;
      in_XMM6._10_2_ =
           ((short)uVar385 < (short)uVar48) * uVar48 | ((short)uVar385 >= (short)uVar48) * uVar385;
      in_XMM6._12_2_ =
           ((short)uVar401 < (short)uVar53) * uVar53 | ((short)uVar401 >= (short)uVar53) * uVar401;
      in_XMM6._14_2_ =
           ((short)uVar406 < (short)uVar282) * uVar282 |
           ((short)uVar406 >= (short)uVar282) * uVar406;
      uVar225 = ((short)uVar168 < (short)uVar20) * uVar168 |
                ((short)uVar168 >= (short)uVar20) * uVar20;
      uVar241 = ((short)uVar177 < (short)uVar34) * uVar177 |
                ((short)uVar177 >= (short)uVar34) * uVar34;
      uVar245 = ((short)uVar195 < (short)uVar37) * uVar195 |
                ((short)uVar195 >= (short)uVar37) * uVar37;
      uVar249 = ((short)uVar45 < (short)uVar126) * uVar45 |
                ((short)uVar45 >= (short)uVar126) * uVar126;
      uVar257 = ((short)uVar49 < (short)uVar40) * uVar49 | ((short)uVar49 >= (short)uVar40) * uVar40
      ;
      uVar385 = ((short)uVar265 < (short)uVar42) * uVar265 |
                ((short)uVar265 >= (short)uVar42) * uVar42;
      uVar401 = ((short)uVar52 < (short)uVar159) * uVar52 |
                ((short)uVar52 >= (short)uVar159) * uVar159;
      uVar406 = ((short)uVar285 < (short)uVar44) * uVar285 |
                ((short)uVar285 >= (short)uVar44) * uVar44;
      uVar168 = uVar168 & 0xbfff;
      uVar177 = uVar177 & 0xbfff;
      uVar195 = uVar195 & 0xbfff;
      uVar45 = uVar45 & 0xbfff;
      uVar49 = uVar49 & 0xbfff;
      uVar265 = uVar265 & 0xbfff;
      uVar52 = uVar52 & 0xbfff;
      uVar285 = uVar285 & 0xbfff;
      uVar20 = uVar20 & 0xbfff;
      uVar34 = uVar34 & 0xbfff;
      uVar37 = uVar37 & 0xbfff;
      uVar126 = uVar126 & 0xbfff;
      uVar40 = uVar40 & 0xbfff;
      uVar42 = uVar42 & 0xbfff;
      uVar159 = uVar159 & 0xbfff;
      uVar44 = uVar44 & 0xbfff;
      uVar20 = ((short)uVar20 < (short)uVar168) * uVar168 |
               ((short)uVar20 >= (short)uVar168) * uVar20;
      uVar34 = ((short)uVar34 < (short)uVar177) * uVar177 |
               ((short)uVar34 >= (short)uVar177) * uVar34;
      uVar37 = ((short)uVar37 < (short)uVar195) * uVar195 |
               ((short)uVar37 >= (short)uVar195) * uVar37;
      uVar126 = ((short)uVar126 < (short)uVar45) * uVar45 |
                ((short)uVar126 >= (short)uVar45) * uVar126;
      uVar40 = ((short)uVar40 < (short)uVar49) * uVar49 | ((short)uVar40 >= (short)uVar49) * uVar40;
      uVar42 = ((short)uVar42 < (short)uVar265) * uVar265 |
               ((short)uVar42 >= (short)uVar265) * uVar42;
      uVar159 = ((short)uVar159 < (short)uVar52) * uVar52 |
                ((short)uVar159 >= (short)uVar52) * uVar159;
      uVar44 = ((short)uVar44 < (short)uVar285) * uVar285 |
               ((short)uVar44 >= (short)uVar285) * uVar44;
      uVar53 = ((short)uVar20 < (short)uVar289) * uVar289 |
               ((short)uVar20 >= (short)uVar289) * uVar20;
      uVar52 = ((short)uVar34 < (short)uVar293) * uVar293 |
               ((short)uVar34 >= (short)uVar293) * uVar34;
      uVar282 = ((short)uVar37 < (short)uVar297) * uVar297 |
                ((short)uVar37 >= (short)uVar297) * uVar37;
      uVar285 = ((short)uVar126 < (short)uVar302) * uVar302 |
                ((short)uVar126 >= (short)uVar302) * uVar126;
      uVar47 = ((short)uVar40 < (short)uVar307) * uVar307 |
               ((short)uVar40 >= (short)uVar307) * uVar40;
      uVar168 = ((short)uVar42 < (short)uVar196) * uVar196 |
                ((short)uVar42 >= (short)uVar196) * uVar42;
      uVar51 = ((short)uVar159 < (short)uVar206) * uVar206 |
               ((short)uVar159 >= (short)uVar206) * uVar159;
      uVar177 = ((short)uVar44 < (short)uVar216) * uVar216 |
                ((short)uVar44 >= (short)uVar216) * uVar44;
      auVar281._0_2_ =
           ((short)uVar387 < (short)uVar253) * uVar387 |
           ((short)uVar387 >= (short)uVar253) * uVar253;
      auVar281._2_2_ =
           ((short)uVar403 < (short)uVar410) * uVar403 |
           ((short)uVar403 >= (short)uVar410) * uVar410;
      auVar281._4_2_ =
           ((short)uVar408 < (short)uVar441) * uVar408 |
           ((short)uVar408 >= (short)uVar441) * uVar441;
      auVar281._6_2_ =
           ((short)uVar412 < (short)uVar508) * uVar412 |
           ((short)uVar412 >= (short)uVar508) * uVar508;
      auVar281._8_2_ =
           ((short)uVar416 < (short)uVar531) * uVar416 |
           ((short)uVar416 >= (short)uVar531) * uVar531;
      auVar281._10_2_ =
           ((short)uVar421 < (short)uVar551) * uVar421 |
           ((short)uVar421 >= (short)uVar551) * uVar551;
      auVar281._12_2_ =
           ((short)uVar426 < (short)uVar450) * uVar426 |
           ((short)uVar426 >= (short)uVar450) * uVar450;
      auVar281._14_2_ =
           ((short)uVar431 < (short)uVar452) * uVar431 |
           ((short)uVar431 >= (short)uVar452) * uVar452;
      uVar387 = uVar387 & 0xbfff;
      uVar403 = uVar403 & 0xbfff;
      uVar408 = uVar408 & 0xbfff;
      uVar412 = uVar412 & 0xbfff;
      uVar416 = uVar416 & 0xbfff;
      uVar421 = uVar421 & 0xbfff;
      uVar426 = uVar426 & 0xbfff;
      uVar431 = uVar431 & 0xbfff;
      uVar253 = uVar253 & 0xbfff;
      uVar410 = uVar410 & 0xbfff;
      uVar441 = uVar441 & 0xbfff;
      uVar508 = uVar508 & 0xbfff;
      uVar531 = uVar531 & 0xbfff;
      uVar551 = uVar551 & 0xbfff;
      uVar450 = uVar450 & 0xbfff;
      uVar452 = uVar452 & 0xbfff;
      uVar20 = ((short)uVar253 < (short)uVar387) * uVar387 |
               ((short)uVar253 >= (short)uVar387) * uVar253;
      uVar34 = ((short)uVar410 < (short)uVar403) * uVar403 |
               ((short)uVar410 >= (short)uVar403) * uVar410;
      uVar37 = ((short)uVar441 < (short)uVar408) * uVar408 |
               ((short)uVar441 >= (short)uVar408) * uVar441;
      uVar126 = ((short)uVar508 < (short)uVar412) * uVar412 |
                ((short)uVar508 >= (short)uVar412) * uVar508;
      uVar40 = ((short)uVar531 < (short)uVar416) * uVar416 |
               ((short)uVar531 >= (short)uVar416) * uVar531;
      uVar42 = ((short)uVar551 < (short)uVar421) * uVar421 |
               ((short)uVar551 >= (short)uVar421) * uVar551;
      uVar159 = ((short)uVar450 < (short)uVar426) * uVar426 |
                ((short)uVar450 >= (short)uVar426) * uVar450;
      uVar44 = ((short)uVar452 < (short)uVar431) * uVar431 |
               ((short)uVar452 >= (short)uVar431) * uVar452;
      uVar186 = ((short)uVar20 < (short)in_XMM6._0_2_) * in_XMM6._0_2_ |
                ((short)uVar20 >= (short)in_XMM6._0_2_) * uVar20;
      uVar195 = ((short)uVar34 < (short)in_XMM6._2_2_) * in_XMM6._2_2_ |
                ((short)uVar34 >= (short)in_XMM6._2_2_) * uVar34;
      uVar205 = ((short)uVar37 < (short)in_XMM6._4_2_) * in_XMM6._4_2_ |
                ((short)uVar37 >= (short)in_XMM6._4_2_) * uVar37;
      uVar45 = ((short)uVar126 < (short)in_XMM6._6_2_) * in_XMM6._6_2_ |
               ((short)uVar126 >= (short)in_XMM6._6_2_) * uVar126;
      uVar215 = ((short)uVar40 < (short)in_XMM6._8_2_) * in_XMM6._8_2_ |
                ((short)uVar40 >= (short)in_XMM6._8_2_) * uVar40;
      uVar49 = ((short)uVar42 < (short)in_XMM6._10_2_) * in_XMM6._10_2_ |
               ((short)uVar42 >= (short)in_XMM6._10_2_) * uVar42;
      uVar48 = ((short)uVar159 < (short)in_XMM6._12_2_) * in_XMM6._12_2_ |
               ((short)uVar159 >= (short)in_XMM6._12_2_) * uVar159;
      uVar265 = ((short)uVar44 < (short)in_XMM6._14_2_) * in_XMM6._14_2_ |
                ((short)uVar44 >= (short)in_XMM6._14_2_) * uVar44;
      uVar20 = ((short)uVar238 < (short)uVar313) * uVar238 |
               ((short)uVar238 >= (short)uVar313) * uVar313;
      uVar34 = ((short)uVar261 < (short)uVar332) * uVar261 |
               ((short)uVar261 >= (short)uVar332) * uVar332;
      uVar37 = ((short)uVar419 < (short)uVar335) * uVar419 |
               ((short)uVar419 >= (short)uVar335) * uVar335;
      uVar126 = ((short)uVar445 < (short)uVar338) * uVar445 |
                ((short)uVar445 >= (short)uVar338) * uVar338;
      uVar40 = ((short)uVar527 < (short)uVar342) * uVar527 |
               ((short)uVar527 >= (short)uVar342) * uVar342;
      uVar42 = ((short)uVar533 < (short)uVar345) * uVar533 |
               ((short)uVar533 >= (short)uVar345) * uVar345;
      uVar159 = ((short)uVar115 < (short)uVar349) * uVar115 |
                ((short)uVar115 >= (short)uVar349) * uVar349;
      uVar44 = ((short)uVar123 < (short)uVar353) * uVar123 |
               ((short)uVar123 >= (short)uVar353) * uVar353;
      uVar289 = ((short)uVar133 < (short)uVar388) * uVar133 |
                ((short)uVar133 >= (short)uVar388) * uVar388;
      uVar293 = ((short)uVar166 < (short)uVar404) * uVar166 |
                ((short)uVar166 >= (short)uVar404) * uVar404;
      uVar297 = ((short)uVar175 < (short)uVar287) * uVar175 |
                ((short)uVar175 >= (short)uVar287) * uVar287;
      uVar302 = ((short)uVar184 < (short)uVar291) * uVar184 |
                ((short)uVar184 >= (short)uVar291) * uVar291;
      uVar307 = ((short)uVar193 < (short)uVar417) * uVar193 |
                ((short)uVar193 >= (short)uVar417) * uVar417;
      uVar196 = ((short)uVar203 < (short)uVar422) * uVar203 |
                ((short)uVar203 >= (short)uVar422) * uVar422;
      uVar206 = ((short)uVar213 < (short)uVar427) * uVar213 |
                ((short)uVar213 >= (short)uVar427) * uVar427;
      uVar216 = ((short)uVar223 < (short)uVar432) * uVar223 |
                ((short)uVar223 >= (short)uVar432) * uVar432;
      uVar20 = ((short)uVar20 < (short)uVar530) * uVar20 |
               ((short)uVar20 >= (short)uVar530) * uVar530;
      uVar34 = ((short)uVar34 < (short)uVar549) * uVar34 |
               ((short)uVar34 >= (short)uVar549) * uVar549;
      uVar37 = ((short)uVar37 < (short)uVar288) * uVar37 |
               ((short)uVar37 >= (short)uVar288) * uVar288;
      uVar126 = ((short)uVar126 < (short)uVar122) * uVar126 |
                ((short)uVar126 >= (short)uVar122) * uVar122;
      uVar40 = ((short)uVar40 < (short)uVar483) * uVar40 |
               ((short)uVar40 >= (short)uVar483) * uVar483;
      uVar42 = ((short)uVar42 < (short)uVar292) * uVar42 |
               ((short)uVar42 >= (short)uVar292) * uVar292;
      uVar159 = ((short)uVar159 < (short)uVar488) * uVar159 |
                ((short)uVar159 >= (short)uVar488) * uVar488;
      uVar44 = ((short)uVar44 < (short)uVar226) * uVar44 |
               ((short)uVar44 >= (short)uVar226) * uVar226;
      uVar289 = ((short)uVar289 < (short)uVar429) * uVar289 |
                ((short)uVar289 >= (short)uVar429) * uVar429;
      uVar293 = ((short)uVar293 < (short)uVar433) * uVar293 |
                ((short)uVar293 >= (short)uVar433) * uVar433;
      uVar297 = ((short)uVar297 < (short)uVar443) * uVar297 |
                ((short)uVar297 >= (short)uVar443) * uVar443;
      uVar302 = ((short)uVar302 < (short)uVar502) * uVar302 |
                ((short)uVar302 >= (short)uVar502) * uVar502;
      uVar307 = ((short)uVar307 < (short)uVar504) * uVar307 |
                ((short)uVar307 >= (short)uVar504) * uVar504;
      uVar196 = ((short)uVar196 < (short)uVar506) * uVar196 |
                ((short)uVar196 >= (short)uVar506) * uVar506;
      uVar206 = ((short)uVar206 < (short)uVar524) * uVar206 |
                ((short)uVar206 >= (short)uVar524) * uVar524;
      uVar216 = ((short)uVar216 < (short)uVar528) * uVar216 |
                ((short)uVar216 >= (short)uVar528) * uVar528;
      uVar20 = ((short)uVar20 < (short)uVar225) * uVar20 |
               ((short)uVar20 >= (short)uVar225) * uVar225;
      uVar34 = ((short)uVar34 < (short)uVar241) * uVar34 |
               ((short)uVar34 >= (short)uVar241) * uVar241;
      uVar37 = ((short)uVar37 < (short)uVar245) * uVar37 |
               ((short)uVar37 >= (short)uVar245) * uVar245;
      uVar126 = ((short)uVar126 < (short)uVar249) * uVar126 |
                ((short)uVar126 >= (short)uVar249) * uVar249;
      uVar40 = ((short)uVar40 < (short)uVar257) * uVar40 |
               ((short)uVar40 >= (short)uVar257) * uVar257;
      uVar42 = ((short)uVar42 < (short)uVar385) * uVar42 |
               ((short)uVar42 >= (short)uVar385) * uVar385;
      uVar159 = ((short)uVar159 < (short)uVar401) * uVar159 |
                ((short)uVar159 >= (short)uVar401) * uVar401;
      uVar44 = ((short)uVar44 < (short)uVar406) * uVar44 |
               ((short)uVar44 >= (short)uVar406) * uVar406;
      uVar289 = ((short)uVar289 < (short)auVar281._0_2_) * uVar289 |
                ((short)uVar289 >= (short)auVar281._0_2_) * auVar281._0_2_;
      uVar293 = ((short)uVar293 < (short)auVar281._2_2_) * uVar293 |
                ((short)uVar293 >= (short)auVar281._2_2_) * auVar281._2_2_;
      uVar297 = ((short)uVar297 < (short)auVar281._4_2_) * uVar297 |
                ((short)uVar297 >= (short)auVar281._4_2_) * auVar281._4_2_;
      uVar302 = ((short)uVar302 < (short)auVar281._6_2_) * uVar302 |
                ((short)uVar302 >= (short)auVar281._6_2_) * auVar281._6_2_;
      uVar307 = ((short)uVar307 < (short)auVar281._8_2_) * uVar307 |
                ((short)uVar307 >= (short)auVar281._8_2_) * auVar281._8_2_;
      uVar196 = ((short)uVar196 < (short)auVar281._10_2_) * uVar196 |
                ((short)uVar196 >= (short)auVar281._10_2_) * auVar281._10_2_;
      uVar206 = ((short)uVar206 < (short)auVar281._12_2_) * uVar206 |
                ((short)uVar206 >= (short)auVar281._12_2_) * auVar281._12_2_;
      uVar216 = ((short)uVar216 < (short)auVar281._14_2_) * uVar216 |
                ((short)uVar216 >= (short)auVar281._14_2_) * auVar281._14_2_;
      auVar229 = psraw(auVar492,0xf);
      auVar29 = pmovsxbw(auVar281,0x808080808080808);
      auVar227._0_2_ = auVar492._0_2_ + auVar29._0_2_ + auVar229._0_2_;
      auVar227._2_2_ = auVar492._2_2_ + auVar29._2_2_ + auVar229._2_2_;
      auVar227._4_2_ = auVar492._4_2_ + auVar29._4_2_ + auVar229._4_2_;
      auVar227._6_2_ = auVar492._6_2_ + auVar29._6_2_ + auVar229._6_2_;
      auVar227._8_2_ = auVar492._8_2_ + auVar29._8_2_ + auVar229._8_2_;
      auVar227._10_2_ = auVar492._10_2_ + auVar29._10_2_ + auVar229._10_2_;
      auVar227._12_2_ = auVar492._12_2_ + auVar29._12_2_ + auVar229._12_2_;
      auVar227._14_2_ = auVar492._14_2_ + auVar29._14_2_ + auVar229._14_2_;
      auVar229 = psraw(auVar554,0xf);
      auVar61._0_2_ = auVar554._0_2_ + auVar29._0_2_ + auVar229._0_2_;
      auVar61._2_2_ = auVar554._2_2_ + auVar29._2_2_ + auVar229._2_2_;
      auVar61._4_2_ = auVar554._4_2_ + auVar29._4_2_ + auVar229._4_2_;
      auVar61._6_2_ = auVar554._6_2_ + auVar29._6_2_ + auVar229._6_2_;
      auVar61._8_2_ = auVar554._8_2_ + auVar29._8_2_ + auVar229._8_2_;
      auVar61._10_2_ = auVar554._10_2_ + auVar29._10_2_ + auVar229._10_2_;
      auVar61._12_2_ = auVar554._12_2_ + auVar29._12_2_ + auVar229._12_2_;
      auVar61._14_2_ = auVar554._14_2_ + auVar29._14_2_ + auVar229._14_2_;
      auVar229 = psraw(auVar227,4);
      sVar21 = auVar229._0_2_ + sVar21;
      sVar35 = auVar229._2_2_ + sVar35;
      sVar38 = auVar229._4_2_ + sVar38;
      sVar477 = auVar229._6_2_ + sVar477;
      sVar480 = auVar229._8_2_ + sVar480;
      sVar482 = auVar229._10_2_ + sVar482;
      sVar485 = auVar229._12_2_ + sVar485;
      sVar487 = auVar229._14_2_ + sVar487;
      uVar20 = (sVar21 < (short)uVar20) * uVar20 | (ushort)(sVar21 >= (short)uVar20) * sVar21;
      uVar34 = (sVar35 < (short)uVar34) * uVar34 | (ushort)(sVar35 >= (short)uVar34) * sVar35;
      uVar37 = (sVar38 < (short)uVar37) * uVar37 | (ushort)(sVar38 >= (short)uVar37) * sVar38;
      uVar126 = (sVar477 < (short)uVar126) * uVar126 | (ushort)(sVar477 >= (short)uVar126) * sVar477
      ;
      uVar40 = (sVar480 < (short)uVar40) * uVar40 | (ushort)(sVar480 >= (short)uVar40) * sVar480;
      uVar42 = (sVar482 < (short)uVar42) * uVar42 | (ushort)(sVar482 >= (short)uVar42) * sVar482;
      uVar159 = (sVar485 < (short)uVar159) * uVar159 | (ushort)(sVar485 >= (short)uVar159) * sVar485
      ;
      uVar44 = (sVar487 < (short)uVar44) * uVar44 | (ushort)(sVar487 >= (short)uVar44) * sVar487;
      auVar229 = psraw(auVar61,4);
      *(ushort *)((long)dest + 8) =
           ((short)uVar47 < (short)uVar40) * uVar47 | ((short)uVar47 >= (short)uVar40) * uVar40;
      *(ushort *)((long)dest + 10) =
           ((short)uVar168 < (short)uVar42) * uVar168 | ((short)uVar168 >= (short)uVar42) * uVar42;
      *(ushort *)((long)dest + 0xc) =
           ((short)uVar51 < (short)uVar159) * uVar51 | ((short)uVar51 >= (short)uVar159) * uVar159;
      *(ushort *)((long)dest + 0xe) =
           ((short)uVar177 < (short)uVar44) * uVar177 | ((short)uVar177 >= (short)uVar44) * uVar44;
      sVar490 = auVar229._0_2_ + sVar490;
      sVar63 = auVar229._2_2_ + sVar63;
      sVar65 = auVar229._4_2_ + sVar65;
      sVar67 = auVar229._6_2_ + sVar67;
      sVar69 = auVar229._8_2_ + sVar69;
      sVar71 = auVar229._10_2_ + sVar71;
      sVar73 = auVar229._12_2_ + sVar73;
      sVar75 = auVar229._14_2_ + sVar75;
      uVar40 = (sVar490 < (short)uVar289) * uVar289 | (ushort)(sVar490 >= (short)uVar289) * sVar490;
      uVar42 = (sVar63 < (short)uVar293) * uVar293 | (ushort)(sVar63 >= (short)uVar293) * sVar63;
      uVar159 = (sVar65 < (short)uVar297) * uVar297 | (ushort)(sVar65 >= (short)uVar297) * sVar65;
      uVar44 = (sVar67 < (short)uVar302) * uVar302 | (ushort)(sVar67 >= (short)uVar302) * sVar67;
      uVar47 = (sVar69 < (short)uVar307) * uVar307 | (ushort)(sVar69 >= (short)uVar307) * sVar69;
      uVar168 = (sVar71 < (short)uVar196) * uVar196 | (ushort)(sVar71 >= (short)uVar196) * sVar71;
      uVar51 = (sVar73 < (short)uVar206) * uVar206 | (ushort)(sVar73 >= (short)uVar206) * sVar73;
      uVar177 = (sVar75 < (short)uVar216) * uVar216 | (ushort)(sVar75 >= (short)uVar216) * sVar75;
      puVar1 = (ushort *)((long)dest + lVar13 * 2);
      *puVar1 = ((short)uVar53 < (short)uVar20) * uVar53 | ((short)uVar53 >= (short)uVar20) * uVar20
      ;
      puVar1[1] = ((short)uVar52 < (short)uVar34) * uVar52 |
                  ((short)uVar52 >= (short)uVar34) * uVar34;
      puVar1[2] = ((short)uVar282 < (short)uVar37) * uVar282 |
                  ((short)uVar282 >= (short)uVar37) * uVar37;
      puVar1[3] = ((short)uVar285 < (short)uVar126) * uVar285 |
                  ((short)uVar285 >= (short)uVar126) * uVar126;
      *(ushort *)((long)dest + lVar13 * 4 + 8) =
           ((short)uVar215 < (short)uVar47) * uVar215 | ((short)uVar215 >= (short)uVar47) * uVar47;
      *(ushort *)((long)dest + lVar13 * 4 + 10) =
           ((short)uVar49 < (short)uVar168) * uVar49 | ((short)uVar49 >= (short)uVar168) * uVar168;
      *(ushort *)((long)dest + lVar13 * 4 + 0xc) =
           ((short)uVar48 < (short)uVar51) * uVar48 | ((short)uVar48 >= (short)uVar51) * uVar51;
      *(ushort *)((long)dest + lVar13 * 4 + 0xe) =
           ((short)uVar265 < (short)uVar177) * uVar265 |
           ((short)uVar265 >= (short)uVar177) * uVar177;
      puVar1 = (ushort *)((long)dest + lVar13 * 6);
      *puVar1 = ((short)uVar186 < (short)uVar40) * uVar186 |
                ((short)uVar186 >= (short)uVar40) * uVar40;
      puVar1[1] = ((short)uVar195 < (short)uVar42) * uVar195 |
                  ((short)uVar195 >= (short)uVar42) * uVar42;
      puVar1[2] = ((short)uVar205 < (short)uVar159) * uVar205 |
                  ((short)uVar205 >= (short)uVar159) * uVar159;
      puVar1[3] = ((short)uVar45 < (short)uVar44) * uVar45 |
                  ((short)uVar45 >= (short)uVar44) * uVar44;
      dest = (void *)((long)dest + lVar13 * 8);
      in = in + 0x240;
    }
  }
  return;
}

Assistant:

void SIMD_FUNC(cdef_filter_16_0)(void *dest, int dstride, const uint16_t *in,
                                 int pri_strength, int sec_strength, int dir,
                                 int pri_damping, int sec_damping,
                                 int coeff_shift, int block_width,
                                 int block_height) {
  if (block_width == 8) {
    filter_block_8x8(/*is_lowbd=*/0, dest, dstride, in, pri_strength,
                     sec_strength, dir, pri_damping, sec_damping, coeff_shift,
                     block_height, /*enable_primary=*/1,
                     /*enable_secondary=*/1);
  } else {
    filter_block_4x4(/*is_lowbd=*/0, dest, dstride, in, pri_strength,
                     sec_strength, dir, pri_damping, sec_damping, coeff_shift,
                     block_height, /*enable_primary=*/1,
                     /*enable_secondary=*/1);
  }
}